

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_fma::forward_inplace(Mish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [24];
  undefined1 auVar303 [24];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  long *in_RSI;
  double dVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  __m256 two;
  __m256 one_2;
  __m256 two_2;
  __m256 one_12;
  __m256 y_1;
  __m256 z;
  __m256 tmp_1;
  __m256 mask_1;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 y_7;
  __m256 z_2;
  __m256 tmp_7;
  __m256 mask_7;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_11;
  __m256i imm0_4;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 pow2n_4;
  __m256 y_6;
  __m256 mask_6;
  __m256 one_10;
  __m256i imm0_3;
  __m256 fx_4;
  __m256 tmp_6;
  __m256 one_13;
  __m256 pow2n_5;
  __m256 y_8;
  __m256 mask_8;
  __m256 one_14;
  __m256i imm0_5;
  __m256 fx_5;
  __m256 tmp_8;
  __m256 one_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_2;
  __m256 one_4;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_2;
  imm_xmm_union u_21;
  imm_xmm_union u_20;
  __m256i ret_8;
  __m128i x2_8;
  __m128i x1_8;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_24;
  imm_xmm_union u_23;
  imm_xmm_union u_22;
  __m256i ret_9;
  __m128i y2_4;
  __m128i y1_4;
  __m128i x2_9;
  __m128i x1_9;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_12;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_27;
  imm_xmm_union u_26;
  imm_xmm_union u_25;
  __m256i ret_10;
  __m128i y2_5;
  __m128i y1_5;
  __m128i x2_10;
  __m128i x1_10;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  __m256i ret_5;
  __m128i x2_5;
  __m128i x1_5;
  imm_xmm_union u_29;
  imm_xmm_union u_28;
  __m256i ret_11;
  __m128i x2_11;
  __m128i x1_11;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 two_1;
  __m128 one_7;
  __m128 two_3;
  __m128 one_17;
  v4sf y_4;
  v4sf z_1;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_1;
  v4sf y_10;
  v4sf z_3;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_3;
  v4sf invalid_mask_3;
  v4sf one_16;
  v4si emm0_4;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf pow2n_6;
  v4sf y_9;
  v4sf mask_9;
  v4sf one_15;
  v4si emm0_3;
  v4sf fx_6;
  v4sf tmp_9;
  __m128 one_18;
  v4sf pow2n_7;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_19;
  v4si emm0_5;
  v4sf fx_7;
  v4sf tmp_11;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_2;
  v4sf fx_3;
  v4sf tmp_5;
  undefined8 local_85a0;
  undefined8 uStack_8598;
  undefined8 local_8410;
  undefined8 uStack_8408;
  undefined8 local_8400;
  undefined8 uStack_83f8;
  undefined8 uStack_83f0;
  undefined8 uStack_83e8;
  int local_83cc;
  undefined8 local_83c8;
  undefined8 local_83c0;
  undefined8 local_83b8;
  undefined4 local_83b0;
  long local_83a8;
  undefined4 local_83a0;
  undefined4 local_839c;
  undefined4 local_8398;
  undefined4 local_8394;
  undefined4 local_8390;
  undefined8 local_8388;
  undefined1 (*local_8380) [32];
  int local_8374;
  undefined8 local_8370;
  undefined8 uStack_8368;
  int local_835c;
  undefined1 (*local_8310) [16];
  int local_8304;
  undefined8 local_8300;
  undefined8 uStack_82f8;
  undefined8 uStack_82f0;
  undefined8 uStack_82e8;
  int local_82d0;
  undefined1 (*local_8278) [32];
  int local_8270;
  int local_826c;
  int local_8268;
  int local_8264;
  int local_8260;
  int local_825c;
  long *local_8250;
  undefined1 local_8235;
  int local_8234;
  undefined8 *local_8228;
  undefined8 *local_81f0;
  undefined8 *local_81a0;
  undefined1 (*local_8190) [32];
  undefined8 local_8180;
  undefined8 uStack_8178;
  undefined8 uStack_8170;
  undefined8 uStack_8168;
  undefined8 local_8140;
  undefined8 uStack_8138;
  undefined8 uStack_8130;
  undefined8 uStack_8128;
  undefined1 (*local_8108) [32];
  undefined1 (*local_80c0) [32];
  undefined8 local_80b0;
  undefined8 uStack_80a8;
  undefined8 local_8090;
  undefined8 uStack_8088;
  undefined1 (*local_8078) [32];
  long local_7fe0;
  undefined4 local_7fd4;
  long local_7fd0;
  undefined1 (*local_7fc8) [32];
  undefined4 local_7fbc;
  int local_7fb8;
  int local_7fb4;
  undefined8 *local_7fb0;
  undefined4 local_7fa4;
  long local_7fa0;
  undefined8 *local_7f60;
  float local_7ea0;
  float fStack_7e9c;
  float fStack_7e98;
  float fStack_7e94;
  float local_7e80;
  float fStack_7e7c;
  float fStack_7e78;
  float fStack_7e74;
  float fStack_7e70;
  float fStack_7e6c;
  float fStack_7e68;
  undefined4 uStack_7e64;
  undefined1 local_7e60 [8];
  float fStack_7e58;
  float fStack_7e54;
  undefined1 local_7e40 [8];
  float fStack_7e38;
  float fStack_7e34;
  float fStack_7e30;
  float fStack_7e2c;
  float fStack_7e28;
  undefined4 uStack_7e24;
  float local_7dc0;
  float fStack_7dbc;
  float fStack_7db8;
  float fStack_7db4;
  float fStack_7db0;
  float fStack_7dac;
  float fStack_7da8;
  float local_7da0;
  float fStack_7d9c;
  float fStack_7d98;
  float fStack_7d94;
  float fStack_7d90;
  float fStack_7d8c;
  float fStack_7d88;
  undefined4 uStack_7d84;
  undefined8 local_7d80;
  undefined8 uStack_7d78;
  undefined8 uStack_7d70;
  undefined8 uStack_7d68;
  undefined8 local_7d60;
  undefined8 uStack_7d58;
  undefined8 uStack_7d50;
  undefined8 uStack_7d48;
  undefined8 local_7d40;
  undefined8 uStack_7d38;
  undefined8 uStack_7d30;
  undefined8 uStack_7d28;
  undefined8 local_7d20;
  undefined8 uStack_7d18;
  undefined8 uStack_7d10;
  undefined8 uStack_7d08;
  undefined8 local_7d00;
  undefined8 uStack_7cf8;
  undefined8 uStack_7cf0;
  undefined8 uStack_7ce8;
  undefined1 local_7ce0 [8];
  undefined8 uStack_7cd8;
  undefined8 uStack_7cd0;
  undefined1 local_7c60 [8];
  float fStack_7c58;
  float fStack_7c54;
  undefined8 uStack_7c50;
  undefined8 uStack_7c48;
  undefined1 local_7be0 [8];
  float fStack_7bd8;
  float fStack_7bd4;
  undefined8 uStack_7bd0;
  undefined8 uStack_7bc8;
  float local_7b60;
  float fStack_7b5c;
  float fStack_7b58;
  float fStack_7b54;
  undefined1 local_7b00 [8];
  undefined8 uStack_7af8;
  undefined8 uStack_7af0;
  ulong uStack_7ae8;
  float local_7ae0;
  float fStack_7adc;
  float fStack_7ad8;
  float fStack_7ad4;
  float fStack_7ad0;
  float fStack_7acc;
  float fStack_7ac8;
  float fStack_7ac4;
  undefined1 local_7ac0 [32];
  undefined1 local_7aa0 [32];
  undefined1 local_7a80 [8];
  undefined8 uStack_7a78;
  undefined8 uStack_7a70;
  undefined8 uStack_7a68;
  undefined1 local_7a60 [32];
  undefined8 local_7a40;
  undefined8 uStack_7a38;
  undefined8 uStack_7a30;
  undefined8 uStack_7a28;
  undefined8 local_7a20;
  undefined8 uStack_7a18;
  undefined8 uStack_7a10;
  undefined8 uStack_7a08;
  undefined1 local_7a00 [8];
  undefined8 uStack_79f8;
  undefined8 uStack_79f0;
  undefined8 uStack_79e8;
  undefined8 local_79e0;
  undefined8 uStack_79d8;
  undefined8 uStack_79d0;
  undefined8 uStack_79c8;
  undefined8 local_79c0;
  undefined8 uStack_79b8;
  undefined8 uStack_79b0;
  ulong uStack_79a8;
  undefined8 local_79a0;
  undefined8 uStack_7998;
  undefined8 uStack_7990;
  undefined8 uStack_7988;
  undefined8 local_7980;
  undefined8 uStack_7978;
  undefined8 uStack_7970;
  undefined8 uStack_7968;
  undefined8 local_7960;
  undefined8 uStack_7958;
  undefined8 uStack_7950;
  undefined8 uStack_7948;
  undefined8 local_7940;
  undefined8 uStack_7938;
  undefined8 uStack_7930;
  undefined8 uStack_7928;
  undefined8 local_7920;
  undefined8 uStack_7918;
  undefined8 uStack_7910;
  undefined8 uStack_7908;
  undefined8 local_7900;
  undefined8 uStack_78f8;
  undefined8 uStack_78f0;
  undefined8 uStack_78e8;
  undefined8 local_78e0;
  undefined8 uStack_78d8;
  undefined8 uStack_78d0;
  undefined8 uStack_78c8;
  undefined8 local_78c0;
  undefined8 uStack_78b8;
  undefined8 uStack_78b0;
  undefined8 uStack_78a8;
  undefined8 local_78a0;
  undefined8 uStack_7898;
  undefined8 uStack_7890;
  undefined8 uStack_7888;
  undefined8 local_7880;
  undefined8 uStack_7878;
  undefined8 uStack_7870;
  undefined8 uStack_7868;
  float local_7860;
  float fStack_785c;
  float fStack_7858;
  float fStack_7854;
  float local_7820;
  float fStack_781c;
  float fStack_7818;
  float fStack_7814;
  float fStack_7810;
  float fStack_780c;
  float fStack_7808;
  float fStack_7804;
  float local_7800;
  float fStack_77fc;
  float fStack_77f8;
  float fStack_77f4;
  float fStack_77f0;
  float fStack_77ec;
  float fStack_77e8;
  float fStack_77e4;
  float local_77c0;
  float fStack_77bc;
  float fStack_77b8;
  float fStack_77b4;
  float fStack_77b0;
  float fStack_77ac;
  float fStack_77a8;
  float fStack_77a4;
  float local_77a0;
  float fStack_779c;
  float fStack_7798;
  float fStack_7794;
  float fStack_7790;
  float fStack_778c;
  float fStack_7788;
  float fStack_7784;
  undefined8 local_7760;
  undefined8 uStack_7758;
  undefined8 uStack_7750;
  undefined8 uStack_7748;
  undefined8 local_7740;
  undefined8 uStack_7738;
  undefined8 uStack_7730;
  undefined8 uStack_7728;
  undefined1 local_7700 [16];
  undefined8 local_76a0;
  undefined8 uStack_7698;
  undefined8 uStack_7690;
  undefined8 uStack_7688;
  undefined1 local_7660 [8];
  float fStack_7658;
  float fStack_7654;
  float local_7620;
  float fStack_761c;
  float fStack_7618;
  float fStack_7614;
  float fStack_7610;
  float fStack_760c;
  float fStack_7608;
  float local_75c0;
  float fStack_75bc;
  float fStack_75b8;
  float fStack_75b4;
  float local_7580;
  float fStack_757c;
  float fStack_7578;
  float fStack_7574;
  undefined8 local_7560;
  undefined8 uStack_7558;
  undefined8 uStack_7550;
  undefined8 uStack_7548;
  undefined1 local_7540 [8];
  undefined8 uStack_7538;
  undefined8 uStack_7530;
  undefined8 uStack_7528;
  undefined1 local_7520 [32];
  undefined8 local_7500;
  undefined8 uStack_74f8;
  undefined8 uStack_74f0;
  undefined8 uStack_74e8;
  undefined8 local_74e0;
  undefined8 uStack_74d8;
  undefined8 uStack_74d0;
  undefined8 uStack_74c8;
  undefined1 local_74c0 [32];
  undefined1 local_74a0 [8];
  undefined8 uStack_7498;
  undefined8 uStack_7490;
  undefined8 uStack_7488;
  undefined1 local_7480 [32];
  undefined8 local_7460;
  undefined8 uStack_7458;
  undefined8 uStack_7450;
  undefined8 uStack_7448;
  undefined8 local_7440;
  undefined8 uStack_7438;
  undefined8 uStack_7430;
  undefined8 uStack_7428;
  undefined8 local_7420;
  undefined8 uStack_7418;
  undefined8 uStack_7410;
  undefined8 uStack_7408;
  undefined8 local_7400;
  undefined8 uStack_73f8;
  undefined8 uStack_73f0;
  undefined8 uStack_73e8;
  undefined8 local_73e0;
  undefined8 uStack_73d8;
  undefined8 uStack_73d0;
  undefined8 uStack_73c8;
  undefined8 local_73c0;
  undefined8 uStack_73b8;
  undefined8 uStack_73b0;
  undefined8 uStack_73a8;
  undefined4 local_7398;
  undefined4 local_7394;
  undefined4 local_7384;
  undefined8 local_7380;
  undefined8 uStack_7378;
  undefined8 uStack_7370;
  undefined8 uStack_7368;
  undefined8 local_7360;
  undefined8 uStack_7358;
  undefined8 uStack_7350;
  undefined8 uStack_7348;
  undefined1 local_7340 [32];
  uint uStack_7318;
  uint uStack_7314;
  uint uStack_7310;
  uint uStack_730c;
  uint uStack_7308;
  uint uStack_7304;
  undefined8 local_72c0;
  undefined8 uStack_72b8;
  undefined8 uStack_72b0;
  undefined8 uStack_72a8;
  float local_72a0;
  float fStack_729c;
  float fStack_7298;
  float fStack_7294;
  float fStack_7290;
  float fStack_728c;
  float fStack_7288;
  undefined4 uStack_7284;
  undefined8 local_7280;
  undefined8 uStack_7278;
  undefined8 uStack_7270;
  undefined8 uStack_7268;
  float local_7260;
  float fStack_725c;
  float fStack_7258;
  float fStack_7254;
  float fStack_7250;
  float fStack_724c;
  float fStack_7248;
  float fStack_7244;
  undefined8 local_7240;
  undefined8 uStack_7238;
  undefined8 uStack_7230;
  undefined8 uStack_7228;
  undefined1 local_7220 [8];
  undefined8 uStack_7218;
  undefined8 uStack_7210;
  undefined8 uStack_7208;
  undefined1 local_7200 [32];
  undefined8 local_71e0;
  undefined8 uStack_71d8;
  undefined8 uStack_71d0;
  undefined8 uStack_71c8;
  undefined8 local_71c0;
  undefined8 uStack_71b8;
  undefined8 uStack_71b0;
  undefined8 uStack_71a8;
  undefined1 local_71a0 [32];
  undefined1 local_7180 [8];
  undefined8 uStack_7178;
  undefined8 uStack_7170;
  undefined8 uStack_7168;
  undefined1 local_7160 [32];
  undefined8 local_7140;
  undefined8 uStack_7138;
  undefined8 uStack_7130;
  undefined8 uStack_7128;
  undefined8 local_7120;
  undefined8 uStack_7118;
  undefined8 uStack_7110;
  undefined8 uStack_7108;
  undefined8 local_7100;
  undefined8 uStack_70f8;
  undefined8 uStack_70f0;
  undefined8 uStack_70e8;
  undefined8 local_70e0;
  undefined8 uStack_70d8;
  undefined8 uStack_70d0;
  undefined8 uStack_70c8;
  undefined8 local_70c0;
  undefined8 uStack_70b8;
  undefined8 uStack_70b0;
  undefined8 uStack_70a8;
  undefined8 local_70a0;
  undefined8 uStack_7098;
  undefined8 uStack_7090;
  undefined8 uStack_7088;
  undefined4 local_7064;
  float local_7060;
  float fStack_705c;
  float fStack_7058;
  float fStack_7054;
  float fStack_7050;
  float fStack_704c;
  float fStack_7048;
  float fStack_7044;
  undefined1 local_6fc0 [16];
  undefined8 local_6f60;
  undefined8 uStack_6f58;
  undefined8 uStack_6f50;
  undefined8 uStack_6f48;
  undefined1 local_6f20 [8];
  float fStack_6f18;
  float fStack_6f14;
  float local_6ee0;
  float fStack_6edc;
  float fStack_6ed8;
  float fStack_6ed4;
  float fStack_6ed0;
  float fStack_6ecc;
  float fStack_6ec8;
  float local_6e80;
  float fStack_6e7c;
  float fStack_6e78;
  float fStack_6e74;
  float local_6e40;
  float fStack_6e3c;
  float fStack_6e38;
  float fStack_6e34;
  float local_6dc0;
  float fStack_6dbc;
  float fStack_6db8;
  float fStack_6db4;
  float fStack_6db0;
  float fStack_6dac;
  float fStack_6da8;
  float fStack_6da4;
  float local_6da0;
  float fStack_6d9c;
  float fStack_6d98;
  float fStack_6d94;
  float fStack_6d90;
  float fStack_6d8c;
  float fStack_6d88;
  float fStack_6d84;
  undefined8 local_6d00;
  undefined8 uStack_6cf8;
  undefined8 uStack_6cf0;
  undefined8 uStack_6ce8;
  undefined8 local_6ce0;
  undefined8 uStack_6cd8;
  undefined8 uStack_6cd0;
  undefined8 uStack_6cc8;
  undefined8 local_6cc0;
  undefined8 uStack_6cb8;
  undefined8 uStack_6cb0;
  undefined8 uStack_6ca8;
  undefined8 local_6ca0;
  undefined8 uStack_6c98;
  undefined8 uStack_6c90;
  undefined8 uStack_6c88;
  undefined8 local_6c80;
  undefined8 uStack_6c78;
  undefined8 uStack_6c70;
  undefined8 uStack_6c68;
  undefined8 local_6c60;
  undefined8 uStack_6c58;
  undefined8 uStack_6c50;
  undefined8 uStack_6c48;
  undefined1 local_6c00 [32];
  undefined8 local_6be0;
  undefined8 uStack_6bd8;
  undefined8 uStack_6bd0;
  undefined8 uStack_6bc8;
  undefined8 local_6bc0;
  undefined8 uStack_6bb8;
  undefined8 uStack_6bb0;
  undefined8 uStack_6ba8;
  undefined8 local_6ba0;
  undefined8 uStack_6b98;
  undefined8 uStack_6b90;
  undefined8 uStack_6b88;
  undefined1 local_6ac0 [32];
  undefined1 local_6aa0 [32];
  undefined1 local_6a80 [32];
  undefined1 local_6a40 [32];
  undefined8 local_69c0;
  undefined8 uStack_69b8;
  undefined8 uStack_69b0;
  undefined8 uStack_69a8;
  undefined8 local_69a0;
  undefined8 uStack_6998;
  undefined8 uStack_6990;
  undefined8 uStack_6988;
  undefined8 local_6980;
  undefined8 uStack_6978;
  undefined8 uStack_6970;
  undefined8 uStack_6968;
  undefined8 local_6960;
  undefined8 uStack_6958;
  undefined8 uStack_6950;
  undefined8 uStack_6948;
  undefined8 local_6900;
  undefined8 uStack_68f8;
  undefined8 uStack_68f0;
  undefined8 uStack_68e8;
  undefined8 local_68e0;
  undefined8 uStack_68d8;
  undefined8 uStack_68d0;
  undefined8 uStack_68c8;
  undefined8 local_6880;
  undefined8 uStack_6878;
  undefined8 uStack_6870;
  undefined8 uStack_6868;
  undefined8 local_6860;
  undefined8 uStack_6858;
  undefined8 uStack_6850;
  undefined8 uStack_6848;
  undefined8 local_6840;
  undefined8 uStack_6838;
  undefined8 uStack_6830;
  undefined8 uStack_6828;
  undefined1 local_6810 [16];
  undefined1 local_6800 [16];
  undefined4 local_67e4;
  undefined8 local_67e0;
  undefined8 uStack_67d8;
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined8 local_6700;
  undefined8 uStack_66f8;
  undefined8 uStack_66f0;
  undefined8 uStack_66e8;
  undefined8 local_6680;
  undefined8 uStack_6678;
  undefined8 uStack_6670;
  undefined8 uStack_6668;
  undefined8 local_6660;
  undefined8 uStack_6658;
  undefined8 uStack_6650;
  undefined8 uStack_6648;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 uStack_6630;
  undefined8 uStack_6628;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 uStack_6608;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 uStack_65a8;
  undefined8 local_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 local_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined8 local_6320;
  undefined8 uStack_6318;
  undefined8 uStack_6310;
  undefined8 uStack_6308;
  undefined8 local_6300;
  undefined8 uStack_62f8;
  undefined8 uStack_62f0;
  undefined8 uStack_62e8;
  undefined8 local_62e0;
  undefined8 uStack_62d8;
  undefined8 uStack_62d0;
  undefined8 uStack_62c8;
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined8 local_62b0;
  undefined8 uStack_62a8;
  undefined1 local_62a0 [16];
  undefined1 local_6290 [16];
  undefined8 local_6280;
  undefined8 uStack_6278;
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined8 local_6260;
  undefined8 uStack_6258;
  undefined8 uStack_6250;
  undefined8 uStack_6248;
  undefined8 local_61a0;
  undefined8 uStack_6198;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined8 local_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  undefined8 local_5e20;
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  undefined8 local_5e00;
  undefined8 uStack_5df8;
  undefined8 uStack_5df0;
  undefined8 uStack_5de8;
  undefined8 local_5de0;
  undefined8 uStack_5dd8;
  undefined8 uStack_5dd0;
  undefined8 uStack_5dc8;
  undefined8 local_5dc0;
  undefined8 uStack_5db8;
  undefined8 uStack_5db0;
  undefined8 uStack_5da8;
  undefined8 local_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  undefined8 local_5d20;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 local_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 uStack_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 uStack_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  undefined8 local_5660;
  undefined8 uStack_5658;
  undefined8 uStack_5650;
  undefined8 uStack_5648;
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 uStack_5630;
  undefined8 uStack_5628;
  undefined8 local_5620;
  undefined8 uStack_5618;
  undefined8 uStack_5610;
  ulong uStack_5608;
  undefined8 local_5600;
  undefined8 uStack_55f8;
  undefined8 uStack_55f0;
  undefined8 uStack_55e8;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  undefined8 local_55a0;
  undefined8 uStack_5598;
  undefined8 uStack_5590;
  undefined8 uStack_5588;
  undefined8 local_5580;
  undefined8 uStack_5578;
  undefined8 uStack_5570;
  undefined8 uStack_5568;
  undefined8 local_5560;
  undefined8 uStack_5558;
  undefined8 uStack_5550;
  undefined8 uStack_5548;
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined8 local_5520;
  undefined8 uStack_5518;
  undefined8 uStack_5510;
  undefined8 uStack_5508;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined8 local_54e0;
  undefined8 uStack_54d8;
  undefined8 uStack_54d0;
  undefined8 uStack_54c8;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 local_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 local_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined4 local_4af4;
  undefined8 local_4af0;
  undefined8 uStack_4ae8;
  undefined4 local_4ad4;
  undefined8 local_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 local_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 local_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 local_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 local_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 local_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  ulong uStack_4368;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  float local_3380;
  float fStack_337c;
  float fStack_3378;
  float fStack_3374;
  float fStack_3370;
  float fStack_336c;
  float fStack_3368;
  float fStack_3364;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  float local_3320;
  float fStack_331c;
  float fStack_3318;
  float fStack_3314;
  float fStack_3310;
  float fStack_330c;
  float fStack_3308;
  float fStack_3304;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 local_3170;
  undefined8 uStack_3168;
  undefined1 local_3160 [16];
  undefined1 local_3150 [16];
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 local_3070;
  undefined8 uStack_3068;
  undefined1 local_3060 [16];
  undefined1 local_3050 [16];
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined1 local_2dd0 [16];
  undefined1 local_2dc0 [16];
  undefined4 local_2da4;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined1 local_2d10 [16];
  undefined1 local_2d00 [16];
  undefined4 local_2ce4;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 local_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 local_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 local_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 local_2ad0;
  undefined8 uStack_2ac8;
  undefined4 local_2a34;
  undefined8 local_2a30;
  undefined8 uStack_2a28;
  undefined4 local_2a14;
  undefined8 local_2a10;
  undefined8 uStack_2a08;
  undefined4 local_29f4;
  undefined8 local_29f0;
  undefined8 uStack_29e8;
  undefined4 local_29d4;
  undefined8 local_29d0;
  undefined8 uStack_29c8;
  undefined1 local_2940 [16];
  undefined1 auStack_2930 [16];
  undefined4 local_2920;
  undefined4 local_291c;
  undefined4 local_2918;
  undefined4 local_2914;
  undefined4 local_2910;
  undefined4 local_290c;
  undefined4 local_2908;
  undefined4 local_2904;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined1 auStack_28f0 [16];
  undefined4 local_28e0;
  undefined4 local_28dc;
  undefined4 local_28d8;
  undefined4 local_28d4;
  undefined4 local_28d0;
  undefined4 local_28cc;
  undefined4 local_28c8;
  undefined4 local_28c4;
  ulong local_2880;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined1 local_2800 [16];
  undefined1 auStack_27f0 [16];
  undefined4 local_27e0;
  undefined4 local_27dc;
  undefined4 local_27d8;
  undefined4 local_27d4;
  undefined4 local_27d0;
  undefined4 local_27cc;
  undefined4 local_27c8;
  undefined4 local_27c4;
  undefined1 local_27c0 [16];
  undefined1 auStack_27b0 [16];
  undefined4 local_2790;
  undefined4 local_278c;
  undefined4 local_2788;
  undefined4 local_2784;
  undefined4 local_2780;
  undefined4 local_277c;
  undefined4 local_2778;
  undefined4 local_2774;
  float local_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  float local_2760;
  float fStack_275c;
  float fStack_2758;
  float fStack_2754;
  undefined1 local_2750 [8];
  float fStack_2748;
  float fStack_2744;
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  float local_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 local_2690;
  undefined8 uStack_2688;
  undefined1 local_2680 [8];
  float fStack_2678;
  float fStack_2674;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 local_2650;
  undefined8 uStack_2648;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  float local_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined1 local_2520 [8];
  undefined8 uStack_2518;
  float local_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [8];
  undefined8 uStack_24d8;
  undefined1 local_24d0 [16];
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined1 local_24b0 [16];
  undefined1 local_24a0 [8];
  undefined8 uStack_2498;
  undefined4 local_2484;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 local_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 local_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 local_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 local_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 local_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 local_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 local_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  float local_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float local_2370;
  float fStack_236c;
  float fStack_2368;
  float fStack_2364;
  float local_2360;
  float fStack_235c;
  float fStack_2358;
  float fStack_2354;
  float local_2340;
  float fStack_233c;
  float fStack_2338;
  float fStack_2334;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 local_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 local_2290;
  undefined8 uStack_2288;
  float local_2230;
  float fStack_222c;
  float fStack_2228;
  float fStack_2224;
  float local_2200;
  float fStack_21fc;
  float fStack_21f8;
  float fStack_21f4;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  float local_21c0;
  float fStack_21bc;
  float fStack_21b8;
  float fStack_21b4;
  undefined8 local_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined1 local_2170 [16];
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined1 local_2150 [16];
  undefined1 local_2140 [8];
  undefined8 uStack_2138;
  undefined8 local_2130;
  undefined8 uStack_2128;
  undefined1 local_2120 [16];
  undefined8 local_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined4 local_20e4;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 local_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 local_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 local_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined4 local_2030;
  undefined4 uStack_202c;
  undefined4 uStack_2028;
  undefined4 uStack_2024;
  undefined4 local_2014;
  undefined4 local_2010;
  undefined4 uStack_200c;
  undefined4 uStack_2008;
  undefined4 uStack_2004;
  undefined4 local_1ff4;
  undefined4 local_1f90;
  undefined4 uStack_1f8c;
  undefined4 uStack_1f88;
  undefined4 uStack_1f84;
  undefined4 local_1f74;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined1 local_1f30 [16];
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 local_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 local_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [16];
  undefined8 local_1e70;
  undefined8 uStack_1e68;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  undefined8 local_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e40 [16];
  undefined8 local_1e30;
  undefined8 uStack_1e28;
  undefined1 local_1e20 [8];
  undefined8 uStack_1e18;
  undefined1 local_1e10 [16];
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined1 local_1df0 [16];
  undefined1 local_1de0 [8];
  undefined8 uStack_1dd8;
  undefined8 local_1dd0;
  undefined8 uStack_1dc8;
  undefined1 local_1dc0 [16];
  undefined8 local_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined4 local_1d84;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 local_1d70;
  undefined8 uStack_1d68;
  undefined1 local_1d60 [16];
  undefined8 local_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 local_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 local_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 local_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined4 local_1cd0;
  undefined4 uStack_1ccc;
  undefined4 uStack_1cc8;
  undefined4 uStack_1cc4;
  undefined4 local_1cb4;
  undefined8 local_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 local_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  ulong uStack_1c78;
  undefined8 local_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  float local_1b70;
  float fStack_1b6c;
  float fStack_1b68;
  float fStack_1b64;
  float local_1b40;
  float fStack_1b3c;
  float fStack_1b38;
  float fStack_1b34;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float local_1b00;
  float fStack_1afc;
  float fStack_1af8;
  float fStack_1af4;
  float local_1a50;
  float fStack_1a4c;
  float fStack_1a48;
  float fStack_1a44;
  undefined1 local_1a40 [16];
  undefined8 local_1a10;
  ulong uStack_1a08;
  undefined1 local_1a00 [16];
  undefined1 local_19f0 [16];
  undefined1 local_19d0 [16];
  ulong uStack_19b8;
  undefined8 local_19b0;
  ulong uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 local_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 local_18b0;
  undefined8 uStack_18a8;
  undefined8 local_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 local_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 local_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 local_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 local_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined8 local_1690;
  undefined8 uStack_1688;
  undefined8 local_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 local_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 local_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 local_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 local_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 local_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 local_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 local_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 local_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 local_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 local_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 local_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  
  local_825c = *(int *)((long)in_RSI + 0x2c);
  local_8260 = (int)in_RSI[6];
  local_8264 = (int)in_RSI[7];
  local_8268 = local_825c * local_8260;
  local_826c = (int)in_RSI[3];
  if (local_826c == 8) {
    for (local_8270 = 0; local_8270 < local_8264; local_8270 = local_8270 + 1) {
      local_8278 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_8270 * in_RSI[2]);
      for (local_82d0 = 0; local_82d0 < local_8268; local_82d0 = local_82d0 + 1) {
        auVar151._8_8_ = 0x42b0c0a542b0c0a5;
        auVar151._0_8_ = 0x42b0c0a542b0c0a5;
        auVar151._16_8_ = 0x42b0c0a542b0c0a5;
        auVar151._24_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(*local_8278,auVar151);
        auVar43._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar43._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar43._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar43);
        auVar105._8_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar105._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar105._16_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar105._24_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar104._8_8_ = 0x3f0000003f000000;
        auVar104._0_8_ = 0x3f0000003f000000;
        auVar104._16_8_ = 0x3f0000003f000000;
        auVar104._24_8_ = 0x3f0000003f000000;
        auVar8 = vfmadd213ps_fma(auVar105,auVar4,auVar104);
        auVar7 = vroundps_avx(ZEXT1632(auVar8),1);
        auVar5 = vcmpps_avx(ZEXT1632(auVar8),auVar7,1);
        auVar51._8_8_ = 0x3f8000003f800000;
        auVar51._0_8_ = 0x3f8000003f800000;
        auVar51._16_8_ = 0x3f8000003f800000;
        auVar51._24_8_ = 0x3f8000003f800000;
        auVar5 = vandps_avx(auVar5,auVar51);
        auVar5 = vsubps_avx(auVar7,auVar5);
        auVar140._8_8_ = 0x3f3180003f318000;
        auVar140._0_8_ = 0x3f3180003f318000;
        auVar140._16_8_ = 0x3f3180003f318000;
        auVar140._24_8_ = 0x3f3180003f318000;
        auVar8 = vfnmadd213ps_fma(auVar140,auVar5,auVar4);
        auVar141._8_8_ = 0xb95e8083b95e8083;
        auVar141._0_8_ = 0xb95e8083b95e8083;
        auVar141._16_8_ = 0xb95e8083b95e8083;
        auVar141._24_8_ = 0xb95e8083b95e8083;
        auVar9 = vfnmadd213ps_fma(auVar141,auVar5,ZEXT1632(auVar8));
        local_75c0 = auVar9._0_4_;
        fStack_75bc = auVar9._4_4_;
        fStack_75b8 = auVar9._8_4_;
        fStack_75b4 = auVar9._12_4_;
        _local_7660 = CONCAT412(fStack_75b4 * fStack_75b4,
                                CONCAT48(fStack_75b8 * fStack_75b8,
                                         CONCAT44(fStack_75bc * fStack_75bc,local_75c0 * local_75c0)
                                        ));
        local_7700._8_8_ = 0x3950696739506967;
        local_7700._0_8_ = 0x3950696739506967;
        auVar107._16_8_ = 0x3950696739506967;
        auVar107._0_16_ = local_7700;
        auVar107._24_8_ = 0x3950696739506967;
        auVar106._8_8_ = 0x3ab743ce3ab743ce;
        auVar106._0_8_ = 0x3ab743ce3ab743ce;
        auVar106._16_8_ = 0x3ab743ce3ab743ce;
        auVar106._24_8_ = 0x3ab743ce3ab743ce;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar107,auVar106);
        auVar108._8_8_ = 0x3c0889083c088908;
        auVar108._0_8_ = 0x3c0889083c088908;
        auVar108._16_8_ = 0x3c0889083c088908;
        auVar108._24_8_ = 0x3c0889083c088908;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar108);
        auVar109._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar109._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar109._16_8_ = 0x3d2aa9c13d2aa9c1;
        auVar109._24_8_ = 0x3d2aa9c13d2aa9c1;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar109);
        auVar110._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar110._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar110._16_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar110._24_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar110);
        auVar111._8_8_ = 0x3f0000003f000000;
        auVar111._0_8_ = 0x3f0000003f000000;
        auVar111._16_8_ = 0x3f0000003f000000;
        auVar111._24_8_ = 0x3f0000003f000000;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar111);
        auVar8 = vfmadd213ps_fma(ZEXT1632(_local_7660),ZEXT1632(auVar8),ZEXT1632(auVar9));
        local_7580 = auVar8._0_4_;
        fStack_757c = auVar8._4_4_;
        fStack_7578 = auVar8._8_4_;
        fStack_7574 = auVar8._12_4_;
        local_3320 = auVar5._0_4_;
        fStack_331c = auVar5._4_4_;
        fStack_3318 = auVar5._8_4_;
        fStack_3314 = auVar5._12_4_;
        fStack_3310 = auVar5._16_4_;
        fStack_330c = auVar5._20_4_;
        fStack_3308 = auVar5._24_4_;
        fStack_3304 = auVar5._28_4_;
        local_76a0 = CONCAT44((int)fStack_331c,(int)local_3320);
        uStack_7698 = CONCAT44((int)fStack_3314,(int)fStack_3318);
        uStack_7690 = CONCAT44((int)fStack_330c,(int)fStack_3310);
        uStack_7688 = CONCAT44((int)fStack_3304,(int)fStack_3308);
        auVar155._8_8_ = uStack_7698;
        auVar155._0_8_ = local_76a0;
        auVar154._8_8_ = 0x7f0000007f;
        auVar154._0_8_ = 0x7f0000007f;
        auVar8 = vpaddd_avx(auVar155,auVar154);
        auVar153._8_8_ = uStack_7688;
        auVar153._0_8_ = uStack_7690;
        auVar152._8_8_ = 0x7f0000007f;
        auVar152._0_8_ = 0x7f0000007f;
        auVar9 = vpaddd_avx(auVar153,auVar152);
        auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
        auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
        local_7620 = auVar8._0_4_;
        fStack_761c = auVar8._4_4_;
        fStack_7618 = auVar8._8_4_;
        fStack_7614 = auVar8._12_4_;
        fStack_7610 = auVar9._0_4_;
        fStack_760c = auVar9._4_4_;
        fStack_7608 = auVar9._8_4_;
        auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        local_77a0 = auVar8._0_4_;
        fStack_779c = auVar8._4_4_;
        fStack_7798 = auVar8._8_4_;
        fStack_7794 = auVar8._12_4_;
        fStack_7790 = auVar9._0_4_;
        fStack_778c = auVar9._4_4_;
        fStack_7788 = auVar9._8_4_;
        fStack_7784 = auVar9._12_4_;
        local_7be0._4_4_ = (fStack_757c + 1.0) * fStack_761c + fStack_779c;
        local_7be0._0_4_ = (local_7580 + 1.0) * local_7620 + local_77a0;
        fStack_7bd8 = (fStack_7578 + 1.0) * fStack_7618 + fStack_7798;
        fStack_7bd4 = (fStack_7574 + 1.0) * fStack_7614 + fStack_7794;
        uStack_7bd0._0_4_ = fStack_7610 * 1.0 + fStack_7790;
        uStack_7bd0._4_4_ = fStack_760c * 1.0 + fStack_778c;
        uStack_7bc8._0_4_ = fStack_7608 * 1.0 + fStack_7788;
        uStack_7bc8._4_4_ = fStack_7784 + 1.0;
        auVar5 = _local_7be0;
        auVar7 = vcmpps_avx(_local_7be0,ZEXT1632(ZEXT816(0) << 0x40),2);
        uStack_7bc8 = auVar5._24_8_;
        auVar47._16_8_ = uStack_7bd0;
        auVar47._0_16_ = _local_7be0;
        auVar47._24_8_ = uStack_7bc8;
        auVar46._8_8_ = 0x80000000800000;
        auVar46._0_8_ = 0x80000000800000;
        auVar46._16_8_ = 0x80000000800000;
        auVar46._24_8_ = 0x80000000800000;
        auVar5 = vmaxps_avx(auVar47,auVar46);
        auVar8 = vpsrld_avx(auVar5._0_16_,ZEXT416(0x17));
        auVar9 = vpsrld_avx(auVar5._16_16_,ZEXT416(0x17));
        auVar55._8_8_ = 0x807fffff807fffff;
        auVar55._0_8_ = 0x807fffff807fffff;
        auVar55._16_8_ = 0x807fffff807fffff;
        auVar55._24_8_ = 0x807fffff807fffff;
        auVar5 = vandps_avx(auVar5,auVar55);
        auVar57._8_8_ = 0x3f0000003f000000;
        auVar57._0_8_ = 0x3f0000003f000000;
        auVar57._16_8_ = 0x3f0000003f000000;
        auVar57._24_8_ = 0x3f0000003f000000;
        auVar6 = vorps_avx(auVar5,auVar57);
        auVar61._8_8_ = 0x7f0000007f;
        auVar61._0_8_ = 0x7f0000007f;
        auVar8 = vpsubd_avx(auVar8,auVar61);
        auVar60._8_8_ = 0x7f0000007f;
        auVar60._0_8_ = 0x7f0000007f;
        auVar9 = vpsubd_avx(auVar9,auVar60);
        local_61a0 = auVar9._0_8_;
        uStack_6198 = auVar9._8_8_;
        auVar59._16_8_ = local_61a0;
        auVar59._0_16_ = auVar8;
        auVar59._24_8_ = uStack_6198;
        auVar5 = vcvtdq2ps_avx(auVar59);
        local_77c0 = auVar5._0_4_;
        fStack_77bc = auVar5._4_4_;
        fStack_77b8 = auVar5._8_4_;
        fStack_77b4 = auVar5._12_4_;
        fStack_77b0 = auVar5._16_4_;
        fStack_77ac = auVar5._20_4_;
        fStack_77a8 = auVar5._24_4_;
        fStack_77a4 = auVar5._28_4_;
        local_7c60._4_4_ = fStack_77bc + 1.0;
        local_7c60._0_4_ = local_77c0 + 1.0;
        fStack_7c58 = fStack_77b8 + 1.0;
        fStack_7c54 = fStack_77b4 + 1.0;
        uStack_7c50._0_4_ = fStack_77b0 + 1.0;
        uStack_7c50._4_4_ = fStack_77ac + 1.0;
        uStack_7c48._0_4_ = fStack_77a8 + 1.0;
        uStack_7c48._4_4_ = fStack_77a4 + 1.0;
        auVar33 = _local_7c60;
        auVar4 = vcmpps_avx(auVar6,_DAT_01f0afa0,1);
        auVar5 = vandps_avx(auVar6,auVar4);
        auVar39._8_8_ = 0x3f8000003f800000;
        auVar39._0_8_ = 0x3f8000003f800000;
        auVar39._16_8_ = 0x3f8000003f800000;
        auVar39._24_8_ = 0x3f8000003f800000;
        auVar6 = vsubps_avx(auVar6,auVar39);
        uStack_7c48 = auVar33._24_8_;
        auVar54._8_8_ = 0x3f8000003f800000;
        auVar54._0_8_ = 0x3f8000003f800000;
        auVar54._16_8_ = 0x3f8000003f800000;
        auVar54._24_8_ = 0x3f8000003f800000;
        auVar4 = vandps_avx(auVar54,auVar4);
        auVar38._16_8_ = uStack_7c50;
        auVar38._0_16_ = _local_7c60;
        auVar38._24_8_ = uStack_7c48;
        auVar4 = vsubps_avx(auVar38,auVar4);
        local_7800 = auVar6._0_4_;
        fStack_77fc = auVar6._4_4_;
        fStack_77f8 = auVar6._8_4_;
        fStack_77f4 = auVar6._12_4_;
        fStack_77f0 = auVar6._16_4_;
        fStack_77ec = auVar6._20_4_;
        fStack_77e8 = auVar6._24_4_;
        fStack_77e4 = auVar6._28_4_;
        local_7820 = auVar5._0_4_;
        fStack_781c = auVar5._4_4_;
        fStack_7818 = auVar5._8_4_;
        fStack_7814 = auVar5._12_4_;
        fStack_7810 = auVar5._16_4_;
        fStack_780c = auVar5._20_4_;
        fStack_7808 = auVar5._24_4_;
        fStack_7804 = auVar5._28_4_;
        local_7be0._0_4_ = local_7800 + local_7820;
        local_7be0._4_4_ = fStack_77fc + fStack_781c;
        fStack_7bd8 = fStack_77f8 + fStack_7818;
        fStack_7bd4 = fStack_77f4 + fStack_7814;
        fStack_77f0 = fStack_77f0 + fStack_7810;
        fStack_77ec = fStack_77ec + fStack_780c;
        fStack_77e8 = fStack_77e8 + fStack_7808;
        fStack_77e4 = fStack_77e4 + fStack_7804;
        uStack_7bd0._0_4_ = fStack_77f0;
        uStack_7bd0._4_4_ = fStack_77ec;
        uStack_7bc8._0_4_ = fStack_77e8;
        uStack_7bc8._4_4_ = fStack_77e4;
        auVar5 = _local_7be0;
        uStack_7bc8 = auVar5._24_8_;
        uStack_7cd8 = 0x3d9021bb3d9021bb;
        local_7ce0 = (undefined1  [8])0x3d9021bb3d9021bb;
        auVar64._16_8_ = 0x3d9021bb3d9021bb;
        auVar64._0_16_ = _local_7ce0;
        auVar64._24_8_ = 0x3d9021bb3d9021bb;
        auVar63._16_8_ = uStack_7bd0;
        auVar63._0_16_ = _local_7be0;
        auVar63._24_8_ = uStack_7bc8;
        auVar62._8_8_ = 0xbdebd1b8bdebd1b8;
        auVar62._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar62._16_8_ = 0xbdebd1b8bdebd1b8;
        auVar62._24_8_ = 0xbdebd1b8bdebd1b8;
        auVar8 = vfmadd213ps_fma(auVar63,auVar64,auVar62);
        auVar66._16_8_ = uStack_7bd0;
        auVar66._0_16_ = _local_7be0;
        auVar66._24_8_ = uStack_7bc8;
        auVar65._8_8_ = 0x3def251a3def251a;
        auVar65._0_8_ = 0x3def251a3def251a;
        auVar65._16_8_ = 0x3def251a3def251a;
        auVar65._24_8_ = 0x3def251a3def251a;
        auVar8 = vfmadd213ps_fma(auVar66,ZEXT1632(auVar8),auVar65);
        auVar68._16_8_ = uStack_7bd0;
        auVar68._0_16_ = _local_7be0;
        auVar68._24_8_ = uStack_7bc8;
        auVar67._8_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar67._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar67._16_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar67._24_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar8 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar8),auVar67);
        auVar70._16_8_ = uStack_7bd0;
        auVar70._0_16_ = _local_7be0;
        auVar70._24_8_ = uStack_7bc8;
        auVar69._8_8_ = 0x3e11e9bf3e11e9bf;
        auVar69._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar69._16_8_ = 0x3e11e9bf3e11e9bf;
        auVar69._24_8_ = 0x3e11e9bf3e11e9bf;
        auVar8 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar8),auVar69);
        auVar72._16_8_ = uStack_7bd0;
        auVar72._0_16_ = _local_7be0;
        auVar72._24_8_ = uStack_7bc8;
        auVar71._8_8_ = 0xbe2aae50be2aae50;
        auVar71._0_8_ = 0xbe2aae50be2aae50;
        auVar71._16_8_ = 0xbe2aae50be2aae50;
        auVar71._24_8_ = 0xbe2aae50be2aae50;
        auVar8 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar8),auVar71);
        auVar74._16_8_ = uStack_7bd0;
        auVar74._0_16_ = _local_7be0;
        auVar74._24_8_ = uStack_7bc8;
        auVar73._8_8_ = 0x3e4cceac3e4cceac;
        auVar73._0_8_ = 0x3e4cceac3e4cceac;
        auVar73._16_8_ = 0x3e4cceac3e4cceac;
        auVar73._24_8_ = 0x3e4cceac3e4cceac;
        auVar8 = vfmadd213ps_fma(auVar74,ZEXT1632(auVar8),auVar73);
        auVar76._16_8_ = uStack_7bd0;
        auVar76._0_16_ = _local_7be0;
        auVar76._24_8_ = uStack_7bc8;
        auVar75._8_8_ = 0xbe7ffffcbe7ffffc;
        auVar75._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar75._16_8_ = 0xbe7ffffcbe7ffffc;
        auVar75._24_8_ = 0xbe7ffffcbe7ffffc;
        auVar8 = vfmadd213ps_fma(auVar76,ZEXT1632(auVar8),auVar75);
        auVar78._16_8_ = uStack_7bd0;
        auVar78._0_16_ = _local_7be0;
        auVar78._24_8_ = uStack_7bc8;
        auVar77._8_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar77._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar77._16_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar77._24_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar8 = vfmadd213ps_fma(auVar78,ZEXT1632(auVar8),auVar77);
        local_7b60 = auVar8._0_4_;
        fStack_7b5c = auVar8._4_4_;
        fStack_7b58 = auVar8._8_4_;
        fStack_7b54 = auVar8._12_4_;
        local_7ce0._4_4_ =
             fStack_7b5c * (float)local_7be0._4_4_ *
             (float)local_7be0._4_4_ * (float)local_7be0._4_4_;
        local_7ce0._0_4_ =
             local_7b60 * (float)local_7be0._0_4_ *
             (float)local_7be0._0_4_ * (float)local_7be0._0_4_;
        uStack_7cd8._0_4_ = fStack_7b58 * fStack_7bd8 * fStack_7bd8 * fStack_7bd8;
        uStack_7cd8._4_4_ = fStack_7b54 * fStack_7bd4 * fStack_7bd4 * fStack_7bd4;
        uStack_7cd0._0_4_ = fStack_77f0 * 0.0 * fStack_77f0 * fStack_77f0;
        uStack_7cd0._4_4_ = fStack_77ec * 0.0 * fStack_77ec * fStack_77ec;
        auVar80._8_8_ = 0xb95e8083b95e8083;
        auVar80._0_8_ = 0xb95e8083b95e8083;
        auVar80._16_8_ = 0xb95e8083b95e8083;
        auVar80._24_8_ = 0xb95e8083b95e8083;
        auVar79._16_8_ = uStack_7cd0;
        auVar79._0_16_ = _local_7ce0;
        auVar79._24_4_ = fStack_77e8 * 0.0 * fStack_77e8 * fStack_77e8;
        auVar79._28_4_ = 0;
        auVar8 = vfmadd213ps_fma(auVar80,auVar4,auVar79);
        auVar137._4_4_ = (float)local_7be0._4_4_ * (float)local_7be0._4_4_;
        auVar137._0_4_ = (float)local_7be0._0_4_ * (float)local_7be0._0_4_;
        auVar137._12_4_ = fStack_7bd4 * fStack_7bd4;
        auVar137._8_4_ = fStack_7bd8 * fStack_7bd8;
        auVar137._20_4_ = fStack_77ec * fStack_77ec;
        auVar137._16_4_ = fStack_77f0 * fStack_77f0;
        auVar137._28_4_ = fStack_77e4;
        auVar137._24_4_ = fStack_77e8 * fStack_77e8;
        auVar136._8_8_ = 0x3f0000003f000000;
        auVar136._0_8_ = 0x3f0000003f000000;
        auVar136._16_8_ = 0x3f0000003f000000;
        auVar136._24_8_ = 0x3f0000003f000000;
        auVar8 = vfnmadd213ps_fma(auVar136,auVar137,ZEXT1632(auVar8));
        local_7860 = auVar8._0_4_;
        fStack_785c = auVar8._4_4_;
        fStack_7858 = auVar8._8_4_;
        fStack_7854 = auVar8._12_4_;
        local_7be0._4_4_ = (float)local_7be0._4_4_ + fStack_785c;
        local_7be0._0_4_ = (float)local_7be0._0_4_ + local_7860;
        fStack_7bd8 = fStack_7bd8 + fStack_7858;
        fStack_7bd4 = fStack_7bd4 + fStack_7854;
        uStack_7bd0._0_4_ = fStack_77f0 + 0.0;
        uStack_7bd0._4_4_ = fStack_77ec + 0.0;
        uStack_7bc8._0_4_ = fStack_77e8 + 0.0;
        uStack_7bc8._4_4_ = fStack_77e4 + 0.0;
        auVar5 = _local_7be0;
        uStack_7bc8 = auVar5._24_8_;
        auVar82._8_8_ = 0x3f3180003f318000;
        auVar82._0_8_ = 0x3f3180003f318000;
        auVar82._16_8_ = 0x3f3180003f318000;
        auVar82._24_8_ = 0x3f3180003f318000;
        auVar81._16_8_ = uStack_7bd0;
        auVar81._0_16_ = _local_7be0;
        auVar81._24_8_ = uStack_7bc8;
        auVar8 = vfmadd213ps_fma(auVar82,auVar4,auVar81);
        auVar5 = vorps_avx(ZEXT1632(auVar8),auVar7);
        auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        local_2880 = auVar8._0_8_;
        auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        uStack_2830 = auVar2._0_8_;
        uStack_2828 = auVar2._8_8_;
        local_7da0 = auVar5._0_4_;
        fStack_7d9c = auVar5._4_4_;
        fStack_7d98 = auVar5._8_4_;
        fStack_7d94 = auVar5._12_4_;
        fStack_7d90 = auVar5._16_4_;
        fStack_7d8c = auVar5._20_4_;
        fStack_7d88 = auVar5._24_4_;
        uStack_7d84 = auVar5._28_4_;
        local_7dc0 = auVar1._0_4_;
        fStack_7dbc = auVar1._4_4_;
        fStack_7db8 = auVar1._8_4_;
        fStack_7db4 = auVar1._12_4_;
        fStack_7db0 = auVar2._0_4_;
        fStack_7dac = auVar2._4_4_;
        fStack_7da8 = auVar2._8_4_;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
        local_7060 = auVar2._0_4_;
        fStack_705c = auVar2._4_4_;
        fStack_7058 = auVar2._8_4_;
        fStack_7054 = auVar2._12_4_;
        fStack_7050 = auVar3._0_4_;
        fStack_704c = auVar3._4_4_;
        fStack_7048 = auVar3._8_4_;
        fStack_7044 = auVar3._12_4_;
        auVar34._4_4_ = fStack_7d9c * fStack_7dbc;
        auVar34._0_4_ = local_7da0 * local_7dc0;
        auVar34._12_4_ = fStack_7d94 * fStack_7db4;
        auVar34._8_4_ = fStack_7d98 * fStack_7db8;
        auVar34._20_4_ = fStack_7d8c * fStack_7dac;
        auVar34._16_4_ = fStack_7d90 * fStack_7db0;
        auVar34._28_4_ = uStack_7d84;
        auVar34._24_4_ = fStack_7d88 * fStack_7da8;
        auVar5 = vsubps_avx(ZEXT832(0),auVar34);
        auVar148._8_8_ = 0x42b0c0a542b0c0a5;
        auVar148._0_8_ = 0x42b0c0a542b0c0a5;
        auVar148._16_8_ = 0x42b0c0a542b0c0a5;
        auVar148._24_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(auVar5,auVar148);
        auVar40._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar40._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar40._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar40);
        auVar129._8_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar129._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar129._16_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar129._24_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar128._8_8_ = 0x3f0000003f000000;
        auVar128._0_8_ = 0x3f0000003f000000;
        auVar128._16_8_ = 0x3f0000003f000000;
        auVar128._24_8_ = 0x3f0000003f000000;
        auVar3 = vfmadd213ps_fma(auVar129,auVar4,auVar128);
        auVar7 = vroundps_avx(ZEXT1632(auVar3),1);
        auVar5 = vcmpps_avx(ZEXT1632(auVar3),auVar7,1);
        auVar48._8_8_ = 0x3f8000003f800000;
        auVar48._0_8_ = 0x3f8000003f800000;
        auVar48._16_8_ = 0x3f8000003f800000;
        auVar48._24_8_ = 0x3f8000003f800000;
        auVar5 = vandps_avx(auVar5,auVar48);
        auVar5 = vsubps_avx(auVar7,auVar5);
        auVar146._8_8_ = 0x3f3180003f318000;
        auVar146._0_8_ = 0x3f3180003f318000;
        auVar146._16_8_ = 0x3f3180003f318000;
        auVar146._24_8_ = 0x3f3180003f318000;
        auVar3 = vfnmadd213ps_fma(auVar146,auVar5,auVar4);
        auVar147._8_8_ = 0xb95e8083b95e8083;
        auVar147._0_8_ = 0xb95e8083b95e8083;
        auVar147._16_8_ = 0xb95e8083b95e8083;
        auVar147._24_8_ = 0xb95e8083b95e8083;
        auVar10 = vfnmadd213ps_fma(auVar147,auVar5,ZEXT1632(auVar3));
        local_6e80 = auVar10._0_4_;
        fStack_6e7c = auVar10._4_4_;
        fStack_6e78 = auVar10._8_4_;
        fStack_6e74 = auVar10._12_4_;
        _local_6f20 = CONCAT412(fStack_6e74 * fStack_6e74,
                                CONCAT48(fStack_6e78 * fStack_6e78,
                                         CONCAT44(fStack_6e7c * fStack_6e7c,local_6e80 * local_6e80)
                                        ));
        local_6fc0._8_8_ = 0x3950696739506967;
        local_6fc0._0_8_ = 0x3950696739506967;
        auVar131._16_8_ = 0x3950696739506967;
        auVar131._0_16_ = local_6fc0;
        auVar131._24_8_ = 0x3950696739506967;
        auVar130._8_8_ = 0x3ab743ce3ab743ce;
        auVar130._0_8_ = 0x3ab743ce3ab743ce;
        auVar130._16_8_ = 0x3ab743ce3ab743ce;
        auVar130._24_8_ = 0x3ab743ce3ab743ce;
        auVar3 = vfmadd213ps_fma(ZEXT1632(auVar10),auVar131,auVar130);
        auVar132._8_8_ = 0x3c0889083c088908;
        auVar132._0_8_ = 0x3c0889083c088908;
        auVar132._16_8_ = 0x3c0889083c088908;
        auVar132._24_8_ = 0x3c0889083c088908;
        auVar3 = vfmadd213ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar3),auVar132);
        auVar133._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar133._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar133._16_8_ = 0x3d2aa9c13d2aa9c1;
        auVar133._24_8_ = 0x3d2aa9c13d2aa9c1;
        auVar3 = vfmadd213ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar3),auVar133);
        auVar134._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar134._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar134._16_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar134._24_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar3 = vfmadd213ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar3),auVar134);
        auVar135._8_8_ = 0x3f0000003f000000;
        auVar135._0_8_ = 0x3f0000003f000000;
        auVar135._16_8_ = 0x3f0000003f000000;
        auVar135._24_8_ = 0x3f0000003f000000;
        auVar3 = vfmadd213ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar3),auVar135);
        auVar3 = vfmadd213ps_fma(ZEXT1632(_local_6f20),ZEXT1632(auVar3),ZEXT1632(auVar10));
        local_6e40 = auVar3._0_4_;
        fStack_6e3c = auVar3._4_4_;
        fStack_6e38 = auVar3._8_4_;
        fStack_6e34 = auVar3._12_4_;
        local_3380 = auVar5._0_4_;
        fStack_337c = auVar5._4_4_;
        fStack_3378 = auVar5._8_4_;
        fStack_3374 = auVar5._12_4_;
        fStack_3370 = auVar5._16_4_;
        fStack_336c = auVar5._20_4_;
        fStack_3368 = auVar5._24_4_;
        fStack_3364 = auVar5._28_4_;
        local_6f60 = CONCAT44((int)fStack_337c,(int)local_3380);
        uStack_6f58 = CONCAT44((int)fStack_3374,(int)fStack_3378);
        uStack_6f50 = CONCAT44((int)fStack_336c,(int)fStack_3370);
        uStack_6f48 = CONCAT44((int)fStack_3364,(int)fStack_3368);
        auVar164._8_8_ = uStack_6f58;
        auVar164._0_8_ = local_6f60;
        auVar163._8_8_ = 0x7f0000007f;
        auVar163._0_8_ = 0x7f0000007f;
        auVar3 = vpaddd_avx(auVar164,auVar163);
        auVar162._8_8_ = uStack_6f48;
        auVar162._0_8_ = uStack_6f50;
        auVar161._8_8_ = 0x7f0000007f;
        auVar161._0_8_ = 0x7f0000007f;
        auVar10 = vpaddd_avx(auVar162,auVar161);
        auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
        auVar10 = vpslld_avx(auVar10,ZEXT416(0x17));
        local_6ee0 = auVar3._0_4_;
        fStack_6edc = auVar3._4_4_;
        fStack_6ed8 = auVar3._8_4_;
        fStack_6ed4 = auVar3._12_4_;
        fStack_6ed0 = auVar10._0_4_;
        fStack_6ecc = auVar10._4_4_;
        fStack_6ec8 = auVar10._8_4_;
        auVar32._16_4_ = fStack_7050;
        auVar32._0_16_ = auVar2;
        auVar32._20_4_ = fStack_704c;
        auVar32._24_4_ = fStack_7048;
        auVar32._28_4_ = fStack_7044;
        auVar31._4_4_ = fStack_705c + (fStack_6e3c + 1.0) * fStack_6edc;
        auVar31._0_4_ = local_7060 + (local_6e40 + 1.0) * local_6ee0;
        auVar31._8_4_ = fStack_7058 + (fStack_6e38 + 1.0) * fStack_6ed8;
        auVar31._12_4_ = fStack_7054 + (fStack_6e34 + 1.0) * fStack_6ed4;
        auVar31._16_4_ = fStack_7050 + fStack_6ed0 * 1.0;
        auVar31._20_4_ = fStack_704c + fStack_6ecc * 1.0;
        auVar31._24_4_ = fStack_7048 + fStack_6ec8 * 1.0;
        auVar31._28_4_ = fStack_7044 + 1.0;
        auVar5 = vrcpps_avx(auVar31);
        auVar11._4_4_ = fStack_705c * auVar5._4_4_;
        auVar11._0_4_ = local_7060 * auVar5._0_4_;
        auVar11._8_4_ = fStack_7058 * auVar5._8_4_;
        auVar11._12_4_ = fStack_7054 * auVar5._12_4_;
        auVar11._16_4_ = fStack_7050 * auVar5._16_4_;
        auVar11._20_4_ = fStack_704c * auVar5._20_4_;
        auVar11._24_4_ = fStack_7048 * auVar5._24_4_;
        auVar11._28_4_ = fStack_7044;
        auVar2 = vfmsub213ps_fma(auVar11,auVar31,auVar32);
        auVar2 = vfnmadd213ps_fma(ZEXT1632(auVar2),auVar5,auVar11);
        auVar30._16_8_ = uStack_2830;
        auVar30._0_16_ = auVar1;
        auVar30._24_8_ = uStack_2828;
        uStack_7318 = auVar8._8_4_;
        uStack_7314 = auVar8._12_4_;
        uStack_7310 = auVar9._0_4_;
        uStack_730c = auVar9._4_4_;
        uStack_7308 = auVar9._8_4_;
        uStack_7304 = auVar9._12_4_;
        auVar314._0_8_ = local_2880 ^ 0x8000000080000000;
        auVar314._8_4_ = uStack_7318 ^ 0x80000000;
        auVar314._12_4_ = uStack_7314 ^ 0x80000000;
        auVar314._16_4_ = uStack_7310 ^ 0x80000000;
        auVar314._20_4_ = uStack_730c ^ 0x80000000;
        auVar314._24_4_ = uStack_7308 ^ 0x80000000;
        auVar314._28_4_ = uStack_7304 ^ 0x80000000;
        auVar8 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar2),auVar314);
        local_7e80 = (float)*(undefined8 *)*local_8278;
        fStack_7e7c = (float)((ulong)*(undefined8 *)*local_8278 >> 0x20);
        fStack_7e78 = (float)*(undefined8 *)(*local_8278 + 8);
        fStack_7e74 = (float)((ulong)*(undefined8 *)(*local_8278 + 8) >> 0x20);
        fStack_7e70 = (float)*(undefined8 *)(*local_8278 + 0x10);
        fStack_7e6c = (float)((ulong)*(undefined8 *)(*local_8278 + 0x10) >> 0x20);
        fStack_7e68 = (float)*(undefined8 *)(*local_8278 + 0x18);
        uStack_7e64 = (undefined4)((ulong)*(undefined8 *)(*local_8278 + 0x18) >> 0x20);
        local_7ea0 = auVar8._0_4_;
        fStack_7e9c = auVar8._4_4_;
        fStack_7e98 = auVar8._8_4_;
        fStack_7e94 = auVar8._12_4_;
        local_8300 = CONCAT44(fStack_7e7c * fStack_7e9c,local_7e80 * local_7ea0);
        uStack_82f8 = CONCAT44(fStack_7e74 * fStack_7e94,fStack_7e78 * fStack_7e98);
        uStack_82f0 = CONCAT44(fStack_7e6c * 0.0,fStack_7e70 * 0.0);
        uStack_82e8 = CONCAT44(uStack_7e64,fStack_7e68 * 0.0);
        auVar28._8_8_ = uStack_82f8;
        auVar28._0_8_ = local_8300;
        auVar28._16_8_ = uStack_82f0;
        auVar28._24_8_ = uStack_82e8;
        *local_8278 = auVar28;
        local_8278 = local_8278 + 1;
      }
    }
  }
  else if (local_826c == 4) {
    for (local_8304 = 0; local_8304 < local_8264; local_8304 = local_8304 + 1) {
      local_8310 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_8304 * in_RSI[2]);
      for (local_835c = 0; local_835c < local_8268; local_835c = local_835c + 1) {
        auVar297._8_8_ = 0x42b0c0a542b0c0a5;
        auVar297._0_8_ = 0x42b0c0a542b0c0a5;
        auVar8 = vminps_avx(*local_8310,auVar297);
        auVar191._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar191._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar8,auVar191);
        local_21e0 = auVar1._0_4_;
        fStack_21dc = auVar1._4_4_;
        fStack_21d8 = auVar1._8_4_;
        fStack_21d4 = auVar1._12_4_;
        fVar309 = local_21e0 * 1.442695 + 0.5;
        fVar310 = fStack_21dc * 1.442695 + 0.5;
        fVar311 = fStack_21d8 * 1.442695 + 0.5;
        fVar312 = fStack_21d4 * 1.442695 + 0.5;
        local_22a0 = CONCAT44(fVar310,fVar309);
        uStack_2298._0_4_ = fVar311;
        uStack_2298._4_4_ = fVar312;
        local_22b0 = CONCAT44((int)fVar310,(int)fVar309);
        uStack_22a8._0_4_ = (int)fVar311;
        uStack_22a8._4_4_ = (int)fVar312;
        auVar209._8_8_ = uStack_22a8;
        auVar209._0_8_ = local_22b0;
        auVar9 = vcvtdq2ps_avx(auVar209);
        auVar301._8_8_ = uStack_2298;
        auVar301._0_8_ = local_22a0;
        auVar8 = vcmpps_avx(auVar301,auVar9,1);
        auVar199._8_8_ = 0x3f8000003f800000;
        auVar199._0_8_ = 0x3f8000003f800000;
        auVar8 = vpand_avx(auVar8,auVar199);
        auVar8 = vsubps_avx(auVar9,auVar8);
        auVar286._8_8_ = 0x3f3180003f318000;
        auVar286._0_8_ = 0x3f3180003f318000;
        auVar9 = vfnmadd213ps_fma(auVar286,auVar8,auVar1);
        auVar287._8_8_ = 0xb95e8083b95e8083;
        auVar287._0_8_ = 0xb95e8083b95e8083;
        auVar1 = vfnmadd213ps_fma(auVar287,auVar8,auVar9);
        local_2200 = auVar1._0_4_;
        fStack_21fc = auVar1._4_4_;
        fStack_21f8 = auVar1._8_4_;
        fStack_21f4 = auVar1._12_4_;
        local_2290 = CONCAT44(fStack_21fc * fStack_21fc,local_2200 * local_2200);
        uStack_2288._0_4_ = fStack_21f8 * fStack_21f8;
        uStack_2288._4_4_ = fStack_21f4 * fStack_21f4;
        auVar255._8_8_ = 0x3950696739506967;
        auVar255._0_8_ = 0x3950696739506967;
        auVar254._8_8_ = 0x3ab743ce3ab743ce;
        auVar254._0_8_ = 0x3ab743ce3ab743ce;
        auVar9 = vfmadd213ps_fma(auVar1,auVar255,auVar254);
        auVar256._8_8_ = 0x3c0889083c088908;
        auVar256._0_8_ = 0x3c0889083c088908;
        auVar9 = vfmadd213ps_fma(auVar1,auVar9,auVar256);
        auVar257._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar257._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar9 = vfmadd213ps_fma(auVar1,auVar9,auVar257);
        auVar258._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar258._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar9 = vfmadd213ps_fma(auVar1,auVar9,auVar258);
        auVar259._8_8_ = 0x3f0000003f000000;
        auVar259._0_8_ = 0x3f0000003f000000;
        auVar9 = vfmadd213ps_fma(auVar1,auVar9,auVar259);
        auVar260._8_8_ = uStack_2288;
        auVar260._0_8_ = local_2290;
        auVar9 = vfmadd213ps_fma(auVar260,auVar9,auVar1);
        local_21c0 = auVar9._0_4_;
        fStack_21bc = auVar9._4_4_;
        fStack_21b8 = auVar9._8_4_;
        fStack_21b4 = auVar9._12_4_;
        local_110 = auVar8._0_4_;
        fStack_10c = auVar8._4_4_;
        fStack_108 = auVar8._8_4_;
        fStack_104 = auVar8._12_4_;
        local_22b0 = CONCAT44((int)fStack_10c,(int)local_110);
        uStack_22a8._0_4_ = (int)fStack_108;
        uStack_22a8._4_4_ = (int)fStack_104;
        auVar168._8_8_ = uStack_22a8;
        auVar168._0_8_ = local_22b0;
        auVar167._8_8_ = 0x7f0000007f;
        auVar167._0_8_ = 0x7f0000007f;
        auVar8 = vpaddd_avx(auVar168,auVar167);
        auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
        local_2230 = auVar8._0_4_;
        fStack_222c = auVar8._4_4_;
        fStack_2228 = auVar8._8_4_;
        fStack_2224 = auVar8._12_4_;
        local_25d0 = CONCAT44((fStack_21bc + 1.0) * fStack_222c + 1.0,
                              (local_21c0 + 1.0) * local_2230 + 1.0);
        uStack_25c8._0_4_ = (fStack_21b8 + 1.0) * fStack_2228 + 1.0;
        uStack_25c8._4_4_ = (fStack_21b4 + 1.0) * fStack_2224 + 1.0;
        uStack_19b8 = SUB168(ZEXT816(0),4);
        auVar187._8_8_ = uStack_25c8;
        auVar187._0_8_ = local_25d0;
        auVar304._8_8_ = 0;
        auVar304._0_8_ = uStack_19b8;
        auVar8 = vcmpps_avx(auVar187,auVar304 << 0x40,2);
        auVar195._8_8_ = uStack_25c8;
        auVar195._0_8_ = local_25d0;
        auVar194._8_8_ = 0x80000000800000;
        auVar194._0_8_ = 0x80000000800000;
        auVar9 = vmaxps_avx(auVar195,auVar194);
        auVar1 = vpsrld_avx(auVar9,ZEXT416(0x17));
        auVar203._8_8_ = 0x807fffff807fffff;
        auVar203._0_8_ = 0x807fffff807fffff;
        auVar9 = vpand_avx(auVar9,auVar203);
        auVar205._8_8_ = 0x3f0000003f000000;
        auVar205._0_8_ = 0x3f0000003f000000;
        auVar2 = vpor_avx(auVar9,auVar205);
        auVar165._8_8_ = 0x7f0000007f;
        auVar165._0_8_ = 0x7f0000007f;
        auVar9 = vpsubd_avx(auVar1,auVar165);
        auVar9 = vcvtdq2ps_avx(auVar9);
        local_2340 = auVar9._0_4_;
        fStack_233c = auVar9._4_4_;
        fStack_2338 = auVar9._8_4_;
        fStack_2334 = auVar9._12_4_;
        local_2610 = CONCAT44(fStack_233c + 1.0,local_2340 + 1.0);
        uStack_2608._0_4_ = fStack_2338 + 1.0;
        uStack_2608._4_4_ = fStack_2334 + 1.0;
        auVar211._8_8_ = 0x3f3504f33f3504f3;
        auVar211._0_8_ = 0x3f3504f33f3504f3;
        auVar9 = vcmpps_avx(auVar2,auVar211,1);
        auVar1 = vpand_avx(auVar2,auVar9);
        auVar174._8_8_ = 0x3f8000003f800000;
        auVar174._0_8_ = 0x3f8000003f800000;
        auVar2 = vsubps_avx(auVar2,auVar174);
        auVar202._8_8_ = 0x3f8000003f800000;
        auVar202._0_8_ = 0x3f8000003f800000;
        auVar9 = vpand_avx(auVar202,auVar9);
        auVar173._8_8_ = uStack_2608;
        auVar173._0_8_ = local_2610;
        auVar9 = vsubps_avx(auVar173,auVar9);
        local_2360 = auVar2._0_4_;
        fStack_235c = auVar2._4_4_;
        fStack_2358 = auVar2._8_4_;
        fStack_2354 = auVar2._12_4_;
        local_2370 = auVar1._0_4_;
        fStack_236c = auVar1._4_4_;
        fStack_2368 = auVar1._8_4_;
        fStack_2364 = auVar1._12_4_;
        local_2360 = local_2360 + local_2370;
        fStack_235c = fStack_235c + fStack_236c;
        fStack_2358 = fStack_2358 + fStack_2368;
        fStack_2354 = fStack_2354 + fStack_2364;
        local_25d0 = CONCAT44(fStack_235c,local_2360);
        uStack_25c8._0_4_ = fStack_2358;
        uStack_25c8._4_4_ = fStack_2354;
        auVar214._8_8_ = 0x3d9021bb3d9021bb;
        auVar214._0_8_ = 0x3d9021bb3d9021bb;
        auVar213._8_8_ = uStack_25c8;
        auVar213._0_8_ = local_25d0;
        auVar212._8_8_ = 0xbdebd1b8bdebd1b8;
        auVar212._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1 = vfmadd213ps_fma(auVar213,auVar214,auVar212);
        auVar216._8_8_ = uStack_25c8;
        auVar216._0_8_ = local_25d0;
        auVar215._8_8_ = 0x3def251a3def251a;
        auVar215._0_8_ = 0x3def251a3def251a;
        auVar1 = vfmadd213ps_fma(auVar216,auVar1,auVar215);
        auVar218._8_8_ = uStack_25c8;
        auVar218._0_8_ = local_25d0;
        auVar217._8_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar217._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1 = vfmadd213ps_fma(auVar218,auVar1,auVar217);
        auVar220._8_8_ = uStack_25c8;
        auVar220._0_8_ = local_25d0;
        auVar219._8_8_ = 0x3e11e9bf3e11e9bf;
        auVar219._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1 = vfmadd213ps_fma(auVar220,auVar1,auVar219);
        auVar222._8_8_ = uStack_25c8;
        auVar222._0_8_ = local_25d0;
        auVar221._8_8_ = 0xbe2aae50be2aae50;
        auVar221._0_8_ = 0xbe2aae50be2aae50;
        auVar1 = vfmadd213ps_fma(auVar222,auVar1,auVar221);
        auVar224._8_8_ = uStack_25c8;
        auVar224._0_8_ = local_25d0;
        auVar223._8_8_ = 0x3e4cceac3e4cceac;
        auVar223._0_8_ = 0x3e4cceac3e4cceac;
        auVar1 = vfmadd213ps_fma(auVar224,auVar1,auVar223);
        auVar226._8_8_ = uStack_25c8;
        auVar226._0_8_ = local_25d0;
        auVar225._8_8_ = 0xbe7ffffcbe7ffffc;
        auVar225._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1 = vfmadd213ps_fma(auVar226,auVar1,auVar225);
        auVar228._8_8_ = uStack_25c8;
        auVar228._0_8_ = local_25d0;
        auVar227._8_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar227._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1 = vfmadd213ps_fma(auVar228,auVar1,auVar227);
        local_2550 = auVar1._0_4_;
        fStack_254c = auVar1._4_4_;
        fStack_2548 = auVar1._8_4_;
        fStack_2544 = auVar1._12_4_;
        local_2650 = CONCAT44(fStack_254c * fStack_235c * fStack_235c * fStack_235c,
                              local_2550 * local_2360 * local_2360 * local_2360);
        uStack_2648._0_4_ = fStack_2548 * fStack_2358 * fStack_2358 * fStack_2358;
        uStack_2648._4_4_ = fStack_2544 * fStack_2354 * fStack_2354 * fStack_2354;
        auVar230._8_8_ = 0xb95e8083b95e8083;
        auVar230._0_8_ = 0xb95e8083b95e8083;
        auVar229._8_8_ = uStack_2648;
        auVar229._0_8_ = local_2650;
        auVar1 = vfmadd213ps_fma(auVar230,auVar9,auVar229);
        auVar283._4_4_ = fStack_235c * fStack_235c;
        auVar283._0_4_ = local_2360 * local_2360;
        auVar283._12_4_ = fStack_2354 * fStack_2354;
        auVar283._8_4_ = fStack_2358 * fStack_2358;
        auVar282._8_8_ = 0x3f0000003f000000;
        auVar282._0_8_ = 0x3f0000003f000000;
        auVar1 = vfnmadd213ps_fma(auVar282,auVar283,auVar1);
        local_2390 = auVar1._0_4_;
        fStack_238c = auVar1._4_4_;
        fStack_2388 = auVar1._8_4_;
        fStack_2384 = auVar1._12_4_;
        local_25d0 = CONCAT44(fStack_235c + fStack_238c,local_2360 + local_2390);
        uStack_25c8._0_4_ = fStack_2358 + fStack_2388;
        uStack_25c8._4_4_ = fStack_2354 + fStack_2384;
        auVar232._8_8_ = 0x3f3180003f318000;
        auVar232._0_8_ = 0x3f3180003f318000;
        auVar231._8_8_ = uStack_25c8;
        auVar231._0_8_ = local_25d0;
        auVar9 = vfmadd213ps_fma(auVar232,auVar9,auVar231);
        auVar8 = vpor_avx(auVar9,auVar8);
        local_26d0 = auVar8._0_4_;
        fStack_26cc = auVar8._4_4_;
        fStack_26c8 = auVar8._8_4_;
        fStack_26c4 = auVar8._12_4_;
        auVar180._8_8_ = 0x3f8000003f800000;
        auVar180._0_8_ = 0x3f8000003f800000;
        auVar183._4_4_ = fStack_26cc * 2.0;
        auVar183._0_4_ = local_26d0 * 2.0;
        auVar183._12_4_ = fStack_26c4 * 2.0;
        auVar183._8_4_ = fStack_26c8 * 2.0;
        auVar305._8_8_ = 0;
        auVar305._0_8_ = uStack_19b8;
        auVar8 = vsubps_avx(auVar305 << 0x40,auVar183);
        auVar294._8_8_ = 0x42b0c0a542b0c0a5;
        auVar294._0_8_ = 0x42b0c0a542b0c0a5;
        auVar8 = vminps_avx(auVar8,auVar294);
        auVar188._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar188._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar8,auVar188);
        local_1b20 = auVar1._0_4_;
        fStack_1b1c = auVar1._4_4_;
        fStack_1b18 = auVar1._8_4_;
        fStack_1b14 = auVar1._12_4_;
        fVar309 = local_1b20 * 1.442695 + 0.5;
        fVar310 = fStack_1b1c * 1.442695 + 0.5;
        fVar311 = fStack_1b18 * 1.442695 + 0.5;
        fVar312 = fStack_1b14 * 1.442695 + 0.5;
        local_1be0 = CONCAT44(fVar310,fVar309);
        uStack_1bd8._0_4_ = fVar311;
        uStack_1bd8._4_4_ = fVar312;
        local_1bf0 = CONCAT44((int)fVar310,(int)fVar309);
        uStack_1be8._0_4_ = (int)fVar311;
        uStack_1be8._4_4_ = (int)fVar312;
        auVar206._8_8_ = uStack_1be8;
        auVar206._0_8_ = local_1bf0;
        auVar9 = vcvtdq2ps_avx(auVar206);
        auVar298._8_8_ = uStack_1bd8;
        auVar298._0_8_ = local_1be0;
        auVar8 = vcmpps_avx(auVar298,auVar9,1);
        auVar196._8_8_ = 0x3f8000003f800000;
        auVar196._0_8_ = 0x3f8000003f800000;
        auVar8 = vpand_avx(auVar8,auVar196);
        auVar8 = vsubps_avx(auVar9,auVar8);
        auVar292._8_8_ = 0x3f3180003f318000;
        auVar292._0_8_ = 0x3f3180003f318000;
        auVar9 = vfnmadd213ps_fma(auVar292,auVar8,auVar1);
        auVar293._8_8_ = 0xb95e8083b95e8083;
        auVar293._0_8_ = 0xb95e8083b95e8083;
        auVar1 = vfnmadd213ps_fma(auVar293,auVar8,auVar9);
        local_1b40 = auVar1._0_4_;
        fStack_1b3c = auVar1._4_4_;
        fStack_1b38 = auVar1._8_4_;
        fStack_1b34 = auVar1._12_4_;
        local_1bd0 = CONCAT44(fStack_1b3c * fStack_1b3c,local_1b40 * local_1b40);
        uStack_1bc8._0_4_ = fStack_1b38 * fStack_1b38;
        uStack_1bc8._4_4_ = fStack_1b34 * fStack_1b34;
        auVar276._8_8_ = 0x3950696739506967;
        auVar276._0_8_ = 0x3950696739506967;
        auVar275._8_8_ = 0x3ab743ce3ab743ce;
        auVar275._0_8_ = 0x3ab743ce3ab743ce;
        auVar9 = vfmadd213ps_fma(auVar1,auVar276,auVar275);
        auVar277._8_8_ = 0x3c0889083c088908;
        auVar277._0_8_ = 0x3c0889083c088908;
        auVar9 = vfmadd213ps_fma(auVar1,auVar9,auVar277);
        auVar278._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar278._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar9 = vfmadd213ps_fma(auVar1,auVar9,auVar278);
        auVar279._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar279._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar9 = vfmadd213ps_fma(auVar1,auVar9,auVar279);
        auVar280._8_8_ = 0x3f0000003f000000;
        auVar280._0_8_ = 0x3f0000003f000000;
        auVar9 = vfmadd213ps_fma(auVar1,auVar9,auVar280);
        auVar281._8_8_ = uStack_1bc8;
        auVar281._0_8_ = local_1bd0;
        auVar9 = vfmadd213ps_fma(auVar281,auVar9,auVar1);
        local_1b00 = auVar9._0_4_;
        fStack_1afc = auVar9._4_4_;
        fStack_1af8 = auVar9._8_4_;
        fStack_1af4 = auVar9._12_4_;
        local_170 = auVar8._0_4_;
        fStack_16c = auVar8._4_4_;
        fStack_168 = auVar8._8_4_;
        fStack_164 = auVar8._12_4_;
        local_1bf0 = CONCAT44((int)fStack_16c,(int)local_170);
        uStack_1be8._0_4_ = (int)fStack_168;
        uStack_1be8._4_4_ = (int)fStack_164;
        auVar182._8_8_ = uStack_1be8;
        auVar182._0_8_ = local_1bf0;
        auVar181._8_8_ = 0x7f0000007f;
        auVar181._0_8_ = 0x7f0000007f;
        auVar8 = vpaddd_avx(auVar182,auVar181);
        auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
        local_1b70 = auVar8._0_4_;
        fStack_1b6c = auVar8._4_4_;
        fStack_1b68 = auVar8._8_4_;
        fStack_1b64 = auVar8._12_4_;
        auVar184._4_4_ = (fStack_1afc + 1.0) * fStack_1b6c + 1.0;
        auVar184._0_4_ = (local_1b00 + 1.0) * local_1b70 + 1.0;
        auVar184._8_4_ = (fStack_1af8 + 1.0) * fStack_1b68 + 1.0;
        auVar184._12_4_ = (fStack_1af4 + 1.0) * fStack_1b64 + 1.0;
        auVar8 = vdivps_avx(auVar180,auVar184);
        local_26f0 = auVar8._0_4_;
        fStack_26ec = auVar8._4_4_;
        fStack_26e8 = auVar8._8_4_;
        fStack_26e4 = auVar8._12_4_;
        auVar313._0_4_ = local_26f0 * 2.0;
        auVar313._4_4_ = fStack_26ec * 2.0;
        auVar313._8_4_ = fStack_26e8 * 2.0;
        auVar313._12_4_ = fStack_26e4 * 2.0;
        auVar176._8_8_ = 0x3f8000003f800000;
        auVar176._0_8_ = 0x3f8000003f800000;
        auVar8 = vsubps_avx(auVar313,auVar176);
        local_2760 = (float)*(undefined8 *)*local_8310;
        fStack_275c = (float)((ulong)*(undefined8 *)*local_8310 >> 0x20);
        fStack_2758 = (float)*(undefined8 *)(*local_8310 + 8);
        fStack_2754 = (float)((ulong)*(undefined8 *)(*local_8310 + 8) >> 0x20);
        local_2770 = auVar8._0_4_;
        fStack_276c = auVar8._4_4_;
        fStack_2768 = auVar8._8_4_;
        fStack_2764 = auVar8._12_4_;
        local_8370 = CONCAT44(fStack_275c * fStack_276c,local_2760 * local_2770);
        uStack_8368 = CONCAT44(fStack_2754 * fStack_2764,fStack_2758 * fStack_2768);
        auVar29._8_8_ = uStack_8368;
        auVar29._0_8_ = local_8370;
        *local_8310 = auVar29;
        local_8310 = local_8310 + 1;
      }
    }
  }
  else {
    local_8250 = in_RSI;
    for (local_8374 = 0; local_8374 < local_8264; local_8374 = local_8374 + 1) {
      local_8228 = &local_83c8;
      local_7fb4 = *(int *)((long)local_8250 + 0x2c);
      local_7fb8 = (int)local_8250[6];
      local_7fbc = *(undefined4 *)((long)local_8250 + 0x34);
      local_7fc8 = (undefined1 (*) [32])
                   (*local_8250 + local_8250[8] * (long)local_8374 * local_8250[2]);
      local_7fd0 = local_8250[2];
      local_7fd4 = (undefined4)local_8250[3];
      local_7fe0 = local_8250[4];
      local_7fb0 = &local_83c8;
      local_7fa0 = (long)local_7fb4 * (long)local_7fb8 * local_7fd0;
      local_81f0 = &local_83c8;
      local_81a0 = &local_83c8;
      local_7fa4 = 0x10;
      local_8234 = local_8374;
      local_8235 = 1;
      local_83c8 = 0;
      local_83b8 = 0;
      local_83b0 = 0;
      local_83a0 = 0;
      local_839c = 0;
      local_8398 = 0;
      local_8394 = 0;
      local_8390 = 0;
      local_8388 = 0;
      local_83c0 = 0;
      local_8380 = local_7fc8;
      for (local_83cc = 0; local_83cc + 7 < local_8268; local_83cc = local_83cc + 8) {
        local_8190 = local_8380;
        local_8180 = *(undefined8 *)*local_8380;
        uStack_8178 = *(undefined8 *)(*local_8380 + 8);
        uStack_8170 = *(undefined8 *)(*local_8380 + 0x10);
        auVar303 = *(undefined1 (*) [24])*local_8380;
        auVar302 = *(undefined1 (*) [24])*local_8380;
        uStack_8168 = *(undefined8 *)(*local_8380 + 0x18);
        auVar11 = *local_8380;
        local_6a80 = ZEXT1632(ZEXT816(0) << 0x40);
        local_7a40 = 0x3f8000003f800000;
        uStack_7a38 = 0x3f8000003f800000;
        uStack_7a30 = 0x3f8000003f800000;
        uStack_7a28 = 0x3f8000003f800000;
        local_7480._0_8_ = auVar302._0_8_;
        local_33e0 = local_7480._0_8_;
        local_7480._8_8_ = auVar302._8_8_;
        uStack_33d8 = local_7480._8_8_;
        local_7480._16_8_ = auVar302._16_8_;
        uStack_33d0 = local_7480._16_8_;
        local_3440 = 0x42b0c0a542b0c0a5;
        uStack_3438 = 0x42b0c0a542b0c0a5;
        uStack_3430 = 0x42b0c0a542b0c0a5;
        uStack_3428 = 0x42b0c0a542b0c0a5;
        auVar150._8_8_ = 0x42b0c0a542b0c0a5;
        auVar150._0_8_ = 0x42b0c0a542b0c0a5;
        auVar150._16_8_ = 0x42b0c0a542b0c0a5;
        auVar150._24_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(*local_8380,auVar150);
        local_7480._0_8_ = auVar5._0_8_;
        local_6960 = local_7480._0_8_;
        local_7480._8_8_ = auVar5._8_8_;
        uStack_6958 = local_7480._8_8_;
        local_7480._16_8_ = auVar5._16_8_;
        uStack_6950 = local_7480._16_8_;
        local_7480._24_8_ = auVar5._24_8_;
        uStack_6948 = local_7480._24_8_;
        local_69c0 = 0xc2b0c0a5c2b0c0a5;
        uStack_69b8 = 0xc2b0c0a5c2b0c0a5;
        uStack_69b0 = 0xc2b0c0a5c2b0c0a5;
        uStack_69a8 = 0xc2b0c0a5c2b0c0a5;
        auVar42._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar42._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar42._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar42._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar42);
        local_7480._0_8_ = auVar4._0_8_;
        local_5940 = local_7480._0_8_;
        local_7480._8_8_ = auVar4._8_8_;
        uStack_5938 = local_7480._8_8_;
        local_7480._16_8_ = auVar4._16_8_;
        uStack_5930 = local_7480._16_8_;
        local_7480._24_8_ = auVar4._24_8_;
        uStack_5928 = local_7480._24_8_;
        local_5c00 = 0x3fb8aa3b3fb8aa3b;
        uStack_5bf8 = 0x3fb8aa3b3fb8aa3b;
        uStack_5bf0 = 0x3fb8aa3b3fb8aa3b;
        uStack_5be8 = 0x3fb8aa3b3fb8aa3b;
        local_6400 = 0x3f0000003f000000;
        uStack_63f8 = 0x3f0000003f000000;
        uStack_63f0 = 0x3f0000003f000000;
        uStack_63e8 = 0x3f0000003f000000;
        local_3fe0 = local_7480._0_8_;
        uStack_3fd8 = local_7480._8_8_;
        uStack_3fd0 = local_7480._16_8_;
        uStack_3fc8 = local_7480._24_8_;
        local_4000 = 0x3fb8aa3b3fb8aa3b;
        uStack_3ff8 = 0x3fb8aa3b3fb8aa3b;
        uStack_3ff0 = 0x3fb8aa3b3fb8aa3b;
        uStack_3fe8 = 0x3fb8aa3b3fb8aa3b;
        local_4020 = 0x3f0000003f000000;
        uStack_4018 = 0x3f0000003f000000;
        uStack_4010 = 0x3f0000003f000000;
        uStack_4008 = 0x3f0000003f000000;
        auVar113._8_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar113._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar113._16_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar113._24_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar112._8_8_ = 0x3f0000003f000000;
        auVar112._0_8_ = 0x3f0000003f000000;
        auVar112._16_8_ = 0x3f0000003f000000;
        auVar112._24_8_ = 0x3f0000003f000000;
        auVar8 = vfmadd213ps_fma(auVar113,auVar4,auVar112);
        auVar7 = vroundps_avx(ZEXT1632(auVar8),1);
        auVar5 = vcmpps_avx(ZEXT1632(auVar8),auVar7,1);
        local_7520._0_8_ = auVar5._0_8_;
        local_6620 = local_7520._0_8_;
        local_7520._8_8_ = auVar5._8_8_;
        uStack_6618 = local_7520._8_8_;
        local_7520._16_8_ = auVar5._16_8_;
        uStack_6610 = local_7520._16_8_;
        local_7520._24_8_ = auVar5._24_8_;
        uStack_6608 = local_7520._24_8_;
        local_6640 = 0x3f8000003f800000;
        uStack_6638 = 0x3f8000003f800000;
        uStack_6630 = 0x3f8000003f800000;
        uStack_6628 = 0x3f8000003f800000;
        auVar50._8_8_ = 0x3f8000003f800000;
        auVar50._0_8_ = 0x3f8000003f800000;
        auVar50._16_8_ = 0x3f8000003f800000;
        auVar50._24_8_ = 0x3f8000003f800000;
        local_7520 = vandps_avx(auVar5,auVar50);
        local_74a0 = auVar7._0_8_;
        local_6c60 = local_74a0;
        uStack_7498 = auVar7._8_8_;
        uStack_6c58 = uStack_7498;
        uStack_7490 = auVar7._16_8_;
        uStack_6c50 = uStack_7490;
        uStack_7488 = auVar7._24_8_;
        uStack_6c48 = uStack_7488;
        local_6c80 = local_7520._0_8_;
        uStack_6c78 = local_7520._8_8_;
        uStack_6c70 = local_7520._16_8_;
        uStack_6c68 = local_7520._24_8_;
        local_74c0 = vsubps_avx(auVar7,local_7520);
        local_4ce0 = local_74c0._0_8_;
        uStack_4cd8 = local_74c0._8_8_;
        uStack_4cd0 = local_74c0._16_8_;
        uStack_4cc8 = local_74c0._24_8_;
        local_4d20 = local_7480._0_8_;
        uStack_4d18 = local_7480._8_8_;
        uStack_4d10 = local_7480._16_8_;
        uStack_4d08 = local_7480._24_8_;
        local_5660 = 0x3f3180003f318000;
        uStack_5658 = 0x3f3180003f318000;
        uStack_5650 = 0x3f3180003f318000;
        uStack_5648 = 0x3f3180003f318000;
        local_3680 = local_74c0._0_8_;
        uStack_3678 = local_74c0._8_8_;
        uStack_3670 = local_74c0._16_8_;
        uStack_3668 = local_74c0._24_8_;
        local_36a0 = 0x3f3180003f318000;
        uStack_3698 = 0x3f3180003f318000;
        uStack_3690 = 0x3f3180003f318000;
        uStack_3688 = 0x3f3180003f318000;
        local_36c0 = local_7480._0_8_;
        uStack_36b8 = local_7480._8_8_;
        uStack_36b0 = local_7480._16_8_;
        uStack_36a8 = local_7480._24_8_;
        auVar142._8_8_ = 0x3f3180003f318000;
        auVar142._0_8_ = 0x3f3180003f318000;
        auVar142._16_8_ = 0x3f3180003f318000;
        auVar142._24_8_ = 0x3f3180003f318000;
        auVar8 = vfnmadd213ps_fma(auVar142,local_74c0,auVar4);
        local_4d40 = local_74c0._0_8_;
        uStack_4d38 = local_74c0._8_8_;
        uStack_4d30 = local_74c0._16_8_;
        uStack_4d28 = local_74c0._24_8_;
        local_7480._0_8_ = auVar8._0_8_;
        local_4d80 = local_7480._0_8_;
        local_7480._8_8_ = auVar8._8_8_;
        uStack_4d78 = local_7480._8_8_;
        uStack_4d70 = 0;
        uStack_4d68 = 0;
        local_5600 = 0xb95e8083b95e8083;
        uStack_55f8 = 0xb95e8083b95e8083;
        uStack_55f0 = 0xb95e8083b95e8083;
        uStack_55e8 = 0xb95e8083b95e8083;
        local_3620 = local_74c0._0_8_;
        uStack_3618 = local_74c0._8_8_;
        uStack_3610 = local_74c0._16_8_;
        uStack_3608 = local_74c0._24_8_;
        local_3640 = 0xb95e8083b95e8083;
        uStack_3638 = 0xb95e8083b95e8083;
        uStack_3630 = 0xb95e8083b95e8083;
        uStack_3628 = 0xb95e8083b95e8083;
        local_3660 = local_7480._0_8_;
        uStack_3658 = local_7480._8_8_;
        uStack_3650 = 0;
        uStack_3648 = 0;
        auVar143._8_8_ = 0xb95e8083b95e8083;
        auVar143._0_8_ = 0xb95e8083b95e8083;
        auVar143._16_8_ = 0xb95e8083b95e8083;
        auVar143._24_8_ = 0xb95e8083b95e8083;
        auVar1 = vfnmadd213ps_fma(auVar143,local_74c0,ZEXT1632(auVar8));
        local_7480._0_8_ = auVar1._0_8_;
        local_7420 = local_7480._0_8_;
        local_7480._8_8_ = auVar1._8_8_;
        uStack_7418 = local_7480._8_8_;
        uStack_7410 = 0;
        uStack_7408 = 0;
        local_7400._0_4_ = auVar1._0_4_;
        local_7400._4_4_ = auVar1._4_4_;
        uStack_73f8._0_4_ = auVar1._8_4_;
        uStack_73f8._4_4_ = auVar1._12_4_;
        local_74a0._4_4_ = local_7400._4_4_ * local_7400._4_4_;
        local_74a0._0_4_ = (float)local_7400 * (float)local_7400;
        local_5ba0 = local_74a0;
        uStack_7498._0_4_ = (float)uStack_73f8 * (float)uStack_73f8;
        uStack_7498._4_4_ = uStack_73f8._4_4_ * uStack_73f8._4_4_;
        auVar9 = _local_74a0;
        _local_74a0 = ZEXT1632(_local_74a0);
        auVar50 = _local_74a0;
        uStack_7538 = 0x3950696739506967;
        local_7540 = (undefined1  [8])0x3950696739506967;
        local_59a0 = 0x3950696739506967;
        uStack_5998 = 0x3950696739506967;
        uStack_5990 = 0x3950696739506967;
        uStack_5988 = 0x3950696739506967;
        local_59c0 = local_7480._0_8_;
        uStack_59b8 = local_7480._8_8_;
        uStack_59b0 = 0;
        uStack_59a8 = 0;
        local_5c80 = 0x3ab743ce3ab743ce;
        uStack_5c78 = 0x3ab743ce3ab743ce;
        uStack_5c70 = 0x3ab743ce3ab743ce;
        uStack_5c68 = 0x3ab743ce3ab743ce;
        local_3f80 = 0x3950696739506967;
        uStack_3f78 = 0x3950696739506967;
        uStack_3f70 = 0x3950696739506967;
        uStack_3f68 = 0x3950696739506967;
        local_3fa0 = local_7480._0_8_;
        uStack_3f98 = local_7480._8_8_;
        uStack_3f90 = 0;
        uStack_3f88 = 0;
        local_3fc0 = 0x3ab743ce3ab743ce;
        uStack_3fb8 = 0x3ab743ce3ab743ce;
        uStack_3fb0 = 0x3ab743ce3ab743ce;
        uStack_3fa8 = 0x3ab743ce3ab743ce;
        auVar115._16_8_ = 0x3950696739506967;
        auVar115._0_16_ = _local_7540;
        auVar115._24_8_ = 0x3950696739506967;
        auVar114._8_8_ = 0x3ab743ce3ab743ce;
        auVar114._0_8_ = 0x3ab743ce3ab743ce;
        auVar114._16_8_ = 0x3ab743ce3ab743ce;
        auVar114._24_8_ = 0x3ab743ce3ab743ce;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar1),auVar115,auVar114);
        local_7540 = auVar8._0_8_;
        local_5a00 = local_7540;
        uStack_7538 = auVar8._8_8_;
        uStack_59f8 = uStack_7538;
        uStack_59f0 = 0;
        uStack_59e8 = 0;
        local_5a20 = local_7480._0_8_;
        uStack_5a18 = local_7480._8_8_;
        uStack_5a10 = 0;
        uStack_5a08 = 0;
        local_5ce0 = 0x3c0889083c088908;
        uStack_5cd8 = 0x3c0889083c088908;
        uStack_5cd0 = 0x3c0889083c088908;
        uStack_5cc8 = 0x3c0889083c088908;
        local_3f20 = local_7540;
        uStack_3f18 = uStack_7538;
        uStack_3f10 = 0;
        uStack_3f08 = 0;
        local_3f40 = local_7480._0_8_;
        uStack_3f38 = local_7480._8_8_;
        uStack_3f30 = 0;
        uStack_3f28 = 0;
        local_3f60 = 0x3c0889083c088908;
        uStack_3f58 = 0x3c0889083c088908;
        uStack_3f50 = 0x3c0889083c088908;
        uStack_3f48 = 0x3c0889083c088908;
        auVar116._8_8_ = 0x3c0889083c088908;
        auVar116._0_8_ = 0x3c0889083c088908;
        auVar116._16_8_ = 0x3c0889083c088908;
        auVar116._24_8_ = 0x3c0889083c088908;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar1),ZEXT1632(auVar8),auVar116);
        local_7540 = auVar8._0_8_;
        local_5a60 = local_7540;
        uStack_7538 = auVar8._8_8_;
        uStack_5a58 = uStack_7538;
        uStack_5a50 = 0;
        uStack_5a48 = 0;
        local_5a80 = local_7480._0_8_;
        uStack_5a78 = local_7480._8_8_;
        uStack_5a70 = 0;
        uStack_5a68 = 0;
        local_5d40 = 0x3d2aa9c13d2aa9c1;
        uStack_5d38 = 0x3d2aa9c13d2aa9c1;
        uStack_5d30 = 0x3d2aa9c13d2aa9c1;
        uStack_5d28 = 0x3d2aa9c13d2aa9c1;
        local_3ec0 = local_7540;
        uStack_3eb8 = uStack_7538;
        uStack_3eb0 = 0;
        uStack_3ea8 = 0;
        local_3ee0 = local_7480._0_8_;
        uStack_3ed8 = local_7480._8_8_;
        uStack_3ed0 = 0;
        uStack_3ec8 = 0;
        local_3f00 = 0x3d2aa9c13d2aa9c1;
        uStack_3ef8 = 0x3d2aa9c13d2aa9c1;
        uStack_3ef0 = 0x3d2aa9c13d2aa9c1;
        uStack_3ee8 = 0x3d2aa9c13d2aa9c1;
        auVar117._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar117._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar117._16_8_ = 0x3d2aa9c13d2aa9c1;
        auVar117._24_8_ = 0x3d2aa9c13d2aa9c1;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar1),ZEXT1632(auVar8),auVar117);
        local_7540 = auVar8._0_8_;
        local_5ac0 = local_7540;
        uStack_7538 = auVar8._8_8_;
        uStack_5ab8 = uStack_7538;
        uStack_5ab0 = 0;
        uStack_5aa8 = 0;
        local_5ae0 = local_7480._0_8_;
        uStack_5ad8 = local_7480._8_8_;
        uStack_5ad0 = 0;
        uStack_5ac8 = 0;
        local_5da0 = 0x3e2aaaaa3e2aaaaa;
        uStack_5d98 = 0x3e2aaaaa3e2aaaaa;
        uStack_5d90 = 0x3e2aaaaa3e2aaaaa;
        uStack_5d88 = 0x3e2aaaaa3e2aaaaa;
        local_3e60 = local_7540;
        uStack_3e58 = uStack_7538;
        uStack_3e50 = 0;
        uStack_3e48 = 0;
        local_3e80 = local_7480._0_8_;
        uStack_3e78 = local_7480._8_8_;
        uStack_3e70 = 0;
        uStack_3e68 = 0;
        local_3ea0 = 0x3e2aaaaa3e2aaaaa;
        uStack_3e98 = 0x3e2aaaaa3e2aaaaa;
        uStack_3e90 = 0x3e2aaaaa3e2aaaaa;
        uStack_3e88 = 0x3e2aaaaa3e2aaaaa;
        auVar118._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar118._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar118._16_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar118._24_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar1),ZEXT1632(auVar8),auVar118);
        local_7540 = auVar8._0_8_;
        local_5b20 = local_7540;
        uStack_7538 = auVar8._8_8_;
        uStack_5b18 = uStack_7538;
        uStack_5b10 = 0;
        uStack_5b08 = 0;
        local_5b40 = local_7480._0_8_;
        uStack_5b38 = local_7480._8_8_;
        uStack_5b30 = 0;
        uStack_5b28 = 0;
        local_3e00 = local_7540;
        uStack_3df8 = uStack_7538;
        uStack_3df0 = 0;
        uStack_3de8 = 0;
        local_3e20 = local_7480._0_8_;
        uStack_3e18 = local_7480._8_8_;
        uStack_3e10 = 0;
        uStack_3e08 = 0;
        local_3e40 = 0x3f0000003f000000;
        uStack_3e38 = 0x3f0000003f000000;
        uStack_3e30 = 0x3f0000003f000000;
        uStack_3e28 = 0x3f0000003f000000;
        auVar119._8_8_ = 0x3f0000003f000000;
        auVar119._0_8_ = 0x3f0000003f000000;
        auVar119._16_8_ = 0x3f0000003f000000;
        auVar119._24_8_ = 0x3f0000003f000000;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar1),ZEXT1632(auVar8),auVar119);
        local_7540 = auVar8._0_8_;
        local_5b80 = local_7540;
        uStack_7538 = auVar8._8_8_;
        uStack_5b78 = uStack_7538;
        uStack_5b70 = 0;
        uStack_5b68 = 0;
        uStack_7498 = auVar9._8_8_;
        uStack_5b98 = uStack_7498;
        uStack_5b90 = 0;
        uStack_5b88 = 0;
        local_5bc0 = local_7480._0_8_;
        uStack_5bb8 = local_7480._8_8_;
        uStack_5bb0 = 0;
        uStack_5ba8 = 0;
        local_3da0 = local_7540;
        uStack_3d98 = uStack_7538;
        uStack_3d90 = 0;
        uStack_3d88 = 0;
        local_3dc0 = local_5ba0;
        uStack_3db8 = uStack_7498;
        uStack_3db0 = 0;
        uStack_3da8 = 0;
        local_3de0 = local_7480._0_8_;
        uStack_3dd8 = local_7480._8_8_;
        uStack_3dd0 = 0;
        uStack_3dc8 = 0;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),ZEXT1632(auVar1));
        local_7540 = auVar8._0_8_;
        uVar12 = local_7540;
        uStack_7538 = auVar8._8_8_;
        uVar13 = uStack_7538;
        uStack_73b0 = 0;
        uStack_73a8 = 0;
        local_73e0 = 0x3f8000003f800000;
        uStack_73d8 = 0x3f8000003f800000;
        uStack_73d0 = 0x3f8000003f800000;
        uStack_73c8 = 0x3f8000003f800000;
        local_73c0._0_4_ = auVar8._0_4_;
        local_73c0._4_4_ = auVar8._4_4_;
        uStack_73b8._0_4_ = auVar8._8_4_;
        uStack_73b8._4_4_ = auVar8._12_4_;
        local_7540._4_4_ = local_73c0._4_4_ + 1.0;
        local_7540._0_4_ = (float)local_73c0 + 1.0;
        uStack_7538._0_4_ = (float)uStack_73b8 + 1.0;
        uStack_7538._4_4_ = uStack_73b8._4_4_ + 1.0;
        uStack_7530._0_4_ = 0x3f800000;
        uStack_7530._4_4_ = 0x3f800000;
        auVar302 = _local_7540;
        uStack_7528._0_4_ = 0x3f800000;
        uStack_7528._4_4_ = 0x3f800000;
        auVar5 = _local_7540;
        local_3340._0_4_ = local_74c0._0_4_;
        local_3340._4_4_ = local_74c0._4_4_;
        uStack_3338._0_4_ = local_74c0._8_4_;
        uStack_3338._4_4_ = local_74c0._12_4_;
        uStack_3330._0_4_ = local_74c0._16_4_;
        uStack_3330._4_4_ = local_74c0._20_4_;
        uStack_3328._0_4_ = local_74c0._24_4_;
        uStack_3328._4_4_ = local_74c0._28_4_;
        local_74e0 = CONCAT44((int)local_3340._4_4_,(int)(float)local_3340);
        uStack_74d8 = CONCAT44((int)uStack_3338._4_4_,(int)(float)uStack_3338);
        uStack_74d0 = CONCAT44((int)uStack_3330._4_4_,(int)(float)uStack_3330);
        uStack_74c8 = CONCAT44((int)uStack_3328._4_4_,(int)(float)uStack_3328);
        local_3020 = local_74e0;
        uStack_3018 = uStack_74d8;
        uStack_3010 = uStack_74d0;
        uStack_3008 = uStack_74c8;
        local_3040 = 0x7f0000007f;
        uStack_3038 = 0x7f0000007f;
        uStack_3030 = 0x7f0000007f;
        uStack_3028 = 0x7f0000007f;
        local_30c0 = local_74e0;
        uStack_30b8 = uStack_74d8;
        uStack_30b0 = uStack_74d0;
        uStack_30a8 = uStack_74c8;
        local_30e0 = 0x7f0000007f;
        uStack_30d8 = 0x7f0000007f;
        uStack_30d0 = 0x7f0000007f;
        uStack_30c8 = 0x7f0000007f;
        local_3070 = 0x7f0000007f;
        uStack_3068 = 0x7f0000007f;
        local_3080 = 0x7f0000007f;
        uStack_3078 = 0x7f0000007f;
        local_2b10 = local_74e0;
        uStack_2b08 = uStack_74d8;
        local_2b20 = 0x7f0000007f;
        uStack_2b18 = 0x7f0000007f;
        auVar156._8_8_ = uStack_74d8;
        auVar156._0_8_ = local_74e0;
        auVar10._8_8_ = 0x7f0000007f;
        auVar10._0_8_ = 0x7f0000007f;
        local_3050 = vpaddd_avx(auVar156,auVar10);
        local_2b30 = uStack_74d0;
        uStack_2b28 = uStack_74c8;
        local_2b40 = 0x7f0000007f;
        uStack_2b38 = 0x7f0000007f;
        auVar3._8_8_ = uStack_74c8;
        auVar3._0_8_ = uStack_74d0;
        auVar2._8_8_ = 0x7f0000007f;
        auVar2._0_8_ = 0x7f0000007f;
        local_3060 = vpaddd_avx(auVar3,auVar2);
        local_3100 = local_3050._0_8_;
        uStack_30f8 = local_3050._8_8_;
        uStack_30f0 = local_3060._0_8_;
        uStack_30e8 = local_3060._8_8_;
        local_30a0 = local_3050._0_8_;
        uStack_3098 = local_3050._8_8_;
        uStack_3090 = local_3060._0_8_;
        uStack_3088 = local_3060._8_8_;
        local_2ce0 = local_3050._0_8_;
        uStack_2cd8 = local_3050._8_8_;
        uStack_2cd0 = local_3060._0_8_;
        uStack_2cc8 = local_3060._8_8_;
        local_2ce4 = 0x17;
        local_2d60 = local_3050._0_8_;
        uStack_2d58 = local_3050._8_8_;
        uStack_2d50 = local_3060._0_8_;
        uStack_2d48 = local_3060._8_8_;
        local_2a10 = local_3050._0_8_;
        uStack_2a08 = local_3050._8_8_;
        local_2a14 = 0x17;
        local_2d00 = vpslld_avx(local_3050,ZEXT416(0x17));
        local_2a30 = local_3060._0_8_;
        uStack_2a28 = local_3060._8_8_;
        local_2a34 = 0x17;
        local_2d10 = vpslld_avx(local_3060,ZEXT416(0x17));
        local_2d80 = local_2d00._0_8_;
        uStack_2d78 = local_2d00._8_8_;
        uStack_2d70 = local_2d10._0_8_;
        uStack_2d68 = local_2d10._8_8_;
        local_2d40 = local_2d00._0_8_;
        uStack_2d38 = local_2d00._8_8_;
        uStack_2d30 = local_2d10._0_8_;
        uStack_2d28 = local_2d10._8_8_;
        local_74e0 = local_2d00._0_8_;
        uStack_74d8 = local_2d00._8_8_;
        uStack_74d0 = local_2d10._0_8_;
        uStack_74c8 = local_2d10._8_8_;
        local_2bc0 = local_2d00._0_8_;
        uStack_2bb8 = local_2d00._8_8_;
        uStack_2bb0 = local_2d10._0_8_;
        uStack_2ba8 = local_2d10._8_8_;
        local_7560 = local_2d00._0_8_;
        uStack_7558 = local_2d00._8_8_;
        uStack_7550 = local_2d10._0_8_;
        uStack_7548 = local_2d10._8_8_;
        local_7440 = local_7540;
        uStack_7438 = uStack_7538;
        uStack_7530 = auVar302._16_8_;
        uStack_7430 = uStack_7530;
        uStack_7528 = auVar5._24_8_;
        uStack_7428 = uStack_7528;
        local_7460._0_4_ = local_2d00._0_4_;
        local_7460._4_4_ = local_2d00._4_4_;
        uStack_7458._0_4_ = local_2d00._8_4_;
        uStack_7458._4_4_ = local_2d00._12_4_;
        uStack_7450._0_4_ = local_2d10._0_4_;
        uStack_7450._4_4_ = local_2d10._4_4_;
        uStack_7448._0_4_ = local_2d10._8_4_;
        local_7540._0_4_ = ((float)local_73c0 + 1.0) * (float)local_7460;
        local_7540._4_4_ = (local_73c0._4_4_ + 1.0) * local_7460._4_4_;
        uStack_7458._0_4_ = ((float)uStack_73b8 + 1.0) * (float)uStack_7458;
        uStack_7458._4_4_ = (uStack_73b8._4_4_ + 1.0) * uStack_7458._4_4_;
        uStack_7538._0_4_ = (float)uStack_7458;
        uStack_7538._4_4_ = uStack_7458._4_4_;
        uStack_7530._0_4_ = (float)uStack_7450 * 1.0;
        uStack_7530._4_4_ = uStack_7450._4_4_ * 1.0;
        auVar302 = _local_7540;
        uStack_7528._0_4_ = (float)uStack_7448 * 1.0;
        uStack_7528._4_4_ = 0x3f800000;
        auVar42 = _local_7540;
        local_7740 = local_7540;
        uStack_7738 = uStack_7538;
        uStack_7530 = auVar302._16_8_;
        uStack_7730 = uStack_7530;
        uStack_7528 = auVar42._24_8_;
        uStack_7728 = uStack_7528;
        local_7384 = 0x3f800000;
        local_28e0 = 0x3f800000;
        auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
        auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
        auStack_28f0 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
        local_85a0 = auVar8._0_8_;
        local_2900 = local_85a0;
        uStack_8598 = auVar8._8_8_;
        uStack_28f8 = uStack_8598;
        local_6280 = 0x7f0000007f;
        uStack_6278 = 0x7f0000007f;
        uStack_6270 = 0x7f0000007f;
        uStack_6268 = 0x7f0000007f;
        local_7760._0_4_ = auVar8._0_4_;
        local_7760._4_4_ = auVar8._4_4_;
        uStack_7758._0_4_ = auVar8._8_4_;
        uStack_7758._4_4_ = auVar8._12_4_;
        uStack_7750._0_4_ = auStack_28f0._0_4_;
        uStack_7750._4_4_ = auStack_28f0._4_4_;
        uStack_7748._0_4_ = auStack_28f0._8_4_;
        uStack_7748._4_4_ = auStack_28f0._12_4_;
        local_7a00._4_4_ = (float)local_7540._4_4_ + local_7760._4_4_;
        local_7a00._0_4_ = (float)local_7540._0_4_ + (float)local_7760;
        uStack_79f8._0_4_ = (float)uStack_7458 + (float)uStack_7758;
        uStack_79f8._4_4_ = uStack_7458._4_4_ + uStack_7758._4_4_;
        uStack_79f0._0_4_ = (float)uStack_7450 * 1.0 + (float)uStack_7750;
        uStack_79f0._4_4_ = uStack_7450._4_4_ * 1.0 + uStack_7750._4_4_;
        auVar302 = _local_7a00;
        uStack_79e8._0_4_ = (float)uStack_7448 * 1.0 + (float)uStack_7748;
        uStack_79e8._4_4_ = uStack_7748._4_4_ + 1.0;
        auVar5 = _local_7a00;
        local_7a60 = vcmpps_avx(_local_7a00,local_6a80,2);
        local_68e0 = local_7a00;
        uStack_68d8 = uStack_79f8;
        uStack_79f0 = auVar302._16_8_;
        uStack_68d0 = uStack_79f0;
        uStack_79e8 = auVar5._24_8_;
        uStack_68c8 = uStack_79e8;
        local_6900 = 0x80000000800000;
        uStack_68f8 = 0x80000000800000;
        uStack_68f0 = 0x80000000800000;
        uStack_68e8 = 0x80000000800000;
        auVar45._16_8_ = uStack_79f0;
        auVar45._0_16_ = _local_7a00;
        auVar45._24_8_ = uStack_79e8;
        auVar44._8_8_ = 0x80000000800000;
        auVar44._0_8_ = 0x80000000800000;
        auVar44._16_8_ = 0x80000000800000;
        auVar44._24_8_ = 0x80000000800000;
        auVar5 = vmaxps_avx(auVar45,auVar44);
        local_7a00 = auVar5._0_8_;
        local_6700 = local_7a00;
        uStack_79f8 = auVar5._8_8_;
        uStack_66f8 = uStack_79f8;
        uStack_79f0 = auVar5._16_8_;
        uStack_66f0 = uStack_79f0;
        uStack_79e8 = auVar5._24_8_;
        uStack_66e8 = uStack_79e8;
        local_67e0 = local_7a00;
        uStack_67d8 = uStack_79f8;
        uStack_67d0 = uStack_79f0;
        uStack_67c8 = uStack_79e8;
        local_67e4 = 0x17;
        local_6860 = local_7a00;
        uStack_6858 = uStack_79f8;
        uStack_6850 = uStack_79f0;
        uStack_6848 = uStack_79e8;
        local_4ad0 = local_7a00;
        uStack_4ac8 = uStack_79f8;
        local_4ad4 = 0x17;
        local_6800 = vpsrld_avx(auVar5._0_16_,ZEXT416(0x17));
        local_4af0 = uStack_79f0;
        uStack_4ae8 = uStack_79e8;
        local_4af4 = 0x17;
        local_6810 = vpsrld_avx(auVar5._16_16_,ZEXT416(0x17));
        local_6880 = local_6800._0_8_;
        uStack_6878 = local_6800._8_8_;
        uStack_6870 = local_6810._0_8_;
        uStack_6868 = local_6810._8_8_;
        local_6840 = local_6800._0_8_;
        uStack_6838 = local_6800._8_8_;
        uStack_6830 = local_6810._0_8_;
        uStack_6828 = local_6810._8_8_;
        local_6520 = local_7a00;
        uStack_6518 = uStack_79f8;
        uStack_6510 = uStack_79f0;
        uStack_6508 = uStack_79e8;
        local_6540 = 0x807fffff807fffff;
        uStack_6538 = 0x807fffff807fffff;
        uStack_6530 = 0x807fffff807fffff;
        uStack_6528 = 0x807fffff807fffff;
        auVar53._8_8_ = 0x807fffff807fffff;
        auVar53._0_8_ = 0x807fffff807fffff;
        auVar53._16_8_ = 0x807fffff807fffff;
        auVar53._24_8_ = 0x807fffff807fffff;
        auVar5 = vandps_avx(auVar5,auVar53);
        local_7a00 = auVar5._0_8_;
        local_63e0 = local_7a00;
        uStack_79f8 = auVar5._8_8_;
        uStack_63d8 = uStack_79f8;
        uStack_79f0 = auVar5._16_8_;
        uStack_63d0 = uStack_79f0;
        uStack_79e8 = auVar5._24_8_;
        uStack_63c8 = uStack_79e8;
        auVar56._8_8_ = 0x3f0000003f000000;
        auVar56._0_8_ = 0x3f0000003f000000;
        auVar56._16_8_ = 0x3f0000003f000000;
        auVar56._24_8_ = 0x3f0000003f000000;
        auVar4 = vorps_avx(auVar5,auVar56);
        local_6260 = local_6800._0_8_;
        uStack_6258 = local_6800._8_8_;
        uStack_6250 = local_6810._0_8_;
        uStack_6248 = local_6810._8_8_;
        local_6300 = local_6800._0_8_;
        uStack_62f8 = local_6800._8_8_;
        uStack_62f0 = local_6810._0_8_;
        uStack_62e8 = local_6810._8_8_;
        local_6320 = 0x7f0000007f;
        uStack_6318 = 0x7f0000007f;
        uStack_6310 = 0x7f0000007f;
        uStack_6308 = 0x7f0000007f;
        local_62b0 = 0x7f0000007f;
        uStack_62a8 = 0x7f0000007f;
        local_62c0 = 0x7f0000007f;
        uStack_62b8 = 0x7f0000007f;
        local_4a50 = local_6800._0_8_;
        uStack_4a48 = local_6800._8_8_;
        local_4a60 = 0x7f0000007f;
        uStack_4a58 = 0x7f0000007f;
        auVar9._8_8_ = 0x7f0000007f;
        auVar9._0_8_ = 0x7f0000007f;
        local_6290 = vpsubd_avx(local_6800,auVar9);
        local_4a70 = local_6810._0_8_;
        uStack_4a68 = local_6810._8_8_;
        local_4a80 = 0x7f0000007f;
        uStack_4a78 = 0x7f0000007f;
        auVar8._8_8_ = 0x7f0000007f;
        auVar8._0_8_ = 0x7f0000007f;
        local_62a0 = vpsubd_avx(local_6810,auVar8);
        local_6340 = local_6290._0_8_;
        uStack_6338 = local_6290._8_8_;
        uStack_6330 = local_62a0._0_8_;
        uStack_6328 = local_62a0._8_8_;
        local_62e0 = local_6290._0_8_;
        uStack_62d8 = local_6290._8_8_;
        uStack_62d0 = local_62a0._0_8_;
        uStack_62c8 = local_62a0._8_8_;
        local_7a20 = local_6290._0_8_;
        uStack_7a18 = local_6290._8_8_;
        uStack_7a10 = local_62a0._0_8_;
        uStack_7a08 = local_62a0._8_8_;
        local_6140 = local_6290._0_8_;
        uStack_6138 = local_6290._8_8_;
        uStack_6130 = local_62a0._0_8_;
        uStack_6128 = local_62a0._8_8_;
        auVar58._16_8_ = local_62a0._0_8_;
        auVar58._0_16_ = local_6290;
        auVar58._24_8_ = local_62a0._8_8_;
        auVar5 = vcvtdq2ps_avx(auVar58);
        local_7a80 = auVar5._0_8_;
        uVar14 = local_7a80;
        uStack_7a78 = auVar5._8_8_;
        uVar15 = uStack_7a78;
        uStack_7a70 = auVar5._16_8_;
        uVar16 = uStack_7a70;
        uStack_7a68 = auVar5._24_8_;
        uVar17 = uStack_7a68;
        local_78a0 = 0x3f8000003f800000;
        uStack_7898 = 0x3f8000003f800000;
        uStack_7890 = 0x3f8000003f800000;
        uStack_7888 = 0x3f8000003f800000;
        local_7880._0_4_ = auVar5._0_4_;
        local_7880._4_4_ = auVar5._4_4_;
        uStack_7878._0_4_ = auVar5._8_4_;
        uStack_7878._4_4_ = auVar5._12_4_;
        uStack_7870._0_4_ = auVar5._16_4_;
        uStack_7870._4_4_ = auVar5._20_4_;
        uStack_7868._0_4_ = auVar5._24_4_;
        uStack_7868._4_4_ = auVar5._28_4_;
        local_7a80._4_4_ = local_7880._4_4_ + 1.0;
        local_7a80._0_4_ = (float)local_7880 + 1.0;
        uStack_7a78._0_4_ = (float)uStack_7878 + 1.0;
        uStack_7a78._4_4_ = uStack_7878._4_4_ + 1.0;
        uStack_7a70._0_4_ = (float)uStack_7870 + 1.0;
        uStack_7a70._4_4_ = uStack_7870._4_4_ + 1.0;
        auVar302 = _local_7a80;
        uStack_7a68._0_4_ = (float)uStack_7868 + 1.0;
        uStack_7a68._4_4_ = uStack_7868._4_4_ + 1.0;
        auVar7 = _local_7a80;
        local_7aa0 = vcmpps_avx(auVar4,_DAT_01f0afa0,1);
        local_7a00 = auVar4._0_8_;
        local_6560 = local_7a00;
        uStack_79f8 = auVar4._8_8_;
        uStack_6558 = uStack_79f8;
        uStack_79f0 = auVar4._16_8_;
        uStack_6550 = uStack_79f0;
        uStack_79e8 = auVar4._24_8_;
        uStack_6548 = uStack_79e8;
        local_6580 = local_7aa0._0_8_;
        uStack_6578 = local_7aa0._8_8_;
        uStack_6570 = local_7aa0._16_8_;
        uStack_6568 = local_7aa0._24_8_;
        local_7ac0 = vandps_avx(auVar4,local_7aa0);
        local_6ba0 = local_7a00;
        uStack_6b98 = uStack_79f8;
        uStack_6b90 = uStack_79f0;
        uStack_6b88 = uStack_79e8;
        local_6bc0 = 0x3f8000003f800000;
        uStack_6bb8 = 0x3f8000003f800000;
        uStack_6bb0 = 0x3f8000003f800000;
        uStack_6ba8 = 0x3f8000003f800000;
        auVar37._8_8_ = 0x3f8000003f800000;
        auVar37._0_8_ = 0x3f8000003f800000;
        auVar37._16_8_ = 0x3f8000003f800000;
        auVar37._24_8_ = 0x3f8000003f800000;
        auVar5 = vsubps_avx(auVar4,auVar37);
        local_6be0 = local_7a80;
        uStack_6bd8 = uStack_7a78;
        uStack_7a70 = auVar302._16_8_;
        uStack_6bd0 = uStack_7a70;
        uStack_7a68 = auVar7._24_8_;
        uStack_6bc8 = uStack_7a68;
        local_65a0 = 0x3f8000003f800000;
        uStack_6598 = 0x3f8000003f800000;
        uStack_6590 = 0x3f8000003f800000;
        uStack_6588 = 0x3f8000003f800000;
        local_65c0 = local_7aa0._0_8_;
        uStack_65b8 = local_7aa0._8_8_;
        uStack_65b0 = local_7aa0._16_8_;
        uStack_65a8 = local_7aa0._24_8_;
        auVar52._8_8_ = 0x3f8000003f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        auVar52._16_8_ = 0x3f8000003f800000;
        auVar52._24_8_ = 0x3f8000003f800000;
        local_6c00 = vandps_avx(auVar52,local_7aa0);
        auVar36._16_8_ = uStack_7a70;
        auVar36._0_16_ = _local_7a80;
        auVar36._24_8_ = uStack_7a68;
        _local_7a80 = vsubps_avx(auVar36,local_6c00);
        local_7a00 = auVar5._0_8_;
        uVar18 = local_7a00;
        uStack_79f8 = auVar5._8_8_;
        uVar19 = uStack_79f8;
        uStack_79f0 = auVar5._16_8_;
        uVar20 = uStack_79f0;
        uStack_79e8 = auVar5._24_8_;
        uVar21 = uStack_79e8;
        local_78c0._0_4_ = auVar5._0_4_;
        local_78c0._4_4_ = auVar5._4_4_;
        uStack_78b8._0_4_ = auVar5._8_4_;
        uStack_78b8._4_4_ = auVar5._12_4_;
        uStack_78b0._0_4_ = auVar5._16_4_;
        uStack_78b0._4_4_ = auVar5._20_4_;
        uStack_78a8._0_4_ = auVar5._24_4_;
        uStack_78a8._4_4_ = auVar5._28_4_;
        local_78e0._0_4_ = local_7ac0._0_4_;
        local_78e0._4_4_ = local_7ac0._4_4_;
        uStack_78d8._0_4_ = local_7ac0._8_4_;
        uStack_78d8._4_4_ = local_7ac0._12_4_;
        uStack_78d0._0_4_ = local_7ac0._16_4_;
        uStack_78d0._4_4_ = local_7ac0._20_4_;
        uStack_78c8._0_4_ = local_7ac0._24_4_;
        uStack_78c8._4_4_ = local_7ac0._28_4_;
        local_7a00._0_4_ = (float)local_78c0 + (float)local_78e0;
        local_7a00._4_4_ = local_78c0._4_4_ + local_78e0._4_4_;
        uStack_78b8._0_4_ = (float)uStack_78b8 + (float)uStack_78d8;
        uStack_78b8._4_4_ = uStack_78b8._4_4_ + uStack_78d8._4_4_;
        uStack_78b0._0_4_ = (float)uStack_78b0 + (float)uStack_78d0;
        uStack_78b0._4_4_ = uStack_78b0._4_4_ + uStack_78d0._4_4_;
        uStack_78a8._0_4_ = (float)uStack_78a8 + (float)uStack_78c8;
        fStack_7ac4 = uStack_78a8._4_4_ + uStack_78c8._4_4_;
        uStack_79f8._0_4_ = (float)uStack_78b8;
        uStack_79f8._4_4_ = uStack_78b8._4_4_;
        uStack_79f0._0_4_ = (float)uStack_78b0;
        uStack_79f0._4_4_ = uStack_78b0._4_4_;
        auVar302 = _local_7a00;
        uStack_79e8._0_4_ = (float)uStack_78a8;
        uStack_79e8._4_4_ = fStack_7ac4;
        auVar5 = _local_7a00;
        local_7960 = local_7a00;
        uStack_7958 = uStack_79f8;
        uStack_79f0 = auVar302._16_8_;
        uStack_7950 = uStack_79f0;
        uStack_79e8 = auVar5._24_8_;
        uStack_7948 = uStack_79e8;
        local_7ae0 = (float)local_7a00._0_4_ * (float)local_7a00._0_4_;
        fStack_7adc = (float)local_7a00._4_4_ * (float)local_7a00._4_4_;
        fStack_7ad8 = (float)uStack_78b8 * (float)uStack_78b8;
        fStack_7ad4 = uStack_78b8._4_4_ * uStack_78b8._4_4_;
        fStack_7ad0 = (float)uStack_78b0 * (float)uStack_78b0;
        fStack_7acc = uStack_78b0._4_4_ * uStack_78b0._4_4_;
        fStack_7ac8 = (float)uStack_78a8 * (float)uStack_78a8;
        uStack_7af8 = 0x3d9021bb3d9021bb;
        local_7b00 = (undefined1  [8])0x3d9021bb3d9021bb;
        local_52e0 = 0x3d9021bb3d9021bb;
        uStack_52d8 = 0x3d9021bb3d9021bb;
        uStack_52d0 = 0x3d9021bb3d9021bb;
        uStack_52c8 = 0x3d9021bb3d9021bb;
        local_5300 = local_7a00;
        uStack_52f8 = uStack_79f8;
        uStack_52f0 = uStack_79f0;
        uStack_52e8 = uStack_79e8;
        local_5320 = 0xbdebd1b8bdebd1b8;
        uStack_5318 = 0xbdebd1b8bdebd1b8;
        uStack_5310 = 0xbdebd1b8bdebd1b8;
        uStack_5308 = 0xbdebd1b8bdebd1b8;
        local_4640 = 0x3d9021bb3d9021bb;
        uStack_4638 = 0x3d9021bb3d9021bb;
        uStack_4630 = 0x3d9021bb3d9021bb;
        uStack_4628 = 0x3d9021bb3d9021bb;
        local_4660 = local_7a00;
        uStack_4658 = uStack_79f8;
        uStack_4650 = uStack_79f0;
        uStack_4648 = uStack_79e8;
        local_4680 = 0xbdebd1b8bdebd1b8;
        uStack_4678 = 0xbdebd1b8bdebd1b8;
        uStack_4670 = 0xbdebd1b8bdebd1b8;
        uStack_4668 = 0xbdebd1b8bdebd1b8;
        auVar85._16_8_ = 0x3d9021bb3d9021bb;
        auVar85._0_16_ = _local_7b00;
        auVar85._24_8_ = 0x3d9021bb3d9021bb;
        auVar84._16_8_ = uStack_79f0;
        auVar84._0_16_ = _local_7a00;
        auVar84._24_8_ = uStack_79e8;
        auVar83._8_8_ = 0xbdebd1b8bdebd1b8;
        auVar83._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar83._16_8_ = 0xbdebd1b8bdebd1b8;
        auVar83._24_8_ = 0xbdebd1b8bdebd1b8;
        auVar8 = vfmadd213ps_fma(auVar84,auVar85,auVar83);
        local_7b00 = auVar8._0_8_;
        local_5340 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uStack_5338 = uStack_7af8;
        uStack_5330 = 0;
        uStack_5328 = 0;
        local_5360 = local_7a00;
        uStack_5358 = uStack_79f8;
        uStack_5350 = uStack_79f0;
        uStack_5348 = uStack_79e8;
        local_5380 = 0x3def251a3def251a;
        uStack_5378 = 0x3def251a3def251a;
        uStack_5370 = 0x3def251a3def251a;
        uStack_5368 = 0x3def251a3def251a;
        local_45e0 = local_7b00;
        uStack_45d8 = uStack_7af8;
        uStack_45d0 = 0;
        uStack_45c8 = 0;
        local_4600 = local_7a00;
        uStack_45f8 = uStack_79f8;
        uStack_45f0 = uStack_79f0;
        uStack_45e8 = uStack_79e8;
        local_4620 = 0x3def251a3def251a;
        uStack_4618 = 0x3def251a3def251a;
        uStack_4610 = 0x3def251a3def251a;
        uStack_4608 = 0x3def251a3def251a;
        auVar87._16_8_ = uStack_79f0;
        auVar87._0_16_ = _local_7a00;
        auVar87._24_8_ = uStack_79e8;
        auVar86._8_8_ = 0x3def251a3def251a;
        auVar86._0_8_ = 0x3def251a3def251a;
        auVar86._16_8_ = 0x3def251a3def251a;
        auVar86._24_8_ = 0x3def251a3def251a;
        auVar8 = vfmadd213ps_fma(auVar87,ZEXT1632(auVar8),auVar86);
        local_7b00 = auVar8._0_8_;
        local_53a0 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uStack_5398 = uStack_7af8;
        uStack_5390 = 0;
        uStack_5388 = 0;
        local_53c0 = local_7a00;
        uStack_53b8 = uStack_79f8;
        uStack_53b0 = uStack_79f0;
        uStack_53a8 = uStack_79e8;
        local_53e0 = 0xbdfe5d4fbdfe5d4f;
        uStack_53d8 = 0xbdfe5d4fbdfe5d4f;
        uStack_53d0 = 0xbdfe5d4fbdfe5d4f;
        uStack_53c8 = 0xbdfe5d4fbdfe5d4f;
        local_4580 = local_7b00;
        uStack_4578 = uStack_7af8;
        uStack_4570 = 0;
        uStack_4568 = 0;
        local_45a0 = local_7a00;
        uStack_4598 = uStack_79f8;
        uStack_4590 = uStack_79f0;
        uStack_4588 = uStack_79e8;
        local_45c0 = 0xbdfe5d4fbdfe5d4f;
        uStack_45b8 = 0xbdfe5d4fbdfe5d4f;
        uStack_45b0 = 0xbdfe5d4fbdfe5d4f;
        uStack_45a8 = 0xbdfe5d4fbdfe5d4f;
        auVar89._16_8_ = uStack_79f0;
        auVar89._0_16_ = _local_7a00;
        auVar89._24_8_ = uStack_79e8;
        auVar88._8_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar88._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar88._16_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar88._24_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar8 = vfmadd213ps_fma(auVar89,ZEXT1632(auVar8),auVar88);
        local_7b00 = auVar8._0_8_;
        local_5400 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uStack_53f8 = uStack_7af8;
        uStack_53f0 = 0;
        uStack_53e8 = 0;
        local_5420 = local_7a00;
        uStack_5418 = uStack_79f8;
        uStack_5410 = uStack_79f0;
        uStack_5408 = uStack_79e8;
        local_5440 = 0x3e11e9bf3e11e9bf;
        uStack_5438 = 0x3e11e9bf3e11e9bf;
        uStack_5430 = 0x3e11e9bf3e11e9bf;
        uStack_5428 = 0x3e11e9bf3e11e9bf;
        local_4520 = local_7b00;
        uStack_4518 = uStack_7af8;
        uStack_4510 = 0;
        uStack_4508 = 0;
        local_4540 = local_7a00;
        uStack_4538 = uStack_79f8;
        uStack_4530 = uStack_79f0;
        uStack_4528 = uStack_79e8;
        local_4560 = 0x3e11e9bf3e11e9bf;
        uStack_4558 = 0x3e11e9bf3e11e9bf;
        uStack_4550 = 0x3e11e9bf3e11e9bf;
        uStack_4548 = 0x3e11e9bf3e11e9bf;
        auVar91._16_8_ = uStack_79f0;
        auVar91._0_16_ = _local_7a00;
        auVar91._24_8_ = uStack_79e8;
        auVar90._8_8_ = 0x3e11e9bf3e11e9bf;
        auVar90._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar90._16_8_ = 0x3e11e9bf3e11e9bf;
        auVar90._24_8_ = 0x3e11e9bf3e11e9bf;
        auVar8 = vfmadd213ps_fma(auVar91,ZEXT1632(auVar8),auVar90);
        local_7b00 = auVar8._0_8_;
        local_5460 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uStack_5458 = uStack_7af8;
        uStack_5450 = 0;
        uStack_5448 = 0;
        local_5480 = local_7a00;
        uStack_5478 = uStack_79f8;
        uStack_5470 = uStack_79f0;
        uStack_5468 = uStack_79e8;
        local_54a0 = 0xbe2aae50be2aae50;
        uStack_5498 = 0xbe2aae50be2aae50;
        uStack_5490 = 0xbe2aae50be2aae50;
        uStack_5488 = 0xbe2aae50be2aae50;
        local_44c0 = local_7b00;
        uStack_44b8 = uStack_7af8;
        uStack_44b0 = 0;
        uStack_44a8 = 0;
        local_44e0 = local_7a00;
        uStack_44d8 = uStack_79f8;
        uStack_44d0 = uStack_79f0;
        uStack_44c8 = uStack_79e8;
        local_4500 = 0xbe2aae50be2aae50;
        uStack_44f8 = 0xbe2aae50be2aae50;
        uStack_44f0 = 0xbe2aae50be2aae50;
        uStack_44e8 = 0xbe2aae50be2aae50;
        auVar93._16_8_ = uStack_79f0;
        auVar93._0_16_ = _local_7a00;
        auVar93._24_8_ = uStack_79e8;
        auVar92._8_8_ = 0xbe2aae50be2aae50;
        auVar92._0_8_ = 0xbe2aae50be2aae50;
        auVar92._16_8_ = 0xbe2aae50be2aae50;
        auVar92._24_8_ = 0xbe2aae50be2aae50;
        auVar8 = vfmadd213ps_fma(auVar93,ZEXT1632(auVar8),auVar92);
        local_7b00 = auVar8._0_8_;
        local_54c0 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uStack_54b8 = uStack_7af8;
        uStack_54b0 = 0;
        uStack_54a8 = 0;
        local_54e0 = local_7a00;
        uStack_54d8 = uStack_79f8;
        uStack_54d0 = uStack_79f0;
        uStack_54c8 = uStack_79e8;
        local_5500 = 0x3e4cceac3e4cceac;
        uStack_54f8 = 0x3e4cceac3e4cceac;
        uStack_54f0 = 0x3e4cceac3e4cceac;
        uStack_54e8 = 0x3e4cceac3e4cceac;
        local_4460 = local_7b00;
        uStack_4458 = uStack_7af8;
        uStack_4450 = 0;
        uStack_4448 = 0;
        local_4480 = local_7a00;
        uStack_4478 = uStack_79f8;
        uStack_4470 = uStack_79f0;
        uStack_4468 = uStack_79e8;
        local_44a0 = 0x3e4cceac3e4cceac;
        uStack_4498 = 0x3e4cceac3e4cceac;
        uStack_4490 = 0x3e4cceac3e4cceac;
        uStack_4488 = 0x3e4cceac3e4cceac;
        auVar95._16_8_ = uStack_79f0;
        auVar95._0_16_ = _local_7a00;
        auVar95._24_8_ = uStack_79e8;
        auVar94._8_8_ = 0x3e4cceac3e4cceac;
        auVar94._0_8_ = 0x3e4cceac3e4cceac;
        auVar94._16_8_ = 0x3e4cceac3e4cceac;
        auVar94._24_8_ = 0x3e4cceac3e4cceac;
        auVar8 = vfmadd213ps_fma(auVar95,ZEXT1632(auVar8),auVar94);
        local_7b00 = auVar8._0_8_;
        local_5520 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uStack_5518 = uStack_7af8;
        uStack_5510 = 0;
        uStack_5508 = 0;
        local_5540 = local_7a00;
        uStack_5538 = uStack_79f8;
        uStack_5530 = uStack_79f0;
        uStack_5528 = uStack_79e8;
        local_5560 = 0xbe7ffffcbe7ffffc;
        uStack_5558 = 0xbe7ffffcbe7ffffc;
        uStack_5550 = 0xbe7ffffcbe7ffffc;
        uStack_5548 = 0xbe7ffffcbe7ffffc;
        local_4400 = local_7b00;
        uStack_43f8 = uStack_7af8;
        uStack_43f0 = 0;
        uStack_43e8 = 0;
        local_4420 = local_7a00;
        uStack_4418 = uStack_79f8;
        uStack_4410 = uStack_79f0;
        uStack_4408 = uStack_79e8;
        local_4440 = 0xbe7ffffcbe7ffffc;
        uStack_4438 = 0xbe7ffffcbe7ffffc;
        uStack_4430 = 0xbe7ffffcbe7ffffc;
        uStack_4428 = 0xbe7ffffcbe7ffffc;
        auVar97._16_8_ = uStack_79f0;
        auVar97._0_16_ = _local_7a00;
        auVar97._24_8_ = uStack_79e8;
        auVar96._8_8_ = 0xbe7ffffcbe7ffffc;
        auVar96._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar96._16_8_ = 0xbe7ffffcbe7ffffc;
        auVar96._24_8_ = 0xbe7ffffcbe7ffffc;
        auVar8 = vfmadd213ps_fma(auVar97,ZEXT1632(auVar8),auVar96);
        local_7b00 = auVar8._0_8_;
        local_5580 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uStack_5578 = uStack_7af8;
        uStack_5570 = 0;
        uStack_5568 = 0;
        local_55a0 = local_7a00;
        uStack_5598 = uStack_79f8;
        uStack_5590 = uStack_79f0;
        uStack_5588 = uStack_79e8;
        local_55c0 = 0x3eaaaaaa3eaaaaaa;
        uStack_55b8 = 0x3eaaaaaa3eaaaaaa;
        uStack_55b0 = 0x3eaaaaaa3eaaaaaa;
        uStack_55a8 = 0x3eaaaaaa3eaaaaaa;
        local_43a0 = local_7b00;
        uStack_4398 = uStack_7af8;
        uStack_4390 = 0;
        uStack_4388 = 0;
        local_43c0 = local_7a00;
        uStack_43b8 = uStack_79f8;
        uStack_43b0 = uStack_79f0;
        uStack_43a8 = uStack_79e8;
        local_43e0 = 0x3eaaaaaa3eaaaaaa;
        uStack_43d8 = 0x3eaaaaaa3eaaaaaa;
        uStack_43d0 = 0x3eaaaaaa3eaaaaaa;
        uStack_43c8 = 0x3eaaaaaa3eaaaaaa;
        auVar99._16_8_ = uStack_79f0;
        auVar99._0_16_ = _local_7a00;
        auVar99._24_8_ = uStack_79e8;
        auVar98._8_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar98._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar98._16_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar98._24_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar8 = vfmadd213ps_fma(auVar99,ZEXT1632(auVar8),auVar98);
        local_7b00 = auVar8._0_8_;
        uVar22 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uVar23 = uStack_7af8;
        uStack_7970 = 0;
        uStack_7968 = 0;
        local_79a0 = local_7a00;
        uStack_7998 = uStack_79f8;
        uStack_7990 = uStack_79f0;
        uStack_7988 = uStack_79e8;
        local_7980._0_4_ = auVar8._0_4_;
        local_7980._4_4_ = auVar8._4_4_;
        uStack_7978._0_4_ = auVar8._8_4_;
        uStack_7978._4_4_ = auVar8._12_4_;
        local_7b00._4_4_ = local_7980._4_4_ * (float)local_7a00._4_4_;
        local_7b00._0_4_ = (float)local_7980 * (float)local_7a00._0_4_;
        uStack_7af8._0_4_ = (float)uStack_7978 * (float)uStack_78b8;
        uStack_7af8._4_4_ = uStack_7978._4_4_ * uStack_78b8._4_4_;
        uStack_7af0._0_4_ = (float)uStack_78b0 * 0.0;
        uStack_7af0._4_4_ = uStack_78b0._4_4_ * 0.0;
        auVar302 = _local_7b00;
        local_79c0 = local_7b00;
        uStack_79b8 = uStack_7af8;
        uStack_7af0 = auVar302._16_8_;
        uStack_79b0 = uStack_7af0;
        uStack_7ae8 = (ulong)(uint)((float)uStack_78a8 * 0.0);
        uStack_79a8 = uStack_7ae8;
        local_79e0 = CONCAT44(fStack_7adc,local_7ae0);
        uStack_79d8 = CONCAT44(fStack_7ad4,fStack_7ad8);
        uStack_79d0 = CONCAT44(fStack_7acc,fStack_7ad0);
        uStack_79c8 = CONCAT44(fStack_7ac4,fStack_7ac8);
        fVar309 = (float)uStack_78a8 * 0.0 * fStack_7ac8;
        local_7b00._4_4_ = local_7980._4_4_ * (float)local_7a00._4_4_ * fStack_7adc;
        local_7b00._0_4_ = (float)local_7980 * (float)local_7a00._0_4_ * local_7ae0;
        uStack_7af8._0_4_ = (float)uStack_7978 * (float)uStack_78b8 * fStack_7ad8;
        uStack_7af8._4_4_ = uStack_7978._4_4_ * uStack_78b8._4_4_ * fStack_7ad4;
        uStack_7af0._0_4_ = (float)uStack_78b0 * 0.0 * fStack_7ad0;
        uStack_7af0._4_4_ = uStack_78b0._4_4_ * 0.0 * fStack_7acc;
        auVar302 = _local_7b00;
        local_55e0 = local_7a80;
        uStack_55d8 = uStack_7a78;
        uStack_55d0 = uStack_7a70;
        uStack_55c8 = uStack_7a68;
        local_5620 = local_7b00;
        uStack_5618 = uStack_7af8;
        uStack_7af0 = auVar302._16_8_;
        uStack_5610 = uStack_7af0;
        uStack_7ae8 = (ulong)(uint)fVar309;
        uStack_5608 = uStack_7ae8;
        local_4340 = local_7a80;
        uStack_4338 = uStack_7a78;
        uStack_4330 = uStack_7a70;
        uStack_4328 = uStack_7a68;
        local_4360 = 0xb95e8083b95e8083;
        uStack_4358 = 0xb95e8083b95e8083;
        uStack_4350 = 0xb95e8083b95e8083;
        uStack_4348 = 0xb95e8083b95e8083;
        local_4380 = local_7b00;
        uStack_4378 = uStack_7af8;
        uStack_4370 = uStack_7af0;
        uStack_4368 = uStack_7ae8;
        auVar101._8_8_ = 0xb95e8083b95e8083;
        auVar101._0_8_ = 0xb95e8083b95e8083;
        auVar101._16_8_ = 0xb95e8083b95e8083;
        auVar101._24_8_ = 0xb95e8083b95e8083;
        auVar100._16_8_ = uStack_7af0;
        auVar100._0_16_ = _local_7b00;
        auVar100._24_4_ = fVar309;
        auVar100._28_4_ = 0;
        auVar8 = vfmadd213ps_fma(auVar101,_local_7a80,auVar100);
        local_4bc0 = CONCAT44(fStack_7adc,local_7ae0);
        uStack_4bb8 = CONCAT44(fStack_7ad4,fStack_7ad8);
        uStack_4bb0 = CONCAT44(fStack_7acc,fStack_7ad0);
        uStack_4ba8 = CONCAT44(fStack_7ac4,fStack_7ac8);
        local_7b00 = auVar8._0_8_;
        local_4c00 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uStack_4bf8 = uStack_7af8;
        uStack_4bf0 = 0;
        uStack_4be8 = 0;
        local_37c0 = 0x3f0000003f000000;
        uStack_37b8 = 0x3f0000003f000000;
        uStack_37b0 = 0x3f0000003f000000;
        uStack_37a8 = 0x3f0000003f000000;
        local_37e0 = local_7b00;
        uStack_37d8 = uStack_7af8;
        uStack_37d0 = 0;
        uStack_37c8 = 0;
        auVar139._8_8_ = uStack_4bb8;
        auVar139._0_8_ = local_4bc0;
        auVar139._16_8_ = uStack_4bb0;
        auVar139._24_8_ = uStack_4ba8;
        auVar138._8_8_ = 0x3f0000003f000000;
        auVar138._0_8_ = 0x3f0000003f000000;
        auVar138._16_8_ = 0x3f0000003f000000;
        auVar138._24_8_ = 0x3f0000003f000000;
        auVar8 = vfnmadd213ps_fma(auVar138,auVar139,ZEXT1632(auVar8));
        local_7900 = local_7a00;
        uStack_78f8 = uStack_79f8;
        uStack_78f0 = uStack_79f0;
        uStack_78e8 = uStack_79e8;
        local_7b00 = auVar8._0_8_;
        uVar24 = local_7b00;
        uStack_7af8 = auVar8._8_8_;
        uVar25 = uStack_7af8;
        uStack_7910 = 0;
        uStack_7908 = 0;
        local_7920._0_4_ = auVar8._0_4_;
        local_7920._4_4_ = auVar8._4_4_;
        uStack_7918._0_4_ = auVar8._8_4_;
        uStack_7918._4_4_ = auVar8._12_4_;
        local_7a00._4_4_ = (float)local_7a00._4_4_ + local_7920._4_4_;
        local_7a00._0_4_ = (float)local_7a00._0_4_ + (float)local_7920;
        uStack_79f8._0_4_ = (float)uStack_78b8 + (float)uStack_7918;
        uStack_79f8._4_4_ = uStack_78b8._4_4_ + uStack_7918._4_4_;
        uStack_79f0._0_4_ = (float)uStack_78b0 + 0.0;
        uStack_79f0._4_4_ = uStack_78b0._4_4_ + 0.0;
        auVar302 = _local_7a00;
        uStack_79e8._0_4_ = (float)uStack_78a8 + 0.0;
        uStack_79e8._4_4_ = fStack_7ac4 + 0.0;
        auVar5 = _local_7a00;
        local_5640 = local_7a80;
        uStack_5638 = uStack_7a78;
        uStack_5630 = uStack_7a70;
        uStack_5628 = uStack_7a68;
        local_5680 = local_7a00;
        uStack_5678 = uStack_79f8;
        uStack_79f0 = auVar302._16_8_;
        uStack_5670 = uStack_79f0;
        uStack_79e8 = auVar5._24_8_;
        uStack_5668 = uStack_79e8;
        local_42e0 = local_7a80;
        uStack_42d8 = uStack_7a78;
        uStack_42d0 = uStack_7a70;
        uStack_42c8 = uStack_7a68;
        local_4300 = 0x3f3180003f318000;
        uStack_42f8 = 0x3f3180003f318000;
        uStack_42f0 = 0x3f3180003f318000;
        uStack_42e8 = 0x3f3180003f318000;
        local_4320 = local_7a00;
        uStack_4318 = uStack_79f8;
        uStack_4310 = uStack_79f0;
        uStack_4308 = uStack_79e8;
        auVar103._8_8_ = 0x3f3180003f318000;
        auVar103._0_8_ = 0x3f3180003f318000;
        auVar103._16_8_ = 0x3f3180003f318000;
        auVar103._24_8_ = 0x3f3180003f318000;
        auVar102._16_8_ = uStack_79f0;
        auVar102._0_16_ = _local_7a00;
        auVar102._24_8_ = uStack_79e8;
        auVar9 = vfmadd213ps_fma(auVar103,_local_7a80,auVar102);
        local_7a00 = auVar9._0_8_;
        local_6420 = local_7a00;
        uStack_79f8 = auVar9._8_8_;
        uStack_6418 = uStack_79f8;
        uStack_6410 = 0;
        uStack_6408 = 0;
        local_6440 = local_7a60._0_8_;
        uStack_6438 = local_7a60._8_8_;
        uStack_6430 = local_7a60._16_8_;
        uStack_6428 = local_7a60._24_8_;
        _local_7b00 = vorps_avx(ZEXT1632(auVar9),local_7a60);
        local_7d40 = local_7b00;
        uStack_7d38 = uStack_7af8;
        uStack_7d30 = uStack_7af0;
        uStack_7d28 = uStack_7ae8;
        local_7394 = 0x3f800000;
        local_27e0 = 0x3f800000;
        auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
        local_2800 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
        auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
        auStack_27f0 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
        local_7d60 = local_2800._0_8_;
        uStack_7d58 = local_2800._8_8_;
        uStack_7d50 = auStack_27f0._0_8_;
        uStack_7d48 = auStack_27f0._8_8_;
        local_7398 = 0x40000000;
        local_2790 = 0x40000000;
        auVar8 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x20);
        local_27c0 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x30);
        auVar8 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x20);
        auStack_27b0 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x30);
        local_7d80 = local_27c0._0_8_;
        uStack_7d78 = local_27c0._8_8_;
        uStack_7d70 = auStack_27b0._0_8_;
        uStack_7d68 = auStack_27b0._8_8_;
        local_7d00._0_4_ = local_7b00._0_4_;
        local_7d00._4_4_ = local_7b00._4_4_;
        uStack_7cf8._0_4_ = local_7b00._8_4_;
        uStack_7cf8._4_4_ = local_7b00._12_4_;
        uStack_7cf0._0_4_ = local_7b00._16_4_;
        uStack_7cf0._4_4_ = local_7b00._20_4_;
        uStack_7ce8._0_4_ = local_7b00._24_4_;
        uStack_7ce8._4_4_ = local_7b00._28_4_;
        uStack_7284 = uStack_7ce8._4_4_;
        local_7d20._0_4_ = local_27c0._0_4_;
        local_7d20._4_4_ = local_27c0._4_4_;
        uStack_7d18._0_4_ = local_27c0._8_4_;
        uStack_7d18._4_4_ = local_27c0._12_4_;
        uStack_7d10._0_4_ = auStack_27b0._0_4_;
        uStack_7d10._4_4_ = auStack_27b0._4_4_;
        uStack_7d08._0_4_ = auStack_27b0._8_4_;
        local_72a0 = (float)local_7d00 * (float)local_7d20;
        fStack_729c = local_7d00._4_4_ * local_7d20._4_4_;
        fStack_7298 = (float)uStack_7cf8 * (float)uStack_7d18;
        fStack_7294 = uStack_7cf8._4_4_ * uStack_7d18._4_4_;
        fStack_7290 = (float)uStack_7cf0 * (float)uStack_7d10;
        fStack_728c = uStack_7cf0._4_4_ * uStack_7d10._4_4_;
        fStack_7288 = (float)uStack_7ce8 * (float)uStack_7d08;
        local_7064 = 0x3f800000;
        local_2920 = 0x3f800000;
        auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
        local_2940 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
        auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
        auStack_2930 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
        local_72c0._0_4_ = local_2940._0_4_;
        local_7260 = (float)local_72c0;
        local_72c0._4_4_ = local_2940._4_4_;
        fStack_725c = local_72c0._4_4_;
        uStack_72b8._0_4_ = local_2940._8_4_;
        fStack_7258 = (float)uStack_72b8;
        uStack_72b8._4_4_ = local_2940._12_4_;
        fStack_7254 = uStack_72b8._4_4_;
        uStack_72b0._0_4_ = auStack_2930._0_4_;
        fStack_7250 = (float)uStack_72b0;
        uStack_72b0._4_4_ = auStack_2930._4_4_;
        fStack_724c = uStack_72b0._4_4_;
        uStack_72a8._0_4_ = auStack_2930._8_4_;
        fStack_7248 = (float)uStack_72a8;
        uStack_72a8._4_4_ = auStack_2930._12_4_;
        fStack_7244 = uStack_72a8._4_4_;
        local_6ac0 = ZEXT1632(ZEXT816(0) << 0x40);
        local_6ca0 = 0;
        uStack_6c98 = 0;
        uStack_6c90 = 0;
        uStack_6c88 = 0;
        local_6cc0 = CONCAT44(fStack_729c,local_72a0);
        uStack_6cb8 = CONCAT44(fStack_7294,fStack_7298);
        uStack_6cb0 = CONCAT44(fStack_728c,fStack_7290);
        uStack_6ca8 = CONCAT44(uStack_7ce8._4_4_,fStack_7288);
        auVar35._8_8_ = uStack_6cb8;
        auVar35._0_8_ = local_6cc0;
        auVar35._16_8_ = uStack_6cb0;
        auVar35._24_8_ = uStack_6ca8;
        auVar5 = vsubps_avx(ZEXT832(0),auVar35);
        local_3140 = 0x7f0000007f;
        uStack_3138 = 0x7f0000007f;
        uStack_3130 = 0x7f0000007f;
        uStack_3128 = 0x7f0000007f;
        local_7160._0_8_ = auVar5._0_8_;
        local_3420 = local_7160._0_8_;
        local_7160._8_8_ = auVar5._8_8_;
        uStack_3418 = local_7160._8_8_;
        local_7160._16_8_ = auVar5._16_8_;
        uStack_3410 = local_7160._16_8_;
        local_7160._24_8_ = auVar5._24_8_;
        uStack_3408 = local_7160._24_8_;
        auVar149._8_8_ = 0x42b0c0a542b0c0a5;
        auVar149._0_8_ = 0x42b0c0a542b0c0a5;
        auVar149._16_8_ = 0x42b0c0a542b0c0a5;
        auVar149._24_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(auVar5,auVar149);
        local_7160._0_8_ = auVar5._0_8_;
        local_69a0 = local_7160._0_8_;
        local_7160._8_8_ = auVar5._8_8_;
        uStack_6998 = local_7160._8_8_;
        local_7160._16_8_ = auVar5._16_8_;
        uStack_6990 = local_7160._16_8_;
        local_7160._24_8_ = auVar5._24_8_;
        uStack_6988 = local_7160._24_8_;
        auVar41._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar41._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar41._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar41);
        local_7160._0_8_ = auVar4._0_8_;
        local_5be0 = local_7160._0_8_;
        local_7160._8_8_ = auVar4._8_8_;
        uStack_5bd8 = local_7160._8_8_;
        local_7160._16_8_ = auVar4._16_8_;
        uStack_5bd0 = local_7160._16_8_;
        local_7160._24_8_ = auVar4._24_8_;
        uStack_5bc8 = local_7160._24_8_;
        local_3d40 = local_7160._0_8_;
        uStack_3d38 = local_7160._8_8_;
        uStack_3d30 = local_7160._16_8_;
        uStack_3d28 = local_7160._24_8_;
        local_3d60 = 0x3fb8aa3b3fb8aa3b;
        uStack_3d58 = 0x3fb8aa3b3fb8aa3b;
        uStack_3d50 = 0x3fb8aa3b3fb8aa3b;
        uStack_3d48 = 0x3fb8aa3b3fb8aa3b;
        local_3d80 = 0x3f0000003f000000;
        uStack_3d78 = 0x3f0000003f000000;
        uStack_3d70 = 0x3f0000003f000000;
        uStack_3d68 = 0x3f0000003f000000;
        auVar121._8_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar121._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar121._16_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar121._24_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar120._8_8_ = 0x3f0000003f000000;
        auVar120._0_8_ = 0x3f0000003f000000;
        auVar120._16_8_ = 0x3f0000003f000000;
        auVar120._24_8_ = 0x3f0000003f000000;
        auVar8 = vfmadd213ps_fma(auVar121,auVar4,auVar120);
        auVar7 = vroundps_avx(ZEXT1632(auVar8),1);
        auVar5 = vcmpps_avx(ZEXT1632(auVar8),auVar7,1);
        local_7200._0_8_ = auVar5._0_8_;
        local_6660 = local_7200._0_8_;
        local_7200._8_8_ = auVar5._8_8_;
        uStack_6658 = local_7200._8_8_;
        local_7200._16_8_ = auVar5._16_8_;
        uStack_6650 = local_7200._16_8_;
        local_7200._24_8_ = auVar5._24_8_;
        uStack_6648 = local_7200._24_8_;
        local_6680 = 0x3f8000003f800000;
        uStack_6678 = 0x3f8000003f800000;
        uStack_6670 = 0x3f8000003f800000;
        uStack_6668 = 0x3f8000003f800000;
        auVar49._8_8_ = 0x3f8000003f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._16_8_ = 0x3f8000003f800000;
        auVar49._24_8_ = 0x3f8000003f800000;
        local_7200 = vandps_avx(auVar5,auVar49);
        local_7180 = auVar7._0_8_;
        local_6ce0 = local_7180;
        uStack_7178 = auVar7._8_8_;
        uStack_6cd8 = uStack_7178;
        uStack_7170 = auVar7._16_8_;
        uStack_6cd0 = uStack_7170;
        uStack_7168 = auVar7._24_8_;
        uStack_6cc8 = uStack_7168;
        local_6d00 = local_7200._0_8_;
        uStack_6cf8 = local_7200._8_8_;
        uStack_6cf0 = local_7200._16_8_;
        uStack_6ce8 = local_7200._24_8_;
        local_71a0 = vsubps_avx(auVar7,local_7200);
        local_4da0 = local_71a0._0_8_;
        uStack_4d98 = local_71a0._8_8_;
        uStack_4d90 = local_71a0._16_8_;
        uStack_4d88 = local_71a0._24_8_;
        local_4de0 = local_7160._0_8_;
        uStack_4dd8 = local_7160._8_8_;
        uStack_4dd0 = local_7160._16_8_;
        uStack_4dc8 = local_7160._24_8_;
        local_35c0 = local_71a0._0_8_;
        uStack_35b8 = local_71a0._8_8_;
        uStack_35b0 = local_71a0._16_8_;
        uStack_35a8 = local_71a0._24_8_;
        local_35e0 = 0x3f3180003f318000;
        uStack_35d8 = 0x3f3180003f318000;
        uStack_35d0 = 0x3f3180003f318000;
        uStack_35c8 = 0x3f3180003f318000;
        local_3600 = local_7160._0_8_;
        uStack_35f8 = local_7160._8_8_;
        uStack_35f0 = local_7160._16_8_;
        uStack_35e8 = local_7160._24_8_;
        auVar144._8_8_ = 0x3f3180003f318000;
        auVar144._0_8_ = 0x3f3180003f318000;
        auVar144._16_8_ = 0x3f3180003f318000;
        auVar144._24_8_ = 0x3f3180003f318000;
        auVar8 = vfnmadd213ps_fma(auVar144,local_71a0,auVar4);
        local_4e00 = local_71a0._0_8_;
        uStack_4df8 = local_71a0._8_8_;
        uStack_4df0 = local_71a0._16_8_;
        uStack_4de8 = local_71a0._24_8_;
        local_7160._0_8_ = auVar8._0_8_;
        local_4e40 = local_7160._0_8_;
        local_7160._8_8_ = auVar8._8_8_;
        uStack_4e38 = local_7160._8_8_;
        uStack_4e30 = 0;
        uStack_4e28 = 0;
        local_3560 = local_71a0._0_8_;
        uStack_3558 = local_71a0._8_8_;
        uStack_3550 = local_71a0._16_8_;
        uStack_3548 = local_71a0._24_8_;
        local_3580 = 0xb95e8083b95e8083;
        uStack_3578 = 0xb95e8083b95e8083;
        uStack_3570 = 0xb95e8083b95e8083;
        uStack_3568 = 0xb95e8083b95e8083;
        local_35a0 = local_7160._0_8_;
        uStack_3598 = local_7160._8_8_;
        uStack_3590 = 0;
        uStack_3588 = 0;
        auVar145._8_8_ = 0xb95e8083b95e8083;
        auVar145._0_8_ = 0xb95e8083b95e8083;
        auVar145._16_8_ = 0xb95e8083b95e8083;
        auVar145._24_8_ = 0xb95e8083b95e8083;
        auVar2 = vfnmadd213ps_fma(auVar145,local_71a0,ZEXT1632(auVar8));
        local_7160._0_8_ = auVar2._0_8_;
        local_7100 = local_7160._0_8_;
        local_7160._8_8_ = auVar2._8_8_;
        uStack_70f8 = local_7160._8_8_;
        uStack_70f0 = 0;
        uStack_70e8 = 0;
        local_70e0._0_4_ = auVar2._0_4_;
        local_70e0._4_4_ = auVar2._4_4_;
        uStack_70d8._0_4_ = auVar2._8_4_;
        uStack_70d8._4_4_ = auVar2._12_4_;
        local_7180._4_4_ = local_70e0._4_4_ * local_70e0._4_4_;
        local_7180._0_4_ = (float)local_70e0 * (float)local_70e0;
        local_5e40 = local_7180;
        uStack_7178._0_4_ = (float)uStack_70d8 * (float)uStack_70d8;
        uStack_7178._4_4_ = uStack_70d8._4_4_ * uStack_70d8._4_4_;
        auVar3 = _local_7180;
        _local_7180 = ZEXT1632(_local_7180);
        auVar36 = _local_7180;
        uStack_7218 = 0x3950696739506967;
        local_7220 = (undefined1  [8])0x3950696739506967;
        local_5c40 = 0x3950696739506967;
        uStack_5c38 = 0x3950696739506967;
        uStack_5c30 = 0x3950696739506967;
        uStack_5c28 = 0x3950696739506967;
        local_5c60 = local_7160._0_8_;
        uStack_5c58 = local_7160._8_8_;
        uStack_5c50 = 0;
        uStack_5c48 = 0;
        local_3ce0 = 0x3950696739506967;
        uStack_3cd8 = 0x3950696739506967;
        uStack_3cd0 = 0x3950696739506967;
        uStack_3cc8 = 0x3950696739506967;
        local_3d00 = local_7160._0_8_;
        uStack_3cf8 = local_7160._8_8_;
        uStack_3cf0 = 0;
        uStack_3ce8 = 0;
        local_3d20 = 0x3ab743ce3ab743ce;
        uStack_3d18 = 0x3ab743ce3ab743ce;
        uStack_3d10 = 0x3ab743ce3ab743ce;
        uStack_3d08 = 0x3ab743ce3ab743ce;
        auVar123._16_8_ = 0x3950696739506967;
        auVar123._0_16_ = _local_7220;
        auVar123._24_8_ = 0x3950696739506967;
        auVar122._8_8_ = 0x3ab743ce3ab743ce;
        auVar122._0_8_ = 0x3ab743ce3ab743ce;
        auVar122._16_8_ = 0x3ab743ce3ab743ce;
        auVar122._24_8_ = 0x3ab743ce3ab743ce;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar123,auVar122);
        local_7220 = auVar8._0_8_;
        local_5ca0 = local_7220;
        uStack_7218 = auVar8._8_8_;
        uStack_5c98 = uStack_7218;
        uStack_5c90 = 0;
        uStack_5c88 = 0;
        local_5cc0 = local_7160._0_8_;
        uStack_5cb8 = local_7160._8_8_;
        uStack_5cb0 = 0;
        uStack_5ca8 = 0;
        local_3c80 = local_7220;
        uStack_3c78 = uStack_7218;
        uStack_3c70 = 0;
        uStack_3c68 = 0;
        local_3ca0 = local_7160._0_8_;
        uStack_3c98 = local_7160._8_8_;
        uStack_3c90 = 0;
        uStack_3c88 = 0;
        local_3cc0 = 0x3c0889083c088908;
        uStack_3cb8 = 0x3c0889083c088908;
        uStack_3cb0 = 0x3c0889083c088908;
        uStack_3ca8 = 0x3c0889083c088908;
        auVar124._8_8_ = 0x3c0889083c088908;
        auVar124._0_8_ = 0x3c0889083c088908;
        auVar124._16_8_ = 0x3c0889083c088908;
        auVar124._24_8_ = 0x3c0889083c088908;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar8),auVar124);
        local_7220 = auVar8._0_8_;
        local_5d00 = local_7220;
        uStack_7218 = auVar8._8_8_;
        uStack_5cf8 = uStack_7218;
        uStack_5cf0 = 0;
        uStack_5ce8 = 0;
        local_5d20 = local_7160._0_8_;
        uStack_5d18 = local_7160._8_8_;
        uStack_5d10 = 0;
        uStack_5d08 = 0;
        local_3c20 = local_7220;
        uStack_3c18 = uStack_7218;
        uStack_3c10 = 0;
        uStack_3c08 = 0;
        local_3c40 = local_7160._0_8_;
        uStack_3c38 = local_7160._8_8_;
        uStack_3c30 = 0;
        uStack_3c28 = 0;
        local_3c60 = 0x3d2aa9c13d2aa9c1;
        uStack_3c58 = 0x3d2aa9c13d2aa9c1;
        uStack_3c50 = 0x3d2aa9c13d2aa9c1;
        uStack_3c48 = 0x3d2aa9c13d2aa9c1;
        auVar125._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar125._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar125._16_8_ = 0x3d2aa9c13d2aa9c1;
        auVar125._24_8_ = 0x3d2aa9c13d2aa9c1;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar8),auVar125);
        local_7220 = auVar8._0_8_;
        local_5d60 = local_7220;
        uStack_7218 = auVar8._8_8_;
        uStack_5d58 = uStack_7218;
        uStack_5d50 = 0;
        uStack_5d48 = 0;
        local_5d80 = local_7160._0_8_;
        uStack_5d78 = local_7160._8_8_;
        uStack_5d70 = 0;
        uStack_5d68 = 0;
        local_3bc0 = local_7220;
        uStack_3bb8 = uStack_7218;
        uStack_3bb0 = 0;
        uStack_3ba8 = 0;
        local_3be0 = local_7160._0_8_;
        uStack_3bd8 = local_7160._8_8_;
        uStack_3bd0 = 0;
        uStack_3bc8 = 0;
        local_3c00 = 0x3e2aaaaa3e2aaaaa;
        uStack_3bf8 = 0x3e2aaaaa3e2aaaaa;
        uStack_3bf0 = 0x3e2aaaaa3e2aaaaa;
        uStack_3be8 = 0x3e2aaaaa3e2aaaaa;
        auVar126._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar126._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar126._16_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar126._24_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar8),auVar126);
        local_7220 = auVar8._0_8_;
        local_5dc0 = local_7220;
        uStack_7218 = auVar8._8_8_;
        uStack_5db8 = uStack_7218;
        uStack_5db0 = 0;
        uStack_5da8 = 0;
        local_5de0 = local_7160._0_8_;
        uStack_5dd8 = local_7160._8_8_;
        uStack_5dd0 = 0;
        uStack_5dc8 = 0;
        local_3b60 = local_7220;
        uStack_3b58 = uStack_7218;
        uStack_3b50 = 0;
        uStack_3b48 = 0;
        local_3b80 = local_7160._0_8_;
        uStack_3b78 = local_7160._8_8_;
        uStack_3b70 = 0;
        uStack_3b68 = 0;
        local_3ba0 = 0x3f0000003f000000;
        uStack_3b98 = 0x3f0000003f000000;
        uStack_3b90 = 0x3f0000003f000000;
        uStack_3b88 = 0x3f0000003f000000;
        auVar127._8_8_ = 0x3f0000003f000000;
        auVar127._0_8_ = 0x3f0000003f000000;
        auVar127._16_8_ = 0x3f0000003f000000;
        auVar127._24_8_ = 0x3f0000003f000000;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar8),auVar127);
        local_7220 = auVar8._0_8_;
        local_5e20 = local_7220;
        uStack_7218 = auVar8._8_8_;
        uStack_5e18 = uStack_7218;
        uStack_5e10 = 0;
        uStack_5e08 = 0;
        uStack_7178 = auVar3._8_8_;
        uStack_5e38 = uStack_7178;
        uStack_5e30 = 0;
        uStack_5e28 = 0;
        local_5e60 = local_7160._0_8_;
        uStack_5e58 = local_7160._8_8_;
        uStack_5e50 = 0;
        uStack_5e48 = 0;
        local_3b00 = local_7220;
        uStack_3af8 = uStack_7218;
        uStack_3af0 = 0;
        uStack_3ae8 = 0;
        local_3b20 = local_5e40;
        uStack_3b18 = uStack_7178;
        uStack_3b10 = 0;
        uStack_3b08 = 0;
        local_3b40 = local_7160._0_8_;
        uStack_3b38 = local_7160._8_8_;
        uStack_3b30 = 0;
        uStack_3b28 = 0;
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar3),ZEXT1632(auVar8),ZEXT1632(auVar2));
        local_7220 = auVar8._0_8_;
        uVar26 = local_7220;
        uStack_7218 = auVar8._8_8_;
        uVar27 = uStack_7218;
        uStack_7090 = 0;
        uStack_7088 = 0;
        local_70c0 = 0x3f8000003f800000;
        uStack_70b8 = 0x3f8000003f800000;
        uStack_70b0 = 0x3f8000003f800000;
        uStack_70a8 = 0x3f8000003f800000;
        local_70a0._0_4_ = auVar8._0_4_;
        local_70a0._4_4_ = auVar8._4_4_;
        uStack_7098._0_4_ = auVar8._8_4_;
        uStack_7098._4_4_ = auVar8._12_4_;
        local_7220._4_4_ = local_70a0._4_4_ + 1.0;
        local_7220._0_4_ = (float)local_70a0 + 1.0;
        uStack_7218._0_4_ = (float)uStack_7098 + 1.0;
        uStack_7218._4_4_ = uStack_7098._4_4_ + 1.0;
        uStack_7210._0_4_ = 0x3f800000;
        uStack_7210._4_4_ = 0x3f800000;
        auVar302 = _local_7220;
        uStack_7208._0_4_ = 0x3f800000;
        uStack_7208._4_4_ = 0x3f800000;
        auVar5 = _local_7220;
        local_3360._0_4_ = local_71a0._0_4_;
        local_3360._4_4_ = local_71a0._4_4_;
        uStack_3358._0_4_ = local_71a0._8_4_;
        uStack_3358._4_4_ = local_71a0._12_4_;
        uStack_3350._0_4_ = local_71a0._16_4_;
        uStack_3350._4_4_ = local_71a0._20_4_;
        uStack_3348._0_4_ = local_71a0._24_4_;
        uStack_3348._4_4_ = local_71a0._28_4_;
        local_71c0 = CONCAT44((int)local_3360._4_4_,(int)(float)local_3360);
        uStack_71b8 = CONCAT44((int)uStack_3358._4_4_,(int)(float)uStack_3358);
        uStack_71b0 = CONCAT44((int)uStack_3350._4_4_,(int)(float)uStack_3350);
        uStack_71a8 = CONCAT44((int)uStack_3348._4_4_,(int)(float)uStack_3348);
        local_3120 = local_71c0;
        uStack_3118 = uStack_71b8;
        uStack_3110 = uStack_71b0;
        uStack_3108 = uStack_71a8;
        local_31c0 = local_71c0;
        uStack_31b8 = uStack_71b8;
        uStack_31b0 = uStack_71b0;
        uStack_31a8 = uStack_71a8;
        local_31e0 = 0x7f0000007f;
        uStack_31d8 = 0x7f0000007f;
        uStack_31d0 = 0x7f0000007f;
        uStack_31c8 = 0x7f0000007f;
        local_3170 = 0x7f0000007f;
        uStack_3168 = 0x7f0000007f;
        local_3180 = 0x7f0000007f;
        uStack_3178 = 0x7f0000007f;
        local_2ad0 = local_71c0;
        uStack_2ac8 = uStack_71b8;
        local_2ae0 = 0x7f0000007f;
        uStack_2ad8 = 0x7f0000007f;
        auVar160._8_8_ = uStack_71b8;
        auVar160._0_8_ = local_71c0;
        auVar159._8_8_ = 0x7f0000007f;
        auVar159._0_8_ = 0x7f0000007f;
        local_3150 = vpaddd_avx(auVar160,auVar159);
        local_2af0 = uStack_71b0;
        uStack_2ae8 = uStack_71a8;
        local_2b00 = 0x7f0000007f;
        uStack_2af8 = 0x7f0000007f;
        auVar158._8_8_ = uStack_71a8;
        auVar158._0_8_ = uStack_71b0;
        auVar157._8_8_ = 0x7f0000007f;
        auVar157._0_8_ = 0x7f0000007f;
        local_3160 = vpaddd_avx(auVar158,auVar157);
        local_3200 = local_3150._0_8_;
        uStack_31f8 = local_3150._8_8_;
        uStack_31f0 = local_3160._0_8_;
        uStack_31e8 = local_3160._8_8_;
        local_31a0 = local_3150._0_8_;
        uStack_3198 = local_3150._8_8_;
        uStack_3190 = local_3160._0_8_;
        uStack_3188 = local_3160._8_8_;
        local_2da0 = local_3150._0_8_;
        uStack_2d98 = local_3150._8_8_;
        uStack_2d90 = local_3160._0_8_;
        uStack_2d88 = local_3160._8_8_;
        local_2da4 = 0x17;
        local_2e20 = local_3150._0_8_;
        uStack_2e18 = local_3150._8_8_;
        uStack_2e10 = local_3160._0_8_;
        uStack_2e08 = local_3160._8_8_;
        local_29d0 = local_3150._0_8_;
        uStack_29c8 = local_3150._8_8_;
        local_29d4 = 0x17;
        local_2dc0 = vpslld_avx(local_3150,ZEXT416(0x17));
        local_29f0 = local_3160._0_8_;
        uStack_29e8 = local_3160._8_8_;
        local_29f4 = 0x17;
        local_2dd0 = vpslld_avx(local_3160,ZEXT416(0x17));
        local_2e40 = local_2dc0._0_8_;
        uStack_2e38 = local_2dc0._8_8_;
        uStack_2e30 = local_2dd0._0_8_;
        uStack_2e28 = local_2dd0._8_8_;
        local_2e00 = local_2dc0._0_8_;
        uStack_2df8 = local_2dc0._8_8_;
        uStack_2df0 = local_2dd0._0_8_;
        uStack_2de8 = local_2dd0._8_8_;
        local_71c0 = local_2dc0._0_8_;
        uStack_71b8 = local_2dc0._8_8_;
        uStack_71b0 = local_2dd0._0_8_;
        uStack_71a8 = local_2dd0._8_8_;
        local_2be0 = local_2dc0._0_8_;
        uStack_2bd8 = local_2dc0._8_8_;
        uStack_2bd0 = local_2dd0._0_8_;
        uStack_2bc8 = local_2dd0._8_8_;
        local_7240 = local_2dc0._0_8_;
        uStack_7238 = local_2dc0._8_8_;
        uStack_7230 = local_2dd0._0_8_;
        uStack_7228 = local_2dd0._8_8_;
        local_7120 = local_7220;
        uStack_7118 = uStack_7218;
        uStack_7210 = auVar302._16_8_;
        uStack_7110 = uStack_7210;
        uStack_7208 = auVar5._24_8_;
        uStack_7108 = uStack_7208;
        local_7140._0_4_ = local_2dc0._0_4_;
        local_7140._4_4_ = local_2dc0._4_4_;
        uStack_7138._0_4_ = local_2dc0._8_4_;
        uStack_7138._4_4_ = local_2dc0._12_4_;
        uStack_7130._0_4_ = local_2dd0._0_4_;
        uStack_7130._4_4_ = local_2dd0._4_4_;
        uStack_7128._0_4_ = local_2dd0._8_4_;
        local_7220._0_4_ = ((float)local_70a0 + 1.0) * (float)local_7140;
        local_7220._4_4_ = (local_70a0._4_4_ + 1.0) * local_7140._4_4_;
        uStack_7138._0_4_ = ((float)uStack_7098 + 1.0) * (float)uStack_7138;
        uStack_7138._4_4_ = (uStack_7098._4_4_ + 1.0) * uStack_7138._4_4_;
        uStack_7218._0_4_ = (float)uStack_7138;
        uStack_7218._4_4_ = uStack_7138._4_4_;
        uStack_7210._0_4_ = (float)uStack_7130 * 1.0;
        uStack_7210._4_4_ = uStack_7130._4_4_ * 1.0;
        auVar302 = _local_7220;
        uStack_7208._0_4_ = (float)uStack_7128 * 1.0;
        uStack_7208._4_4_ = 0x3f800000;
        auVar35 = _local_7220;
        local_7280 = local_7220;
        uStack_7278 = uStack_7218;
        uStack_7210 = auVar302._16_8_;
        uStack_7270 = uStack_7210;
        uStack_7208 = auVar35._24_8_;
        uStack_7268 = uStack_7208;
        local_6dc0 = (float)local_72c0 + (float)local_7220._0_4_;
        fStack_6dbc = local_72c0._4_4_ + (float)local_7220._4_4_;
        fStack_6db8 = (float)uStack_72b8 + (float)uStack_7138;
        fStack_6db4 = uStack_72b8._4_4_ + uStack_7138._4_4_;
        fStack_6db0 = (float)uStack_72b0 + (float)uStack_7130 * 1.0;
        fStack_6dac = uStack_72b0._4_4_ + uStack_7130._4_4_ * 1.0;
        fStack_6da8 = (float)uStack_72a8 + (float)uStack_7128 * 1.0;
        fStack_6da4 = uStack_72a8._4_4_ + 1.0;
        auVar33._16_4_ = (float)uStack_72b0;
        auVar33._0_16_ = local_2940;
        auVar33._20_4_ = uStack_72b0._4_4_;
        auVar33._24_4_ = (float)uStack_72a8;
        auVar33._28_4_ = uStack_72a8._4_4_;
        auVar6._4_4_ = fStack_6dbc;
        auVar6._0_4_ = local_6dc0;
        auVar6._8_4_ = fStack_6db8;
        auVar6._12_4_ = fStack_6db4;
        auVar6._16_4_ = fStack_6db0;
        auVar6._20_4_ = fStack_6dac;
        auVar6._24_4_ = fStack_6da8;
        auVar6._28_4_ = fStack_6da4;
        auVar5 = vrcpps_avx(auVar6);
        auVar4._4_4_ = local_72c0._4_4_ * auVar5._4_4_;
        auVar4._0_4_ = (float)local_72c0 * auVar5._0_4_;
        auVar4._8_4_ = (float)uStack_72b8 * auVar5._8_4_;
        auVar4._12_4_ = uStack_72b8._4_4_ * auVar5._12_4_;
        auVar4._16_4_ = (float)uStack_72b0 * auVar5._16_4_;
        auVar4._20_4_ = uStack_72b0._4_4_ * auVar5._20_4_;
        auVar4._24_4_ = (float)uStack_72a8 * auVar5._24_4_;
        auVar4._28_4_ = uStack_72a8._4_4_;
        auVar8 = vfmsub213ps_fma(auVar4,auVar6,auVar33);
        auVar8 = vfnmadd213ps_fma(ZEXT1632(auVar8),auVar5,auVar4);
        local_7360 = local_27c0._0_8_;
        uStack_7358 = local_27c0._8_8_;
        uStack_7350 = auStack_27b0._0_8_;
        uStack_7348 = auStack_27b0._8_8_;
        local_7340 = ZEXT1632(auVar8);
        auVar7._16_8_ = auStack_27b0._0_8_;
        auVar7._0_16_ = local_27c0;
        auVar7._24_8_ = auStack_27b0._8_8_;
        local_7380._0_4_ = local_2800._0_4_;
        local_7380._4_4_ = local_2800._4_4_;
        uStack_7378._0_4_ = local_2800._8_4_;
        uStack_7378._4_4_ = local_2800._12_4_;
        uStack_7370._0_4_ = auStack_27f0._0_4_;
        uStack_7370._4_4_ = auStack_27f0._4_4_;
        uStack_7368._0_4_ = auStack_27f0._8_4_;
        uStack_7368._4_4_ = auStack_27f0._12_4_;
        auVar315._0_4_ = (uint)local_7380 ^ (uint)DAT_01f0de00;
        auVar315._4_4_ = local_7380._4_4_ ^ DAT_01f0de00._4_4_;
        auVar315._8_4_ = (uint)uStack_7378 ^ DAT_01f0de00._8_4_;
        auVar315._12_4_ = uStack_7378._4_4_ ^ DAT_01f0de00._12_4_;
        auVar315._16_4_ = (uint)uStack_7370 ^ DAT_01f0de00._16_4_;
        auVar315._20_4_ = uStack_7370._4_4_ ^ DAT_01f0de00._20_4_;
        auVar315._24_4_ = (uint)uStack_7368 ^ DAT_01f0de00._24_4_;
        auVar315._28_4_ = uStack_7368._4_4_ ^ DAT_01f0de00._28_4_;
        auVar8 = vfmadd213ps_fma(auVar7,local_7340,auVar315);
        local_7e40._0_4_ = auVar303._0_4_;
        local_7e40._4_4_ = auVar303._4_4_;
        fStack_7e38 = auVar303._8_4_;
        fStack_7e34 = auVar303._12_4_;
        fStack_7e30 = auVar303._16_4_;
        fStack_7e2c = auVar303._20_4_;
        fStack_7e28 = (float)uStack_8168;
        uStack_7e24 = (undefined4)((ulong)uStack_8168 >> 0x20);
        local_7e60._0_4_ = auVar8._0_4_;
        local_7e60._4_4_ = auVar8._4_4_;
        fStack_7e58 = auVar8._8_4_;
        fStack_7e54 = auVar8._12_4_;
        local_8400 = CONCAT44((float)local_7e40._4_4_ * (float)local_7e60._4_4_,
                              (float)local_7e40._0_4_ * (float)local_7e60._0_4_);
        uStack_83f8 = CONCAT44(fStack_7e34 * fStack_7e54,fStack_7e38 * fStack_7e58);
        uStack_83f0 = CONCAT44(fStack_7e2c * 0.0,fStack_7e30 * 0.0);
        uStack_83e8 = CONCAT44(uStack_7e24,fStack_7e28 * 0.0);
        local_8108 = local_8380;
        local_8140 = local_8400;
        uStack_8138 = uStack_83f8;
        uStack_8130 = uStack_83f0;
        uStack_8128 = uStack_83e8;
        auVar5._8_8_ = uStack_83f8;
        auVar5._0_8_ = local_8400;
        auVar5._16_8_ = uStack_83f0;
        auVar5._24_8_ = uStack_83e8;
        *local_8380 = auVar5;
        local_8380 = local_8380 + 1;
        _local_7e60 = ZEXT1632(auVar8);
        _local_7e40 = auVar11;
        local_7d20 = local_27c0._0_8_;
        uStack_7d18 = local_27c0._8_8_;
        uStack_7d10 = auStack_27b0._0_8_;
        uStack_7d08 = auStack_27b0._8_8_;
        local_7d00 = local_7b00;
        uStack_7cf8 = uStack_7af8;
        uStack_7cf0 = uStack_7af0;
        uStack_7ce8 = uStack_7ae8;
        _local_7a00 = ZEXT1632(auVar9);
        local_7980 = uVar22;
        uStack_7978 = uVar23;
        local_7940 = local_7960;
        uStack_7938 = uStack_7958;
        uStack_7930 = uStack_7950;
        uStack_7928 = uStack_7948;
        local_7920 = uVar24;
        uStack_7918 = uVar25;
        local_78e0 = local_7ac0._0_8_;
        uStack_78d8 = local_7ac0._8_8_;
        uStack_78d0 = local_7ac0._16_8_;
        uStack_78c8 = local_7ac0._24_8_;
        local_78c0 = uVar18;
        uStack_78b8 = uVar19;
        uStack_78b0 = uVar20;
        uStack_78a8 = uVar21;
        local_7880 = uVar14;
        uStack_7878 = uVar15;
        uStack_7870 = uVar16;
        uStack_7868 = uVar17;
        local_7760 = local_85a0;
        uStack_7758 = uStack_8598;
        uStack_7750 = auStack_28f0._0_8_;
        uStack_7748 = auStack_28f0._8_8_;
        _local_7540 = auVar42;
        local_7500 = local_7a40;
        uStack_74f8 = uStack_7a38;
        uStack_74f0 = uStack_7a30;
        uStack_74e8 = uStack_7a28;
        _local_74a0 = auVar50;
        local_7480 = ZEXT1632(auVar1);
        local_7460 = local_2d00._0_8_;
        uStack_7458 = local_2d00._8_8_;
        uStack_7450 = local_2d10._0_8_;
        uStack_7448 = local_2d10._8_8_;
        local_7400 = local_7420;
        uStack_73f8 = uStack_7418;
        uStack_73f0 = uStack_7410;
        uStack_73e8 = uStack_7408;
        local_73c0 = uVar12;
        uStack_73b8 = uVar13;
        local_7380 = local_2800._0_8_;
        uStack_7378 = local_2800._8_8_;
        uStack_7370 = auStack_27f0._0_8_;
        uStack_7368 = auStack_27f0._8_8_;
        local_72c0 = local_2940._0_8_;
        uStack_72b8 = local_2940._8_8_;
        uStack_72b0 = auStack_2930._0_8_;
        uStack_72a8 = auStack_2930._8_8_;
        _local_7220 = auVar35;
        local_71e0 = local_7a40;
        uStack_71d8 = uStack_7a38;
        uStack_71d0 = uStack_7a30;
        uStack_71c8 = uStack_7a28;
        _local_7180 = auVar36;
        local_7160 = ZEXT1632(auVar2);
        local_7140 = local_2dc0._0_8_;
        uStack_7138 = local_2dc0._8_8_;
        uStack_7130 = local_2dd0._0_8_;
        uStack_7128 = local_2dd0._8_8_;
        local_70e0 = local_7100;
        uStack_70d8 = uStack_70f8;
        uStack_70d0 = uStack_70f0;
        uStack_70c8 = uStack_70e8;
        local_70a0 = uVar26;
        uStack_7098 = uVar27;
        local_6da0 = local_7260;
        fStack_6d9c = fStack_725c;
        fStack_6d98 = fStack_7258;
        fStack_6d94 = fStack_7254;
        fStack_6d90 = fStack_7250;
        fStack_6d8c = fStack_724c;
        fStack_6d88 = fStack_7248;
        fStack_6d84 = fStack_7244;
        local_6aa0 = local_6ac0;
        local_6a40 = local_6a80;
        local_6980 = local_69c0;
        uStack_6978 = uStack_69b8;
        uStack_6970 = uStack_69b0;
        uStack_6968 = uStack_69a8;
        local_5e00 = local_6400;
        uStack_5df8 = uStack_63f8;
        uStack_5df0 = uStack_63f0;
        uStack_5de8 = uStack_63e8;
        local_5c20 = local_6400;
        uStack_5c18 = uStack_63f8;
        uStack_5c10 = uStack_63f0;
        uStack_5c08 = uStack_63e8;
        local_5b60 = local_6400;
        uStack_5b58 = uStack_63f8;
        uStack_5b50 = uStack_63f0;
        uStack_5b48 = uStack_63e8;
        local_5b00 = local_5da0;
        uStack_5af8 = uStack_5d98;
        uStack_5af0 = uStack_5d90;
        uStack_5ae8 = uStack_5d88;
        local_5aa0 = local_5d40;
        uStack_5a98 = uStack_5d38;
        uStack_5a90 = uStack_5d30;
        uStack_5a88 = uStack_5d28;
        local_5a40 = local_5ce0;
        uStack_5a38 = uStack_5cd8;
        uStack_5a30 = uStack_5cd0;
        uStack_5a28 = uStack_5cc8;
        local_59e0 = local_5c80;
        uStack_59d8 = uStack_5c78;
        uStack_59d0 = uStack_5c70;
        uStack_59c8 = uStack_5c68;
        local_5980 = local_6400;
        uStack_5978 = uStack_63f8;
        uStack_5970 = uStack_63f0;
        uStack_5968 = uStack_63e8;
        local_5960 = local_5c00;
        uStack_5958 = uStack_5bf8;
        uStack_5950 = uStack_5bf0;
        uStack_5948 = uStack_5be8;
        local_4e20 = local_5600;
        uStack_4e18 = uStack_55f8;
        uStack_4e10 = uStack_55f0;
        uStack_4e08 = uStack_55e8;
        local_4dc0 = local_5660;
        uStack_4db8 = uStack_5658;
        uStack_4db0 = uStack_5650;
        uStack_4da8 = uStack_5648;
        local_4d60 = local_5600;
        uStack_4d58 = uStack_55f8;
        uStack_4d50 = uStack_55f0;
        uStack_4d48 = uStack_55e8;
        local_4d00 = local_5660;
        uStack_4cf8 = uStack_5658;
        uStack_4cf0 = uStack_5650;
        uStack_4ce8 = uStack_5648;
        local_4be0 = local_6400;
        uStack_4bd8 = uStack_63f8;
        uStack_4bd0 = uStack_63f0;
        uStack_4bc8 = uStack_63e8;
        local_37a0 = local_4bc0;
        uStack_3798 = uStack_4bb8;
        uStack_3790 = uStack_4bb0;
        uStack_3788 = uStack_4ba8;
        local_3400 = local_3440;
        uStack_33f8 = uStack_3438;
        uStack_33f0 = uStack_3430;
        uStack_33e8 = uStack_3428;
        uStack_33c8 = uStack_8168;
        local_3360 = local_71a0._0_8_;
        uStack_3358 = local_71a0._8_8_;
        uStack_3350 = local_71a0._16_8_;
        uStack_3348 = local_71a0._24_8_;
        local_3340 = local_74c0._0_8_;
        uStack_3338 = local_74c0._8_8_;
        uStack_3330 = local_74c0._16_8_;
        uStack_3328 = local_74c0._24_8_;
        local_291c = local_2920;
        local_2918 = local_2920;
        local_2914 = local_2920;
        local_2910 = local_2920;
        local_290c = local_2920;
        local_2908 = local_2920;
        local_2904 = local_2920;
        local_28dc = local_28e0;
        local_28d8 = local_28e0;
        local_28d4 = local_28e0;
        local_28d0 = local_28e0;
        local_28cc = local_28e0;
        local_28c8 = local_28e0;
        local_28c4 = local_28e0;
        local_27dc = local_27e0;
        local_27d8 = local_27e0;
        local_27d4 = local_27e0;
        local_27d0 = local_27e0;
        local_27cc = local_27e0;
        local_27c8 = local_27e0;
        local_27c4 = local_27e0;
        local_278c = local_2790;
        local_2788 = local_2790;
        local_2784 = local_2790;
        local_2780 = local_2790;
        local_277c = local_2790;
        local_2778 = local_2790;
        local_2774 = local_2790;
      }
      for (; local_7f60 = local_81a0, local_83a8 = local_7fe0, local_83cc + 3 < local_8268;
          local_83cc = local_83cc + 4) {
        local_80c0 = local_8380;
        local_80b0 = *(undefined8 *)*local_8380;
        uStack_80a8 = *(undefined8 *)(*local_8380 + 8);
        auVar2 = *(undefined1 (*) [16])*local_8380;
        local_1a00 = ZEXT816(0) << 0x20;
        local_24c0 = 0x3f8000003f800000;
        uStack_24b8 = 0x3f8000003f800000;
        local_1d0 = 0x42b0c0a542b0c0a5;
        uStack_1c8 = 0x42b0c0a542b0c0a5;
        auVar296._8_8_ = 0x42b0c0a542b0c0a5;
        auVar296._0_8_ = 0x42b0c0a542b0c0a5;
        auVar8 = vminps_avx(*(undefined1 (*) [16])*local_8380,auVar296);
        local_2120._0_8_ = auVar8._0_8_;
        local_1920 = local_2120._0_8_;
        local_2120._8_8_ = auVar8._8_8_;
        uStack_1918 = local_2120._8_8_;
        local_1950 = 0xc2b0c0a5c2b0c0a5;
        uStack_1948 = 0xc2b0c0a5c2b0c0a5;
        auVar190._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar190._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar8,auVar190);
        local_2120._0_8_ = auVar1._0_8_;
        uVar12 = local_2120._0_8_;
        local_2120._8_8_ = auVar1._8_8_;
        uVar13 = local_2120._8_8_;
        local_2090 = 0x3fb8aa3b3fb8aa3b;
        uStack_2088 = 0x3fb8aa3b3fb8aa3b;
        local_2080._0_4_ = auVar1._0_4_;
        local_2080._4_4_ = auVar1._4_4_;
        uStack_2078._0_4_ = auVar1._8_4_;
        uStack_2078._4_4_ = auVar1._12_4_;
        local_2140._4_4_ = local_2080._4_4_ * 1.442695;
        local_2140._0_4_ = (float)local_2080 * 1.442695;
        uStack_2138._0_4_ = (float)uStack_2078 * 1.442695;
        uStack_2138._4_4_ = uStack_2078._4_4_ * 1.442695;
        local_2040 = local_2140;
        uStack_2038 = uStack_2138;
        local_2050 = 0x3f0000003f000000;
        uStack_2048 = 0x3f0000003f000000;
        local_2140._0_4_ = (float)local_2080 * 1.442695 + 0.5;
        local_2140._4_4_ = local_2080._4_4_ * 1.442695 + 0.5;
        fVar309 = (float)uStack_2078 * 1.442695 + 0.5;
        fVar310 = uStack_2078._4_4_ * 1.442695 + 0.5;
        uStack_2138._0_4_ = fVar309;
        uStack_2138._4_4_ = fVar310;
        local_120 = local_2140;
        uStack_118 = uStack_2138;
        local_2150._4_4_ = (int)(float)local_2140._4_4_;
        local_2150._0_4_ = (int)(float)local_2140._0_4_;
        local_2150._8_4_ = (int)fVar309;
        local_2150._12_4_ = (int)fVar310;
        local_16b0 = local_2150._0_8_;
        uStack_16a8 = local_2150._8_8_;
        auVar208._8_8_ = local_2150._8_8_;
        auVar208._0_8_ = local_2150._0_8_;
        auVar9 = vcvtdq2ps_avx(auVar208);
        local_2130 = auVar9._0_8_;
        local_a0 = local_2130;
        uStack_2128 = auVar9._8_8_;
        uStack_98 = uStack_2128;
        local_b0 = local_2140;
        uStack_a8 = uStack_2138;
        auVar300._8_8_ = uStack_2138;
        auVar300._0_8_ = local_2140;
        auVar8 = vcmpps_avx(auVar300,auVar9,1);
        local_2170._0_8_ = auVar8._0_8_;
        local_1840 = local_2170._0_8_;
        local_2170._8_8_ = auVar8._8_8_;
        uStack_1838 = local_2170._8_8_;
        local_1850 = 0x3f8000003f800000;
        uStack_1848 = 0x3f8000003f800000;
        auVar198._8_8_ = 0x3f8000003f800000;
        auVar198._0_8_ = 0x3f8000003f800000;
        local_2170 = vpand_avx(auVar8,auVar198);
        local_1f60 = local_2130;
        uStack_1f58 = uStack_2128;
        local_1f70 = local_2170._0_8_;
        uStack_1f68 = local_2170._8_8_;
        _local_2140 = vsubps_avx(auVar9,local_2170);
        local_ce0 = local_2140;
        uStack_cd8 = uStack_2138;
        local_d00 = local_2120._0_8_;
        uStack_cf8 = local_2120._8_8_;
        local_11a0 = 0x3f3180003f318000;
        uStack_1198 = 0x3f3180003f318000;
        local_2f0 = local_2140;
        uStack_2e8 = uStack_2138;
        local_300 = 0x3f3180003f318000;
        uStack_2f8 = 0x3f3180003f318000;
        local_310 = local_2120._0_8_;
        uStack_308 = local_2120._8_8_;
        auVar288._8_8_ = 0x3f3180003f318000;
        auVar288._0_8_ = 0x3f3180003f318000;
        auVar8 = vfnmadd213ps_fma(auVar288,_local_2140,auVar1);
        local_d10 = local_2140;
        uStack_d08 = uStack_2138;
        local_2120._0_8_ = auVar8._0_8_;
        local_d30 = local_2120._0_8_;
        local_2120._8_8_ = auVar8._8_8_;
        uStack_d28 = local_2120._8_8_;
        local_1170 = 0xb95e8083b95e8083;
        uStack_1168 = 0xb95e8083b95e8083;
        local_2c0 = local_2140;
        uStack_2b8 = uStack_2138;
        local_2d0 = 0xb95e8083b95e8083;
        uStack_2c8 = 0xb95e8083b95e8083;
        local_2e0 = local_2120._0_8_;
        uStack_2d8 = local_2120._8_8_;
        auVar289._8_8_ = 0xb95e8083b95e8083;
        auVar289._0_8_ = 0xb95e8083b95e8083;
        local_2120 = vfnmadd213ps_fma(auVar289,_local_2140,auVar8);
        local_20b0 = local_2120._0_8_;
        uStack_20a8 = local_2120._8_8_;
        local_20a0._0_4_ = local_2120._0_4_;
        local_20a0._4_4_ = local_2120._4_4_;
        uStack_2098._0_4_ = local_2120._8_4_;
        uStack_2098._4_4_ = local_2120._12_4_;
        local_2130 = CONCAT44(local_20a0._4_4_ * local_20a0._4_4_,
                              (float)local_20a0 * (float)local_20a0);
        uStack_2128._0_4_ = (float)uStack_2098 * (float)uStack_2098;
        uStack_2128._4_4_ = uStack_2098._4_4_ * uStack_2098._4_4_;
        local_12e0 = 0x3950696739506967;
        uStack_12d8 = 0x3950696739506967;
        local_12f0 = local_2120._0_8_;
        uStack_12e8 = local_2120._8_8_;
        local_1420 = 0x3ab743ce3ab743ce;
        uStack_1418 = 0x3ab743ce3ab743ce;
        local_710 = 0x3950696739506967;
        uStack_708 = 0x3950696739506967;
        local_720 = local_2120._0_8_;
        uStack_718 = local_2120._8_8_;
        local_730 = 0x3ab743ce3ab743ce;
        uStack_728 = 0x3ab743ce3ab743ce;
        auVar262._8_8_ = 0x3950696739506967;
        auVar262._0_8_ = 0x3950696739506967;
        auVar261._8_8_ = 0x3ab743ce3ab743ce;
        auVar261._0_8_ = 0x3ab743ce3ab743ce;
        auVar8 = vfmadd213ps_fma(local_2120,auVar262,auVar261);
        local_2180 = auVar8._0_8_;
        local_1310 = local_2180;
        uStack_2178 = auVar8._8_8_;
        uStack_1308 = uStack_2178;
        local_1320 = local_2120._0_8_;
        uStack_1318 = local_2120._8_8_;
        local_1450 = 0x3c0889083c088908;
        uStack_1448 = 0x3c0889083c088908;
        local_6e0 = local_2180;
        uStack_6d8 = uStack_2178;
        local_6f0 = local_2120._0_8_;
        uStack_6e8 = local_2120._8_8_;
        local_700 = 0x3c0889083c088908;
        uStack_6f8 = 0x3c0889083c088908;
        auVar263._8_8_ = 0x3c0889083c088908;
        auVar263._0_8_ = 0x3c0889083c088908;
        auVar8 = vfmadd213ps_fma(local_2120,auVar8,auVar263);
        local_2180 = auVar8._0_8_;
        local_1340 = local_2180;
        uStack_2178 = auVar8._8_8_;
        uStack_1338 = uStack_2178;
        local_1350 = local_2120._0_8_;
        uStack_1348 = local_2120._8_8_;
        local_1480 = 0x3d2aa9c13d2aa9c1;
        uStack_1478 = 0x3d2aa9c13d2aa9c1;
        local_6b0 = local_2180;
        uStack_6a8 = uStack_2178;
        local_6c0 = local_2120._0_8_;
        uStack_6b8 = local_2120._8_8_;
        local_6d0 = 0x3d2aa9c13d2aa9c1;
        uStack_6c8 = 0x3d2aa9c13d2aa9c1;
        auVar264._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar264._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar8 = vfmadd213ps_fma(local_2120,auVar8,auVar264);
        local_2180 = auVar8._0_8_;
        local_1370 = local_2180;
        uStack_2178 = auVar8._8_8_;
        uStack_1368 = uStack_2178;
        local_1380 = local_2120._0_8_;
        uStack_1378 = local_2120._8_8_;
        local_14b0 = 0x3e2aaaaa3e2aaaaa;
        uStack_14a8 = 0x3e2aaaaa3e2aaaaa;
        local_680 = local_2180;
        uStack_678 = uStack_2178;
        local_690 = local_2120._0_8_;
        uStack_688 = local_2120._8_8_;
        local_6a0 = 0x3e2aaaaa3e2aaaaa;
        uStack_698 = 0x3e2aaaaa3e2aaaaa;
        auVar265._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar265._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar8 = vfmadd213ps_fma(local_2120,auVar8,auVar265);
        local_2180 = auVar8._0_8_;
        local_13a0 = local_2180;
        uStack_2178 = auVar8._8_8_;
        uStack_1398 = uStack_2178;
        local_13b0 = local_2120._0_8_;
        uStack_13a8 = local_2120._8_8_;
        local_650 = local_2180;
        uStack_648 = uStack_2178;
        local_660 = local_2120._0_8_;
        uStack_658 = local_2120._8_8_;
        local_670 = 0x3f0000003f000000;
        uStack_668 = 0x3f0000003f000000;
        auVar266._8_8_ = 0x3f0000003f000000;
        auVar266._0_8_ = 0x3f0000003f000000;
        auVar8 = vfmadd213ps_fma(local_2120,auVar8,auVar266);
        local_2180 = auVar8._0_8_;
        local_13d0 = local_2180;
        uStack_2178 = auVar8._8_8_;
        uStack_13c8 = uStack_2178;
        local_13e0 = local_2130;
        uStack_13d8 = uStack_2128;
        local_13f0 = local_2120._0_8_;
        uStack_13e8 = local_2120._8_8_;
        local_620 = local_2180;
        uStack_618 = uStack_2178;
        local_630 = local_2130;
        uStack_628 = uStack_2128;
        local_640 = local_2120._0_8_;
        uStack_638 = local_2120._8_8_;
        auVar267._8_8_ = uStack_2128;
        auVar267._0_8_ = local_2130;
        auVar8 = vfmadd213ps_fma(auVar267,auVar8,local_2120);
        local_2180 = auVar8._0_8_;
        uVar14 = local_2180;
        uStack_2178 = auVar8._8_8_;
        uVar15 = uStack_2178;
        local_2070 = 0x3f8000003f800000;
        uStack_2068 = 0x3f8000003f800000;
        local_2060._0_4_ = auVar8._0_4_;
        local_2060._4_4_ = auVar8._4_4_;
        uStack_2058._0_4_ = auVar8._8_4_;
        uStack_2058._4_4_ = auVar8._12_4_;
        local_2180 = CONCAT44(local_2060._4_4_ + 1.0,(float)local_2060 + 1.0);
        uStack_2178._0_4_ = (float)uStack_2058 + 1.0;
        uStack_2178._4_4_ = uStack_2058._4_4_ + 1.0;
        local_130._0_4_ = local_2140._0_4_;
        local_130._4_4_ = local_2140._4_4_;
        uStack_128._0_4_ = local_2140._8_4_;
        uStack_128._4_4_ = local_2140._12_4_;
        local_2150._4_4_ = (int)local_130._4_4_;
        local_2150._0_4_ = (int)(float)local_130;
        local_2150._8_4_ = (int)(float)uStack_128;
        local_2150._12_4_ = (int)uStack_128._4_4_;
        local_2100 = local_2150._0_8_;
        uStack_20f8 = local_2150._8_8_;
        local_2470 = 0x7f0000007f;
        uStack_2468 = 0x7f0000007f;
        auVar170._8_8_ = local_2150._8_8_;
        auVar170._0_8_ = local_2150._0_8_;
        auVar169._8_8_ = 0x7f0000007f;
        auVar169._0_8_ = 0x7f0000007f;
        auVar8 = vpaddd_avx(auVar170,auVar169);
        local_2150._0_8_ = auVar8._0_8_;
        local_20e0 = local_2150._0_8_;
        local_2150._8_8_ = auVar8._8_8_;
        uStack_20d8 = local_2150._8_8_;
        local_20e4 = 0x17;
        local_2150 = vpslld_avx(auVar8,ZEXT416(0x17));
        local_50 = local_2150._0_8_;
        uStack_48 = local_2150._8_8_;
        local_2190 = local_2150._0_8_;
        uStack_2188 = local_2150._8_8_;
        local_20c0 = local_2180;
        uStack_20b8 = uStack_2178;
        local_20d0._0_4_ = local_2150._0_4_;
        local_20d0._4_4_ = local_2150._4_4_;
        uStack_20c8._0_4_ = local_2150._8_4_;
        uStack_20c8._4_4_ = local_2150._12_4_;
        local_20d0._0_4_ = ((float)local_2060 + 1.0) * (float)local_20d0;
        local_20d0._4_4_ = (local_2060._4_4_ + 1.0) * local_20d0._4_4_;
        uStack_20c8._0_4_ = ((float)uStack_2058 + 1.0) * (float)uStack_20c8;
        uStack_20c8._4_4_ = (uStack_2058._4_4_ + 1.0) * uStack_20c8._4_4_;
        local_2180 = CONCAT44(local_20d0._4_4_,(float)local_20d0);
        uStack_2178._0_4_ = (float)uStack_20c8;
        uStack_2178._4_4_ = uStack_20c8._4_4_;
        local_2300 = local_2180;
        uStack_22f8 = uStack_2178;
        local_1f74 = 0x3f800000;
        local_1f90 = 0x3f800000;
        local_2310 = 0x3f8000003f800000;
        uStack_2308 = 0x3f8000003f800000;
        local_24a0._4_4_ = local_20d0._4_4_ + 1.0;
        local_24a0._0_4_ = (float)local_20d0 + 1.0;
        uStack_2498._0_4_ = (float)uStack_20c8 + 1.0;
        uStack_2498._4_4_ = uStack_20c8._4_4_ + 1.0;
        local_19a0 = local_24a0;
        uStack_1998 = uStack_2498;
        local_19b0 = 0;
        local_19d0._8_8_ = SUB168(ZEXT816(0),4);
        uStack_19a8 = local_19d0._8_8_;
        auVar186._8_8_ = uStack_2498;
        auVar186._0_8_ = local_24a0;
        auVar306._8_8_ = 0;
        auVar306._0_8_ = local_19d0._8_8_;
        local_24d0 = vcmpps_avx(auVar186,auVar306 << 0x40,2);
        local_18e0 = local_24a0;
        uStack_18d8 = uStack_2498;
        local_18f0 = 0x80000000800000;
        uStack_18e8 = 0x80000000800000;
        auVar193._8_8_ = uStack_2498;
        auVar193._0_8_ = local_24a0;
        auVar192._8_8_ = 0x80000000800000;
        auVar192._0_8_ = 0x80000000800000;
        auVar8 = vmaxps_avx(auVar193,auVar192);
        local_24a0 = auVar8._0_8_;
        local_18b0 = local_24a0;
        uStack_2498 = auVar8._8_8_;
        uStack_18a8 = uStack_2498;
        local_2480 = local_24a0;
        uStack_2478 = uStack_2498;
        local_2484 = 0x17;
        auVar1 = vpsrld_avx(auVar8,ZEXT416(0x17));
        local_17c0 = local_24a0;
        uStack_17b8 = uStack_2498;
        local_17d0 = 0x807fffff807fffff;
        uStack_17c8 = 0x807fffff807fffff;
        auVar201._8_8_ = 0x807fffff807fffff;
        auVar201._0_8_ = 0x807fffff807fffff;
        auVar8 = vpand_avx(auVar8,auVar201);
        local_24a0 = auVar8._0_8_;
        local_1720 = local_24a0;
        uStack_2498 = auVar8._8_8_;
        uStack_1718 = uStack_2498;
        auVar204._8_8_ = 0x3f0000003f000000;
        auVar204._0_8_ = 0x3f0000003f000000;
        auVar9 = vpor_avx(auVar8,auVar204);
        local_24b0._0_8_ = auVar1._0_8_;
        local_2460 = local_24b0._0_8_;
        local_24b0._8_8_ = auVar1._8_8_;
        uStack_2458 = local_24b0._8_8_;
        auVar166._8_8_ = 0x7f0000007f;
        auVar166._0_8_ = 0x7f0000007f;
        local_24b0 = vpsubd_avx(auVar1,auVar166);
        local_1690 = local_24b0._0_8_;
        uStack_1688 = local_24b0._8_8_;
        auVar8 = vcvtdq2ps_avx(local_24b0);
        local_24e0 = auVar8._0_8_;
        uVar16 = local_24e0;
        uStack_24d8 = auVar8._8_8_;
        uVar17 = uStack_24d8;
        local_23b0 = 0x3f8000003f800000;
        uStack_23a8 = 0x3f8000003f800000;
        local_23a0._0_4_ = auVar8._0_4_;
        local_23a0._4_4_ = auVar8._4_4_;
        uStack_2398._0_4_ = auVar8._8_4_;
        uStack_2398._4_4_ = auVar8._12_4_;
        local_24e0._4_4_ = local_23a0._4_4_ + 1.0;
        local_24e0._0_4_ = (float)local_23a0 + 1.0;
        uStack_24d8._0_4_ = (float)uStack_2398 + 1.0;
        uStack_24d8._4_4_ = uStack_2398._4_4_ + 1.0;
        local_24a0 = auVar9._0_8_;
        local_1660 = local_24a0;
        uStack_2498 = auVar9._8_8_;
        uStack_1658 = uStack_2498;
        local_1670 = 0x3f3504f33f3504f3;
        uStack_1668 = 0x3f3504f33f3504f3;
        auVar210._8_8_ = 0x3f3504f33f3504f3;
        auVar210._0_8_ = 0x3f3504f33f3504f3;
        local_24f0 = vcmpps_avx(auVar9,auVar210,1);
        local_17e0 = local_24a0;
        uStack_17d8 = uStack_2498;
        local_17f0 = local_24f0._0_8_;
        uStack_17e8 = local_24f0._8_8_;
        local_2500 = vpand_avx(auVar9,local_24f0);
        local_1f00 = local_24a0;
        uStack_1ef8 = uStack_2498;
        local_1f10 = 0x3f8000003f800000;
        uStack_1f08 = 0x3f8000003f800000;
        auVar172._8_8_ = 0x3f8000003f800000;
        auVar172._0_8_ = 0x3f8000003f800000;
        auVar8 = vsubps_avx(auVar9,auVar172);
        local_1f20 = local_24e0;
        uStack_1f18 = uStack_24d8;
        local_1800 = 0x3f8000003f800000;
        uStack_17f8 = 0x3f8000003f800000;
        local_1810 = local_24f0._0_8_;
        uStack_1808 = local_24f0._8_8_;
        auVar200._8_8_ = 0x3f8000003f800000;
        auVar200._0_8_ = 0x3f8000003f800000;
        local_1f30 = vpand_avx(auVar200,local_24f0);
        auVar171._8_8_ = uStack_24d8;
        auVar171._0_8_ = local_24e0;
        _local_24e0 = vsubps_avx(auVar171,local_1f30);
        local_24a0 = auVar8._0_8_;
        uVar18 = local_24a0;
        uStack_2498 = auVar8._8_8_;
        uVar19 = uStack_2498;
        local_23c0._0_4_ = auVar8._0_4_;
        local_23c0._4_4_ = auVar8._4_4_;
        uStack_23b8._0_4_ = auVar8._8_4_;
        uStack_23b8._4_4_ = auVar8._12_4_;
        local_23d0._0_4_ = local_2500._0_4_;
        local_23d0._4_4_ = local_2500._4_4_;
        uStack_23c8._0_4_ = local_2500._8_4_;
        uStack_23c8._4_4_ = local_2500._12_4_;
        local_24a0._0_4_ = (float)local_23c0 + (float)local_23d0;
        local_24a0._4_4_ = local_23c0._4_4_ + local_23d0._4_4_;
        uStack_23b8._0_4_ = (float)uStack_23b8 + (float)uStack_23c8;
        uStack_23b8._4_4_ = uStack_23b8._4_4_ + uStack_23c8._4_4_;
        uStack_2498._0_4_ = (float)uStack_23b8;
        uStack_2498._4_4_ = uStack_23b8._4_4_;
        local_2410 = local_24a0;
        uStack_2408 = uStack_2498;
        local_2510 = (float)local_24a0._0_4_ * (float)local_24a0._0_4_;
        fStack_250c = (float)local_24a0._4_4_ * (float)local_24a0._4_4_;
        fStack_2508 = (float)uStack_23b8 * (float)uStack_23b8;
        fStack_2504 = uStack_23b8._4_4_ * uStack_23b8._4_4_;
        local_fe0 = 0x3d9021bb3d9021bb;
        uStack_fd8 = 0x3d9021bb3d9021bb;
        local_ff0 = local_24a0;
        uStack_fe8 = uStack_2498;
        local_1000 = 0xbdebd1b8bdebd1b8;
        uStack_ff8 = 0xbdebd1b8bdebd1b8;
        local_a10 = 0x3d9021bb3d9021bb;
        uStack_a08 = 0x3d9021bb3d9021bb;
        local_a20 = local_24a0;
        uStack_a18 = uStack_2498;
        local_a30 = 0xbdebd1b8bdebd1b8;
        uStack_a28 = 0xbdebd1b8bdebd1b8;
        auVar235._8_8_ = 0x3d9021bb3d9021bb;
        auVar235._0_8_ = 0x3d9021bb3d9021bb;
        auVar234._8_8_ = uStack_2498;
        auVar234._0_8_ = local_24a0;
        auVar233._8_8_ = 0xbdebd1b8bdebd1b8;
        auVar233._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar8 = vfmadd213ps_fma(auVar234,auVar235,auVar233);
        local_2520 = auVar8._0_8_;
        local_1010 = local_2520;
        uStack_2518 = auVar8._8_8_;
        uStack_1008 = uStack_2518;
        local_1020 = local_24a0;
        uStack_1018 = uStack_2498;
        local_1030 = 0x3def251a3def251a;
        uStack_1028 = 0x3def251a3def251a;
        local_9e0 = local_2520;
        uStack_9d8 = uStack_2518;
        local_9f0 = local_24a0;
        uStack_9e8 = uStack_2498;
        local_a00 = 0x3def251a3def251a;
        uStack_9f8 = 0x3def251a3def251a;
        auVar237._8_8_ = uStack_2498;
        auVar237._0_8_ = local_24a0;
        auVar236._8_8_ = 0x3def251a3def251a;
        auVar236._0_8_ = 0x3def251a3def251a;
        auVar8 = vfmadd213ps_fma(auVar237,auVar8,auVar236);
        local_2520 = auVar8._0_8_;
        local_1040 = local_2520;
        uStack_2518 = auVar8._8_8_;
        uStack_1038 = uStack_2518;
        local_1050 = local_24a0;
        uStack_1048 = uStack_2498;
        local_1060 = 0xbdfe5d4fbdfe5d4f;
        uStack_1058 = 0xbdfe5d4fbdfe5d4f;
        local_9b0 = local_2520;
        uStack_9a8 = uStack_2518;
        local_9c0 = local_24a0;
        uStack_9b8 = uStack_2498;
        local_9d0 = 0xbdfe5d4fbdfe5d4f;
        uStack_9c8 = 0xbdfe5d4fbdfe5d4f;
        auVar239._8_8_ = uStack_2498;
        auVar239._0_8_ = local_24a0;
        auVar238._8_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar238._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar8 = vfmadd213ps_fma(auVar239,auVar8,auVar238);
        local_2520 = auVar8._0_8_;
        local_1070 = local_2520;
        uStack_2518 = auVar8._8_8_;
        uStack_1068 = uStack_2518;
        local_1080 = local_24a0;
        uStack_1078 = uStack_2498;
        local_1090 = 0x3e11e9bf3e11e9bf;
        uStack_1088 = 0x3e11e9bf3e11e9bf;
        local_980 = local_2520;
        uStack_978 = uStack_2518;
        local_990 = local_24a0;
        uStack_988 = uStack_2498;
        local_9a0 = 0x3e11e9bf3e11e9bf;
        uStack_998 = 0x3e11e9bf3e11e9bf;
        auVar241._8_8_ = uStack_2498;
        auVar241._0_8_ = local_24a0;
        auVar240._8_8_ = 0x3e11e9bf3e11e9bf;
        auVar240._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar8 = vfmadd213ps_fma(auVar241,auVar8,auVar240);
        local_2520 = auVar8._0_8_;
        local_10a0 = local_2520;
        uStack_2518 = auVar8._8_8_;
        uStack_1098 = uStack_2518;
        local_10b0 = local_24a0;
        uStack_10a8 = uStack_2498;
        local_10c0 = 0xbe2aae50be2aae50;
        uStack_10b8 = 0xbe2aae50be2aae50;
        local_950 = local_2520;
        uStack_948 = uStack_2518;
        local_960 = local_24a0;
        uStack_958 = uStack_2498;
        local_970 = 0xbe2aae50be2aae50;
        uStack_968 = 0xbe2aae50be2aae50;
        auVar243._8_8_ = uStack_2498;
        auVar243._0_8_ = local_24a0;
        auVar242._8_8_ = 0xbe2aae50be2aae50;
        auVar242._0_8_ = 0xbe2aae50be2aae50;
        auVar8 = vfmadd213ps_fma(auVar243,auVar8,auVar242);
        local_2520 = auVar8._0_8_;
        local_10d0 = local_2520;
        uStack_2518 = auVar8._8_8_;
        uStack_10c8 = uStack_2518;
        local_10e0 = local_24a0;
        uStack_10d8 = uStack_2498;
        local_10f0 = 0x3e4cceac3e4cceac;
        uStack_10e8 = 0x3e4cceac3e4cceac;
        local_920 = local_2520;
        uStack_918 = uStack_2518;
        local_930 = local_24a0;
        uStack_928 = uStack_2498;
        local_940 = 0x3e4cceac3e4cceac;
        uStack_938 = 0x3e4cceac3e4cceac;
        auVar245._8_8_ = uStack_2498;
        auVar245._0_8_ = local_24a0;
        auVar244._8_8_ = 0x3e4cceac3e4cceac;
        auVar244._0_8_ = 0x3e4cceac3e4cceac;
        auVar8 = vfmadd213ps_fma(auVar245,auVar8,auVar244);
        local_2520 = auVar8._0_8_;
        local_1100 = local_2520;
        uStack_2518 = auVar8._8_8_;
        uStack_10f8 = uStack_2518;
        local_1110 = local_24a0;
        uStack_1108 = uStack_2498;
        local_1120 = 0xbe7ffffcbe7ffffc;
        uStack_1118 = 0xbe7ffffcbe7ffffc;
        local_8f0 = local_2520;
        uStack_8e8 = uStack_2518;
        local_900 = local_24a0;
        uStack_8f8 = uStack_2498;
        local_910 = 0xbe7ffffcbe7ffffc;
        uStack_908 = 0xbe7ffffcbe7ffffc;
        auVar247._8_8_ = uStack_2498;
        auVar247._0_8_ = local_24a0;
        auVar246._8_8_ = 0xbe7ffffcbe7ffffc;
        auVar246._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar8 = vfmadd213ps_fma(auVar247,auVar8,auVar246);
        local_2520 = auVar8._0_8_;
        local_1130 = local_2520;
        uStack_2518 = auVar8._8_8_;
        uStack_1128 = uStack_2518;
        local_1140 = local_24a0;
        uStack_1138 = uStack_2498;
        local_1150 = 0x3eaaaaaa3eaaaaaa;
        uStack_1148 = 0x3eaaaaaa3eaaaaaa;
        local_8c0 = local_2520;
        uStack_8b8 = uStack_2518;
        local_8d0 = local_24a0;
        uStack_8c8 = uStack_2498;
        local_8e0 = 0x3eaaaaaa3eaaaaaa;
        uStack_8d8 = 0x3eaaaaaa3eaaaaaa;
        auVar249._8_8_ = uStack_2498;
        auVar249._0_8_ = local_24a0;
        auVar248._8_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar248._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar8 = vfmadd213ps_fma(auVar249,auVar8,auVar248);
        local_2520 = auVar8._0_8_;
        uVar20 = local_2520;
        uStack_2518 = auVar8._8_8_;
        uVar21 = uStack_2518;
        local_2430 = local_24a0;
        uStack_2428 = uStack_2498;
        local_2420._0_4_ = auVar8._0_4_;
        local_2420._4_4_ = auVar8._4_4_;
        uStack_2418._0_4_ = auVar8._8_4_;
        uStack_2418._4_4_ = auVar8._12_4_;
        local_2520._4_4_ = local_2420._4_4_ * (float)local_24a0._4_4_;
        local_2520._0_4_ = (float)local_2420 * (float)local_24a0._0_4_;
        uStack_2518._0_4_ = (float)uStack_2418 * (float)uStack_23b8;
        uStack_2518._4_4_ = uStack_2418._4_4_ * uStack_23b8._4_4_;
        local_2440 = local_2520;
        uStack_2438 = uStack_2518;
        local_2450 = CONCAT44(fStack_250c,local_2510);
        uStack_2448 = CONCAT44(fStack_2504,fStack_2508);
        local_2520._4_4_ = local_2420._4_4_ * (float)local_24a0._4_4_ * fStack_250c;
        local_2520._0_4_ = (float)local_2420 * (float)local_24a0._0_4_ * local_2510;
        uStack_2518._0_4_ = (float)uStack_2418 * (float)uStack_23b8 * fStack_2508;
        uStack_2518._4_4_ = uStack_2418._4_4_ * uStack_23b8._4_4_ * fStack_2504;
        local_1160 = local_24e0;
        uStack_1158 = uStack_24d8;
        local_1180 = local_2520;
        uStack_1178 = uStack_2518;
        local_890 = local_24e0;
        uStack_888 = uStack_24d8;
        local_8a0 = 0xb95e8083b95e8083;
        uStack_898 = 0xb95e8083b95e8083;
        local_8b0 = local_2520;
        uStack_8a8 = uStack_2518;
        auVar251._8_8_ = 0xb95e8083b95e8083;
        auVar251._0_8_ = 0xb95e8083b95e8083;
        auVar250._8_8_ = uStack_2518;
        auVar250._0_8_ = local_2520;
        auVar8 = vfmadd213ps_fma(auVar251,_local_24e0,auVar250);
        local_c50 = CONCAT44(fStack_250c,local_2510);
        uStack_c48 = CONCAT44(fStack_2504,fStack_2508);
        local_2520 = auVar8._0_8_;
        local_c70 = local_2520;
        uStack_2518 = auVar8._8_8_;
        uStack_c68 = uStack_2518;
        local_390 = 0x3f0000003f000000;
        uStack_388 = 0x3f0000003f000000;
        local_3a0 = local_2520;
        uStack_398 = uStack_2518;
        auVar285._8_8_ = uStack_c48;
        auVar285._0_8_ = local_c50;
        auVar284._8_8_ = 0x3f0000003f000000;
        auVar284._0_8_ = 0x3f0000003f000000;
        _local_2520 = vfnmadd213ps_fma(auVar284,auVar285,auVar8);
        local_23e0 = local_24a0;
        uStack_23d8 = uStack_2498;
        local_23f0._0_4_ = local_2520._0_4_;
        local_23f0._4_4_ = local_2520._4_4_;
        uStack_23e8._0_4_ = local_2520._8_4_;
        uStack_23e8._4_4_ = local_2520._12_4_;
        local_24a0._4_4_ = (float)local_24a0._4_4_ + local_23f0._4_4_;
        local_24a0._0_4_ = (float)local_24a0._0_4_ + (float)local_23f0;
        uStack_2498._0_4_ = (float)uStack_23b8 + (float)uStack_23e8;
        uStack_2498._4_4_ = uStack_23b8._4_4_ + uStack_23e8._4_4_;
        local_1190 = local_24e0;
        uStack_1188 = uStack_24d8;
        local_11b0 = local_24a0;
        uStack_11a8 = uStack_2498;
        local_860 = local_24e0;
        uStack_858 = uStack_24d8;
        local_870 = 0x3f3180003f318000;
        uStack_868 = 0x3f3180003f318000;
        local_880 = local_24a0;
        uStack_878 = uStack_2498;
        auVar253._8_8_ = 0x3f3180003f318000;
        auVar253._0_8_ = 0x3f3180003f318000;
        auVar252._8_8_ = uStack_2498;
        auVar252._0_8_ = local_24a0;
        auVar8 = vfmadd213ps_fma(auVar253,_local_24e0,auVar252);
        local_24a0 = auVar8._0_8_;
        local_1740 = local_24a0;
        uStack_2498 = auVar8._8_8_;
        uStack_1738 = uStack_2498;
        local_1750 = local_24d0._0_8_;
        uStack_1748 = local_24d0._8_8_;
        _local_24a0 = vpor_avx(auVar8,local_24d0);
        local_26a0 = local_24a0;
        uStack_2698 = uStack_2498;
        local_1ff4 = 0x3f800000;
        local_2010 = 0x3f800000;
        local_26b0 = 0x3f8000003f800000;
        uStack_26a8 = 0x3f8000003f800000;
        local_2014 = 0x40000000;
        local_2030 = 0x40000000;
        local_26c0 = 0x4000000040000000;
        uStack_26b8 = 0x4000000040000000;
        local_2660._0_4_ = local_24a0._0_4_;
        local_2660._4_4_ = local_24a0._4_4_;
        uStack_2658._0_4_ = local_24a0._8_4_;
        uStack_2658._4_4_ = local_24a0._12_4_;
        local_1e60 = (float)local_2660 * 2.0;
        fStack_1e5c = local_2660._4_4_ * 2.0;
        fStack_1e58 = (float)uStack_2658 * 2.0;
        fStack_1e54 = uStack_2658._4_4_ * 2.0;
        local_1cb4 = 0x3f800000;
        local_1cd0 = 0x3f800000;
        local_1e70 = 0x3f8000003f800000;
        uStack_1e68 = 0x3f8000003f800000;
        local_1e40._8_8_ = 0x3f8000003f800000;
        local_1e40._0_8_ = 0x3f8000003f800000;
        local_1c80 = 0;
        uStack_1c78 = local_19d0._8_8_;
        local_1c90 = CONCAT44(fStack_1e5c,local_1e60);
        uStack_1c88 = CONCAT44(fStack_1e54,fStack_1e58);
        auVar307._8_8_ = 0;
        auVar307._0_8_ = local_19d0._8_8_;
        auVar179._8_8_ = uStack_1c88;
        auVar179._0_8_ = local_1c90;
        auVar8 = vsubps_avx(auVar307 << 0x40,auVar179);
        local_1a10 = 0;
        uStack_1a08 = local_19d0._8_8_;
        local_1db0 = 0x7f0000007f;
        uStack_1da8 = 0x7f0000007f;
        local_1dc0._0_8_ = auVar8._0_8_;
        local_1c0 = local_1dc0._0_8_;
        local_1dc0._8_8_ = auVar8._8_8_;
        uStack_1b8 = local_1dc0._8_8_;
        auVar295._8_8_ = 0x42b0c0a542b0c0a5;
        auVar295._0_8_ = 0x42b0c0a542b0c0a5;
        auVar8 = vminps_avx(auVar8,auVar295);
        local_1dc0._0_8_ = auVar8._0_8_;
        local_1940 = local_1dc0._0_8_;
        local_1dc0._8_8_ = auVar8._8_8_;
        uStack_1938 = local_1dc0._8_8_;
        auVar189._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar189._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1 = vmaxps_avx(auVar8,auVar189);
        local_1dc0._0_8_ = auVar1._0_8_;
        uVar22 = local_1dc0._0_8_;
        local_1dc0._8_8_ = auVar1._8_8_;
        uVar23 = local_1dc0._8_8_;
        local_1d20._0_4_ = auVar1._0_4_;
        local_1d20._4_4_ = auVar1._4_4_;
        uStack_1d18._0_4_ = auVar1._8_4_;
        uStack_1d18._4_4_ = auVar1._12_4_;
        local_1de0._4_4_ = local_1d20._4_4_ * 1.442695;
        local_1de0._0_4_ = (float)local_1d20 * 1.442695;
        uStack_1dd8._0_4_ = (float)uStack_1d18 * 1.442695;
        uStack_1dd8._4_4_ = uStack_1d18._4_4_ * 1.442695;
        local_1ce0 = local_1de0;
        uStack_1cd8 = uStack_1dd8;
        local_1de0._0_4_ = (float)local_1d20 * 1.442695 + 0.5;
        local_1de0._4_4_ = local_1d20._4_4_ * 1.442695 + 0.5;
        fVar309 = (float)uStack_1d18 * 1.442695 + 0.5;
        fVar310 = uStack_1d18._4_4_ * 1.442695 + 0.5;
        uStack_1dd8._0_4_ = fVar309;
        uStack_1dd8._4_4_ = fVar310;
        local_140 = local_1de0;
        uStack_138 = uStack_1dd8;
        local_1df0._4_4_ = (int)(float)local_1de0._4_4_;
        local_1df0._0_4_ = (int)(float)local_1de0._0_4_;
        local_1df0._8_4_ = (int)fVar309;
        local_1df0._12_4_ = (int)fVar310;
        local_16c0 = local_1df0._0_8_;
        uStack_16b8 = local_1df0._8_8_;
        auVar207._8_8_ = local_1df0._8_8_;
        auVar207._0_8_ = local_1df0._0_8_;
        auVar9 = vcvtdq2ps_avx(auVar207);
        local_1dd0 = auVar9._0_8_;
        local_c0 = local_1dd0;
        uStack_1dc8 = auVar9._8_8_;
        uStack_b8 = uStack_1dc8;
        local_d0 = local_1de0;
        uStack_c8 = uStack_1dd8;
        auVar299._8_8_ = uStack_1dd8;
        auVar299._0_8_ = local_1de0;
        auVar8 = vcmpps_avx(auVar299,auVar9,1);
        local_1e10._0_8_ = auVar8._0_8_;
        local_1860 = local_1e10._0_8_;
        local_1e10._8_8_ = auVar8._8_8_;
        uStack_1858 = local_1e10._8_8_;
        local_1870 = 0x3f8000003f800000;
        uStack_1868 = 0x3f8000003f800000;
        auVar197._8_8_ = 0x3f8000003f800000;
        auVar197._0_8_ = 0x3f8000003f800000;
        local_1e10 = vpand_avx(auVar8,auVar197);
        local_1ca0 = local_1dd0;
        uStack_1c98 = uStack_1dc8;
        local_1cb0 = local_1e10._0_8_;
        uStack_1ca8 = local_1e10._8_8_;
        _local_1de0 = vsubps_avx(auVar9,local_1e10);
        local_d40 = local_1de0;
        uStack_d38 = uStack_1dd8;
        local_d60 = local_1dc0._0_8_;
        uStack_d58 = local_1dc0._8_8_;
        local_290 = local_1de0;
        uStack_288 = uStack_1dd8;
        local_2a0 = 0x3f3180003f318000;
        uStack_298 = 0x3f3180003f318000;
        local_2b0 = local_1dc0._0_8_;
        uStack_2a8 = local_1dc0._8_8_;
        auVar290._8_8_ = 0x3f3180003f318000;
        auVar290._0_8_ = 0x3f3180003f318000;
        auVar8 = vfnmadd213ps_fma(auVar290,_local_1de0,auVar1);
        local_d70 = local_1de0;
        uStack_d68 = uStack_1dd8;
        local_1dc0._0_8_ = auVar8._0_8_;
        local_d90 = local_1dc0._0_8_;
        local_1dc0._8_8_ = auVar8._8_8_;
        uStack_d88 = local_1dc0._8_8_;
        local_260 = local_1de0;
        uStack_258 = uStack_1dd8;
        local_270 = 0xb95e8083b95e8083;
        uStack_268 = 0xb95e8083b95e8083;
        local_280 = local_1dc0._0_8_;
        uStack_278 = local_1dc0._8_8_;
        auVar291._8_8_ = 0xb95e8083b95e8083;
        auVar291._0_8_ = 0xb95e8083b95e8083;
        local_1dc0 = vfnmadd213ps_fma(auVar291,_local_1de0,auVar8);
        local_1d50 = local_1dc0._0_8_;
        uStack_1d48 = local_1dc0._8_8_;
        local_1d40._0_4_ = local_1dc0._0_4_;
        local_1d40._4_4_ = local_1dc0._4_4_;
        uStack_1d38._0_4_ = local_1dc0._8_4_;
        uStack_1d38._4_4_ = local_1dc0._12_4_;
        local_1dd0 = CONCAT44(local_1d40._4_4_ * local_1d40._4_4_,
                              (float)local_1d40 * (float)local_1d40);
        uStack_1dc8._0_4_ = (float)uStack_1d38 * (float)uStack_1d38;
        uStack_1dc8._4_4_ = uStack_1d38._4_4_ * uStack_1d38._4_4_;
        local_1400 = 0x3950696739506967;
        uStack_13f8 = 0x3950696739506967;
        local_1410 = local_1dc0._0_8_;
        uStack_1408 = local_1dc0._8_8_;
        local_5f0 = 0x3950696739506967;
        uStack_5e8 = 0x3950696739506967;
        local_600 = local_1dc0._0_8_;
        uStack_5f8 = local_1dc0._8_8_;
        local_610 = 0x3ab743ce3ab743ce;
        uStack_608 = 0x3ab743ce3ab743ce;
        auVar269._8_8_ = 0x3950696739506967;
        auVar269._0_8_ = 0x3950696739506967;
        auVar268._8_8_ = 0x3ab743ce3ab743ce;
        auVar268._0_8_ = 0x3ab743ce3ab743ce;
        auVar8 = vfmadd213ps_fma(local_1dc0,auVar269,auVar268);
        local_1e20 = auVar8._0_8_;
        local_1430 = local_1e20;
        uStack_1e18 = auVar8._8_8_;
        uStack_1428 = uStack_1e18;
        local_1440 = local_1dc0._0_8_;
        uStack_1438 = local_1dc0._8_8_;
        local_5c0 = local_1e20;
        uStack_5b8 = uStack_1e18;
        local_5d0 = local_1dc0._0_8_;
        uStack_5c8 = local_1dc0._8_8_;
        local_5e0 = 0x3c0889083c088908;
        uStack_5d8 = 0x3c0889083c088908;
        auVar270._8_8_ = 0x3c0889083c088908;
        auVar270._0_8_ = 0x3c0889083c088908;
        auVar8 = vfmadd213ps_fma(local_1dc0,auVar8,auVar270);
        local_1e20 = auVar8._0_8_;
        local_1460 = local_1e20;
        uStack_1e18 = auVar8._8_8_;
        uStack_1458 = uStack_1e18;
        local_1470 = local_1dc0._0_8_;
        uStack_1468 = local_1dc0._8_8_;
        local_590 = local_1e20;
        uStack_588 = uStack_1e18;
        local_5a0 = local_1dc0._0_8_;
        uStack_598 = local_1dc0._8_8_;
        local_5b0 = 0x3d2aa9c13d2aa9c1;
        uStack_5a8 = 0x3d2aa9c13d2aa9c1;
        auVar271._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar271._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar8 = vfmadd213ps_fma(local_1dc0,auVar8,auVar271);
        local_1e20 = auVar8._0_8_;
        local_1490 = local_1e20;
        uStack_1e18 = auVar8._8_8_;
        uStack_1488 = uStack_1e18;
        local_14a0 = local_1dc0._0_8_;
        uStack_1498 = local_1dc0._8_8_;
        local_560 = local_1e20;
        uStack_558 = uStack_1e18;
        local_570 = local_1dc0._0_8_;
        uStack_568 = local_1dc0._8_8_;
        local_580 = 0x3e2aaaaa3e2aaaaa;
        uStack_578 = 0x3e2aaaaa3e2aaaaa;
        auVar272._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar272._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar8 = vfmadd213ps_fma(local_1dc0,auVar8,auVar272);
        local_1e20 = auVar8._0_8_;
        local_14c0 = local_1e20;
        uStack_1e18 = auVar8._8_8_;
        uStack_14b8 = uStack_1e18;
        local_14d0 = local_1dc0._0_8_;
        uStack_14c8 = local_1dc0._8_8_;
        local_530 = local_1e20;
        uStack_528 = uStack_1e18;
        local_540 = local_1dc0._0_8_;
        uStack_538 = local_1dc0._8_8_;
        local_550 = 0x3f0000003f000000;
        uStack_548 = 0x3f0000003f000000;
        auVar273._8_8_ = 0x3f0000003f000000;
        auVar273._0_8_ = 0x3f0000003f000000;
        auVar8 = vfmadd213ps_fma(local_1dc0,auVar8,auVar273);
        local_1e20 = auVar8._0_8_;
        local_14f0 = local_1e20;
        uStack_1e18 = auVar8._8_8_;
        uStack_14e8 = uStack_1e18;
        local_1500 = local_1dd0;
        uStack_14f8 = uStack_1dc8;
        local_1510 = local_1dc0._0_8_;
        uStack_1508 = local_1dc0._8_8_;
        local_500 = local_1e20;
        uStack_4f8 = uStack_1e18;
        local_510 = local_1dd0;
        uStack_508 = uStack_1dc8;
        local_520 = local_1dc0._0_8_;
        uStack_518 = local_1dc0._8_8_;
        auVar274._8_8_ = uStack_1dc8;
        auVar274._0_8_ = local_1dd0;
        auVar8 = vfmadd213ps_fma(auVar274,auVar8,local_1dc0);
        local_1e20 = auVar8._0_8_;
        uVar24 = local_1e20;
        uStack_1e18 = auVar8._8_8_;
        uVar25 = uStack_1e18;
        local_1d10 = 0x3f8000003f800000;
        uStack_1d08 = 0x3f8000003f800000;
        local_1d00._0_4_ = auVar8._0_4_;
        local_1d00._4_4_ = auVar8._4_4_;
        uStack_1cf8._0_4_ = auVar8._8_4_;
        uStack_1cf8._4_4_ = auVar8._12_4_;
        local_1e20._4_4_ = local_1d00._4_4_ + 1.0;
        local_1e20._0_4_ = (float)local_1d00 + 1.0;
        uStack_1e18._0_4_ = (float)uStack_1cf8 + 1.0;
        uStack_1e18._4_4_ = uStack_1cf8._4_4_ + 1.0;
        local_150._0_4_ = local_1de0._0_4_;
        local_150._4_4_ = local_1de0._4_4_;
        uStack_148._0_4_ = local_1de0._8_4_;
        uStack_148._4_4_ = local_1de0._12_4_;
        local_1df0._4_4_ = (int)local_150._4_4_;
        local_1df0._0_4_ = (int)(float)local_150;
        local_1df0._8_4_ = (int)(float)uStack_148;
        local_1df0._12_4_ = (int)uStack_148._4_4_;
        local_1da0 = local_1df0._0_8_;
        uStack_1d98 = local_1df0._8_8_;
        auVar178._8_8_ = local_1df0._8_8_;
        auVar178._0_8_ = local_1df0._0_8_;
        auVar177._8_8_ = 0x7f0000007f;
        auVar177._0_8_ = 0x7f0000007f;
        auVar8 = vpaddd_avx(auVar178,auVar177);
        local_1df0._0_8_ = auVar8._0_8_;
        local_1d80 = local_1df0._0_8_;
        local_1df0._8_8_ = auVar8._8_8_;
        uStack_1d78 = local_1df0._8_8_;
        local_1d84 = 0x17;
        local_1df0 = vpslld_avx(auVar8,ZEXT416(0x17));
        local_60 = local_1df0._0_8_;
        uStack_58 = local_1df0._8_8_;
        local_1e30 = local_1df0._0_8_;
        uStack_1e28 = local_1df0._8_8_;
        local_1d60 = _local_1e20;
        local_1d70._0_4_ = local_1df0._0_4_;
        local_1d70._4_4_ = local_1df0._4_4_;
        uStack_1d68._0_4_ = local_1df0._8_4_;
        uStack_1d68._4_4_ = local_1df0._12_4_;
        local_1e20._0_4_ = ((float)local_1d00 + 1.0) * (float)local_1d70;
        local_1e20._4_4_ = (local_1d00._4_4_ + 1.0) * local_1d70._4_4_;
        uStack_1d68._0_4_ = ((float)uStack_1cf8 + 1.0) * (float)uStack_1d68;
        uStack_1d68._4_4_ = (uStack_1cf8._4_4_ + 1.0) * uStack_1d68._4_4_;
        uStack_1e18._0_4_ = (float)uStack_1d68;
        uStack_1e18._4_4_ = uStack_1d68._4_4_;
        local_1e50 = local_1e20;
        uStack_1e48 = uStack_1e18;
        local_1a50 = (float)local_1e20._0_4_ + 1.0;
        fStack_1a4c = (float)local_1e20._4_4_ + 1.0;
        fStack_1a48 = (float)uStack_1d68 + 1.0;
        fStack_1a44 = uStack_1d68._4_4_ + 1.0;
        auVar185._4_4_ = fStack_1a4c;
        auVar185._0_4_ = local_1a50;
        auVar185._8_4_ = fStack_1a48;
        auVar185._12_4_ = fStack_1a44;
        _local_2680 = vdivps_avx(local_1e40,auVar185);
        local_1ea0._0_4_ = (float)local_2680._0_4_ * 2.0;
        local_1ea0._4_4_ = (float)local_2680._4_4_ * 2.0;
        local_1ea0._8_4_ = fStack_2678 * 2.0;
        local_1ea0._12_4_ = fStack_2674 * 2.0;
        auVar175._8_8_ = 0x3f8000003f800000;
        auVar175._0_8_ = 0x3f8000003f800000;
        _local_2750 = vsubps_avx(local_1ea0,auVar175);
        local_2740._0_4_ = (undefined4)local_80b0;
        local_2740._4_4_ = (undefined4)((ulong)local_80b0 >> 0x20);
        fStack_2738 = (float)uStack_80a8;
        fStack_2734 = (float)((ulong)uStack_80a8 >> 0x20);
        local_8410 = CONCAT44((float)local_2740._4_4_ * (float)local_2750._4_4_,
                              (float)local_2740._0_4_ * (float)local_2750._0_4_);
        uStack_8408 = CONCAT44(fStack_2734 * fStack_2744,fStack_2738 * fStack_2748);
        local_8078 = local_8380;
        local_8090 = local_8410;
        uStack_8088 = uStack_8408;
        auVar1._8_8_ = uStack_8408;
        auVar1._0_8_ = local_8410;
        *(undefined1 (*) [16])*local_8380 = auVar1;
        local_8380 = (undefined1 (*) [32])(*local_8380 + 0x10);
        _local_2740 = auVar2;
        local_2690 = local_26c0;
        uStack_2688 = uStack_26b8;
        local_2670 = local_26c0;
        uStack_2668 = uStack_26b8;
        local_2660 = local_24a0;
        uStack_2658 = uStack_2498;
        local_2420 = uVar20;
        uStack_2418 = uVar21;
        local_2400 = local_2410;
        uStack_23f8 = uStack_2408;
        local_23f0 = local_2520;
        uStack_23e8 = uStack_2518;
        local_23d0 = local_2500._0_8_;
        uStack_23c8 = local_2500._8_8_;
        local_23c0 = uVar18;
        uStack_23b8 = uVar19;
        local_23a0 = uVar16;
        uStack_2398 = uVar17;
        local_2160 = local_24c0;
        uStack_2158 = uStack_24b8;
        local_2110 = local_2470;
        uStack_2108 = uStack_2468;
        local_20d0 = local_2150._0_8_;
        uStack_20c8 = local_2150._8_8_;
        local_20a0 = local_20b0;
        uStack_2098 = uStack_20a8;
        local_2080 = uVar12;
        uStack_2078 = uVar13;
        local_2060 = uVar14;
        uStack_2058 = uVar15;
        uStack_202c = local_2030;
        uStack_2028 = local_2030;
        uStack_2024 = local_2030;
        uStack_200c = local_2010;
        uStack_2008 = local_2010;
        uStack_2004 = local_2010;
        uStack_1f8c = local_1f90;
        uStack_1f88 = local_1f90;
        uStack_1f84 = local_1f90;
        local_1eb0 = local_26b0;
        uStack_1ea8 = uStack_26a8;
        local_1e00 = local_24c0;
        uStack_1df8 = uStack_24b8;
        local_1d70 = local_1df0._0_8_;
        uStack_1d68 = local_1df0._8_8_;
        local_1d40 = local_1d50;
        uStack_1d38 = uStack_1d48;
        local_1d30 = local_2090;
        uStack_1d28 = uStack_2088;
        local_1d20 = uVar22;
        uStack_1d18 = uVar23;
        local_1d00 = uVar24;
        uStack_1cf8 = uVar25;
        local_1cf0 = local_2050;
        uStack_1ce8 = uStack_2048;
        uStack_1ccc = local_1cd0;
        uStack_1cc8 = local_1cd0;
        uStack_1cc4 = local_1cd0;
        local_1a40 = local_1e40;
        local_19f0 = local_1a00;
        local_19d0 = local_1a00;
        local_1930 = local_1950;
        uStack_1928 = uStack_1948;
        local_1730 = local_2050;
        uStack_1728 = uStack_2048;
        local_14e0 = local_2050;
        uStack_14d8 = uStack_2048;
        local_13c0 = local_2050;
        uStack_13b8 = uStack_2048;
        local_1390 = local_14b0;
        uStack_1388 = uStack_14a8;
        local_1360 = local_1480;
        uStack_1358 = uStack_1478;
        local_1330 = local_1450;
        uStack_1328 = uStack_1448;
        local_1300 = local_1420;
        uStack_12f8 = uStack_1418;
        local_d80 = local_1170;
        uStack_d78 = uStack_1168;
        local_d50 = local_11a0;
        uStack_d48 = uStack_1198;
        local_d20 = local_1170;
        uStack_d18 = uStack_1168;
        local_cf0 = local_11a0;
        uStack_ce8 = uStack_1198;
        local_c60 = local_2050;
        uStack_c58 = uStack_2048;
        local_380 = local_c50;
        uStack_378 = uStack_c48;
        local_1b0 = local_1d0;
        uStack_1a8 = uStack_1c8;
        local_1a0 = local_80b0;
        uStack_198 = uStack_80a8;
        local_150 = local_1de0;
        uStack_148 = uStack_1dd8;
        local_130 = local_2140;
        uStack_128 = uStack_2138;
      }
      for (; local_83cc < local_8268; local_83cc = local_83cc + 1) {
        fVar309 = *(float *)*local_8380;
        dVar308 = std::exp((double)(ulong)*(uint *)*local_8380);
        dVar308 = std::log((double)(ulong)(uint)(SUB84(dVar308,0) + 1.0));
        dVar308 = std::tanh(dVar308);
        *(float *)*local_8380 = fVar309 * SUB84(dVar308,0);
        local_8380 = (undefined1 (*) [32])(*local_8380 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}